

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  uint uVar15;
  undefined4 uVar16;
  Geometry *pGVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [24];
  uint uVar124;
  uint uVar125;
  uint uVar126;
  long lVar127;
  uint uVar128;
  ulong uVar129;
  long lVar130;
  ulong uVar131;
  float fVar132;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar133;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar156;
  float fVar159;
  float fVar165;
  float fVar167;
  float fVar169;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar157;
  float fVar160;
  float fVar161;
  float fVar163;
  float fVar171;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar158;
  float fVar162;
  float fVar164;
  float fVar166;
  float fVar168;
  float fVar170;
  float fVar172;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar193;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar194;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  float fVar195;
  undefined1 auVar197 [16];
  float fVar196;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar222 [16];
  undefined1 auVar205 [16];
  float fVar213;
  float fVar215;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar206 [32];
  float fVar216;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar214;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar233;
  float fVar235;
  float fVar237;
  float fVar238;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar234;
  float fVar236;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar241 [16];
  float fVar240;
  undefined1 auVar243 [16];
  float fVar239;
  float fVar250;
  float fVar252;
  undefined1 auVar244 [32];
  undefined1 auVar242 [16];
  float fVar254;
  undefined1 auVar245 [32];
  float fVar251;
  float fVar253;
  float fVar255;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar256;
  undefined1 auVar249 [32];
  float fVar257;
  float fVar258;
  float fVar265;
  float fVar267;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  undefined1 auVar261 [32];
  float fVar269;
  undefined1 auVar262 [32];
  float fVar266;
  float fVar268;
  float fVar270;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  float fVar274;
  float fVar275;
  float fVar283;
  float fVar285;
  float fVar287;
  float fVar290;
  float fVar292;
  float fVar293;
  undefined1 auVar276 [32];
  float fVar294;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  float fVar295;
  undefined1 auVar280 [32];
  float fVar289;
  float fVar291;
  float fVar296;
  undefined1 auVar281 [32];
  float fVar284;
  float fVar286;
  float fVar288;
  undefined1 auVar282 [64];
  float fVar307;
  float fVar308;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  float fVar309;
  undefined1 auVar305 [32];
  undefined1 auVar306 [64];
  float fVar310;
  undefined1 auVar311 [16];
  float fVar321;
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar320;
  undefined1 auVar314 [32];
  float fVar318;
  float fVar322;
  undefined1 auVar315 [32];
  float fVar317;
  float fVar319;
  float fVar323;
  float fVar324;
  undefined1 auVar316 [64];
  float fVar325;
  undefined1 auVar326 [16];
  float fVar332;
  undefined1 auVar327 [32];
  float fVar333;
  float fVar334;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  float fVar335;
  float fVar336;
  float fVar342;
  float fVar344;
  float fVar346;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  float fVar343;
  float fVar345;
  float fVar347;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  float in_register_0000151c;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [64];
  float fVar358;
  undefined1 auVar359 [16];
  float fVar366;
  float fVar367;
  undefined1 auVar360 [32];
  float fVar368;
  float fVar369;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  float fVar370;
  float fVar373;
  float fVar374;
  float fVar375;
  float in_register_0000159c;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  float fVar376;
  float fVar379;
  float fVar380;
  float fVar381;
  float in_register_000015dc;
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  RTCFilterFunctionNArguments local_870;
  undefined1 local_840 [8];
  undefined1 auStack_838 [8];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  RayHitK<8> *local_7b0;
  undefined1 *local_7a8;
  undefined1 (*local_7a0) [16];
  RayQueryContext *local_798;
  size_t local_790;
  undefined1 (*local_788) [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  LinearSpace3fa *local_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [8];
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  uint local_360;
  uint local_35c;
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  float local_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  RTCHitN local_260 [16];
  undefined1 auStack_250 [16];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar14 = prim[1];
  uVar131 = (ulong)(byte)PVar14;
  fVar195 = *(float *)(prim + uVar131 * 0x19 + 0x12);
  auVar243 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar243 = vinsertps_avx(auVar243,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar24 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar24 = vinsertps_avx(auVar24,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar243 = vsubps_avx(auVar243,*(undefined1 (*) [16])(prim + uVar131 * 0x19 + 6));
  auVar173._0_4_ = fVar195 * auVar243._0_4_;
  auVar173._4_4_ = fVar195 * auVar243._4_4_;
  auVar173._8_4_ = fVar195 * auVar243._8_4_;
  auVar173._12_4_ = fVar195 * auVar243._12_4_;
  auVar259._0_4_ = fVar195 * auVar24._0_4_;
  auVar259._4_4_ = fVar195 * auVar24._4_4_;
  auVar259._8_4_ = fVar195 * auVar24._8_4_;
  auVar259._12_4_ = fVar195 * auVar24._12_4_;
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 4 + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 4 + 10)));
  auVar145._16_16_ = auVar24;
  auVar145._0_16_ = auVar243;
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 5 + 6)));
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 5 + 10)));
  auVar206._16_16_ = auVar24;
  auVar206._0_16_ = auVar243;
  auVar231 = vcvtdq2ps_avx(auVar206);
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 6 + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 6 + 10)));
  auVar223._16_16_ = auVar24;
  auVar223._0_16_ = auVar243;
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0xb + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0xb + 10)));
  auVar152 = vcvtdq2ps_avx(auVar223);
  auVar224._16_16_ = auVar24;
  auVar224._0_16_ = auVar243;
  auVar313 = vcvtdq2ps_avx(auVar224);
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0xc + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0xc + 10)));
  auVar276._16_16_ = auVar24;
  auVar276._0_16_ = auVar243;
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0xd + 6)));
  auVar19 = vcvtdq2ps_avx(auVar276);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0xd + 10)));
  auVar297._16_16_ = auVar24;
  auVar297._0_16_ = auVar243;
  auVar20 = vcvtdq2ps_avx(auVar297);
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0x12 + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0x12 + 10)));
  auVar298._16_16_ = auVar24;
  auVar298._0_16_ = auVar243;
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0x13 + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0x13 + 10)));
  auVar21 = vcvtdq2ps_avx(auVar298);
  auVar327._16_16_ = auVar24;
  auVar327._0_16_ = auVar243;
  auVar22 = vcvtdq2ps_avx(auVar327);
  auVar243 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0x14 + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar131 * 0x14 + 10)));
  auVar337._16_16_ = auVar24;
  auVar337._0_16_ = auVar243;
  auVar23 = vcvtdq2ps_avx(auVar337);
  auVar243 = vshufps_avx(auVar259,auVar259,0);
  auVar24 = vshufps_avx(auVar259,auVar259,0x55);
  auVar200 = vshufps_avx(auVar259,auVar259,0xaa);
  fVar195 = auVar200._0_4_;
  fVar213 = auVar200._4_4_;
  fVar215 = auVar200._8_4_;
  fVar216 = auVar200._12_4_;
  fVar217 = auVar24._0_4_;
  fVar218 = auVar24._4_4_;
  fVar219 = auVar24._8_4_;
  fVar257 = auVar24._12_4_;
  fVar265 = auVar243._0_4_;
  fVar267 = auVar243._4_4_;
  fVar269 = auVar243._8_4_;
  fVar271 = auVar243._12_4_;
  auVar351._0_4_ = fVar265 * auVar145._0_4_ + fVar217 * auVar231._0_4_ + fVar195 * auVar152._0_4_;
  auVar351._4_4_ = fVar267 * auVar145._4_4_ + fVar218 * auVar231._4_4_ + fVar213 * auVar152._4_4_;
  auVar351._8_4_ = fVar269 * auVar145._8_4_ + fVar219 * auVar231._8_4_ + fVar215 * auVar152._8_4_;
  auVar351._12_4_ =
       fVar271 * auVar145._12_4_ + fVar257 * auVar231._12_4_ + fVar216 * auVar152._12_4_;
  auVar351._16_4_ =
       fVar265 * auVar145._16_4_ + fVar217 * auVar231._16_4_ + fVar195 * auVar152._16_4_;
  auVar351._20_4_ =
       fVar267 * auVar145._20_4_ + fVar218 * auVar231._20_4_ + fVar213 * auVar152._20_4_;
  auVar351._24_4_ =
       fVar269 * auVar145._24_4_ + fVar219 * auVar231._24_4_ + fVar215 * auVar152._24_4_;
  auVar351._28_4_ = fVar257 + in_register_000015dc + in_register_0000151c;
  auVar348._0_4_ = fVar265 * auVar313._0_4_ + fVar217 * auVar19._0_4_ + auVar20._0_4_ * fVar195;
  auVar348._4_4_ = fVar267 * auVar313._4_4_ + fVar218 * auVar19._4_4_ + auVar20._4_4_ * fVar213;
  auVar348._8_4_ = fVar269 * auVar313._8_4_ + fVar219 * auVar19._8_4_ + auVar20._8_4_ * fVar215;
  auVar348._12_4_ = fVar271 * auVar313._12_4_ + fVar257 * auVar19._12_4_ + auVar20._12_4_ * fVar216;
  auVar348._16_4_ = fVar265 * auVar313._16_4_ + fVar217 * auVar19._16_4_ + auVar20._16_4_ * fVar195;
  auVar348._20_4_ = fVar267 * auVar313._20_4_ + fVar218 * auVar19._20_4_ + auVar20._20_4_ * fVar213;
  auVar348._24_4_ = fVar269 * auVar313._24_4_ + fVar219 * auVar19._24_4_ + auVar20._24_4_ * fVar215;
  auVar348._28_4_ = fVar257 + in_register_000015dc + in_register_0000159c;
  auVar261._0_4_ = fVar265 * auVar21._0_4_ + fVar217 * auVar22._0_4_ + auVar23._0_4_ * fVar195;
  auVar261._4_4_ = fVar267 * auVar21._4_4_ + fVar218 * auVar22._4_4_ + auVar23._4_4_ * fVar213;
  auVar261._8_4_ = fVar269 * auVar21._8_4_ + fVar219 * auVar22._8_4_ + auVar23._8_4_ * fVar215;
  auVar261._12_4_ = fVar271 * auVar21._12_4_ + fVar257 * auVar22._12_4_ + auVar23._12_4_ * fVar216;
  auVar261._16_4_ = fVar265 * auVar21._16_4_ + fVar217 * auVar22._16_4_ + auVar23._16_4_ * fVar195;
  auVar261._20_4_ = fVar267 * auVar21._20_4_ + fVar218 * auVar22._20_4_ + auVar23._20_4_ * fVar213;
  auVar261._24_4_ = fVar269 * auVar21._24_4_ + fVar219 * auVar22._24_4_ + auVar23._24_4_ * fVar215;
  auVar261._28_4_ = fVar271 + fVar257 + fVar216;
  auVar243 = vshufps_avx(auVar173,auVar173,0);
  auVar24 = vshufps_avx(auVar173,auVar173,0x55);
  auVar200 = vshufps_avx(auVar173,auVar173,0xaa);
  fVar213 = auVar200._0_4_;
  fVar215 = auVar200._4_4_;
  fVar216 = auVar200._8_4_;
  fVar217 = auVar200._12_4_;
  fVar267 = auVar24._0_4_;
  fVar269 = auVar24._4_4_;
  fVar271 = auVar24._8_4_;
  fVar272 = auVar24._12_4_;
  fVar218 = auVar243._0_4_;
  fVar219 = auVar243._4_4_;
  fVar257 = auVar243._8_4_;
  fVar265 = auVar243._12_4_;
  fVar195 = auVar145._28_4_;
  auVar178._0_4_ = fVar218 * auVar145._0_4_ + fVar267 * auVar231._0_4_ + fVar213 * auVar152._0_4_;
  auVar178._4_4_ = fVar219 * auVar145._4_4_ + fVar269 * auVar231._4_4_ + fVar215 * auVar152._4_4_;
  auVar178._8_4_ = fVar257 * auVar145._8_4_ + fVar271 * auVar231._8_4_ + fVar216 * auVar152._8_4_;
  auVar178._12_4_ =
       fVar265 * auVar145._12_4_ + fVar272 * auVar231._12_4_ + fVar217 * auVar152._12_4_;
  auVar178._16_4_ =
       fVar218 * auVar145._16_4_ + fVar267 * auVar231._16_4_ + fVar213 * auVar152._16_4_;
  auVar178._20_4_ =
       fVar219 * auVar145._20_4_ + fVar269 * auVar231._20_4_ + fVar215 * auVar152._20_4_;
  auVar178._24_4_ =
       fVar257 * auVar145._24_4_ + fVar271 * auVar231._24_4_ + fVar216 * auVar152._24_4_;
  auVar178._28_4_ = fVar195 + auVar231._28_4_ + auVar152._28_4_;
  auVar244._0_4_ = fVar218 * auVar313._0_4_ + auVar20._0_4_ * fVar213 + fVar267 * auVar19._0_4_;
  auVar244._4_4_ = fVar219 * auVar313._4_4_ + auVar20._4_4_ * fVar215 + fVar269 * auVar19._4_4_;
  auVar244._8_4_ = fVar257 * auVar313._8_4_ + auVar20._8_4_ * fVar216 + fVar271 * auVar19._8_4_;
  auVar244._12_4_ = fVar265 * auVar313._12_4_ + auVar20._12_4_ * fVar217 + fVar272 * auVar19._12_4_;
  auVar244._16_4_ = fVar218 * auVar313._16_4_ + auVar20._16_4_ * fVar213 + fVar267 * auVar19._16_4_;
  auVar244._20_4_ = fVar219 * auVar313._20_4_ + auVar20._20_4_ * fVar215 + fVar269 * auVar19._20_4_;
  auVar244._24_4_ = fVar257 * auVar313._24_4_ + auVar20._24_4_ * fVar216 + fVar271 * auVar19._24_4_;
  auVar244._28_4_ = fVar195 + auVar20._28_4_ + auVar152._28_4_;
  auVar225._0_4_ = fVar218 * auVar21._0_4_ + fVar267 * auVar22._0_4_ + auVar23._0_4_ * fVar213;
  auVar225._4_4_ = fVar219 * auVar21._4_4_ + fVar269 * auVar22._4_4_ + auVar23._4_4_ * fVar215;
  auVar225._8_4_ = fVar257 * auVar21._8_4_ + fVar271 * auVar22._8_4_ + auVar23._8_4_ * fVar216;
  auVar225._12_4_ = fVar265 * auVar21._12_4_ + fVar272 * auVar22._12_4_ + auVar23._12_4_ * fVar217;
  auVar225._16_4_ = fVar218 * auVar21._16_4_ + fVar267 * auVar22._16_4_ + auVar23._16_4_ * fVar213;
  auVar225._20_4_ = fVar219 * auVar21._20_4_ + fVar269 * auVar22._20_4_ + auVar23._20_4_ * fVar215;
  auVar225._24_4_ = fVar257 * auVar21._24_4_ + fVar271 * auVar22._24_4_ + auVar23._24_4_ * fVar216;
  auVar225._28_4_ = fVar195 + auVar19._28_4_ + fVar217;
  auVar299._8_4_ = 0x7fffffff;
  auVar299._0_8_ = 0x7fffffff7fffffff;
  auVar299._12_4_ = 0x7fffffff;
  auVar299._16_4_ = 0x7fffffff;
  auVar299._20_4_ = 0x7fffffff;
  auVar299._24_4_ = 0x7fffffff;
  auVar299._28_4_ = 0x7fffffff;
  auVar138._8_4_ = 0x219392ef;
  auVar138._0_8_ = 0x219392ef219392ef;
  auVar138._12_4_ = 0x219392ef;
  auVar138._16_4_ = 0x219392ef;
  auVar138._20_4_ = 0x219392ef;
  auVar138._24_4_ = 0x219392ef;
  auVar138._28_4_ = 0x219392ef;
  auVar145 = vandps_avx(auVar351,auVar299);
  auVar145 = vcmpps_avx(auVar145,auVar138,1);
  auVar231 = vblendvps_avx(auVar351,auVar138,auVar145);
  auVar145 = vandps_avx(auVar348,auVar299);
  auVar145 = vcmpps_avx(auVar145,auVar138,1);
  auVar152 = vblendvps_avx(auVar348,auVar138,auVar145);
  auVar145 = vandps_avx(auVar261,auVar299);
  auVar145 = vcmpps_avx(auVar145,auVar138,1);
  auVar145 = vblendvps_avx(auVar261,auVar138,auVar145);
  auVar313 = vrcpps_avx(auVar231);
  fVar195 = auVar313._0_4_;
  fVar213 = auVar313._4_4_;
  auVar19._4_4_ = auVar231._4_4_ * fVar213;
  auVar19._0_4_ = auVar231._0_4_ * fVar195;
  fVar215 = auVar313._8_4_;
  auVar19._8_4_ = auVar231._8_4_ * fVar215;
  fVar216 = auVar313._12_4_;
  auVar19._12_4_ = auVar231._12_4_ * fVar216;
  fVar217 = auVar313._16_4_;
  auVar19._16_4_ = auVar231._16_4_ * fVar217;
  fVar218 = auVar313._20_4_;
  auVar19._20_4_ = auVar231._20_4_ * fVar218;
  fVar219 = auVar313._24_4_;
  auVar19._24_4_ = auVar231._24_4_ * fVar219;
  auVar19._28_4_ = auVar231._28_4_;
  auVar300._8_4_ = 0x3f800000;
  auVar300._0_8_ = 0x3f8000003f800000;
  auVar300._12_4_ = 0x3f800000;
  auVar300._16_4_ = 0x3f800000;
  auVar300._20_4_ = 0x3f800000;
  auVar300._24_4_ = 0x3f800000;
  auVar300._28_4_ = 0x3f800000;
  auVar231 = vsubps_avx(auVar300,auVar19);
  fVar195 = fVar195 + fVar195 * auVar231._0_4_;
  fVar213 = fVar213 + fVar213 * auVar231._4_4_;
  fVar215 = fVar215 + fVar215 * auVar231._8_4_;
  fVar216 = fVar216 + fVar216 * auVar231._12_4_;
  fVar217 = fVar217 + fVar217 * auVar231._16_4_;
  fVar218 = fVar218 + fVar218 * auVar231._20_4_;
  fVar219 = fVar219 + fVar219 * auVar231._24_4_;
  auVar231 = vrcpps_avx(auVar152);
  fVar257 = auVar231._0_4_;
  fVar265 = auVar231._4_4_;
  auVar313._4_4_ = fVar265 * auVar152._4_4_;
  auVar313._0_4_ = fVar257 * auVar152._0_4_;
  fVar267 = auVar231._8_4_;
  auVar313._8_4_ = fVar267 * auVar152._8_4_;
  fVar269 = auVar231._12_4_;
  auVar313._12_4_ = fVar269 * auVar152._12_4_;
  fVar271 = auVar231._16_4_;
  auVar313._16_4_ = fVar271 * auVar152._16_4_;
  fVar272 = auVar231._20_4_;
  auVar313._20_4_ = fVar272 * auVar152._20_4_;
  fVar273 = auVar231._24_4_;
  auVar313._24_4_ = fVar273 * auVar152._24_4_;
  auVar313._28_4_ = auVar152._28_4_;
  auVar231 = vsubps_avx(auVar300,auVar313);
  fVar257 = fVar257 + fVar257 * auVar231._0_4_;
  fVar265 = fVar265 + fVar265 * auVar231._4_4_;
  fVar267 = fVar267 + fVar267 * auVar231._8_4_;
  fVar269 = fVar269 + fVar269 * auVar231._12_4_;
  fVar271 = fVar271 + fVar271 * auVar231._16_4_;
  fVar272 = fVar272 + fVar272 * auVar231._20_4_;
  fVar273 = fVar273 + fVar273 * auVar231._24_4_;
  auVar231 = vrcpps_avx(auVar145);
  fVar274 = auVar231._0_4_;
  fVar283 = auVar231._4_4_;
  auVar152._4_4_ = fVar283 * auVar145._4_4_;
  auVar152._0_4_ = fVar274 * auVar145._0_4_;
  fVar285 = auVar231._8_4_;
  auVar152._8_4_ = fVar285 * auVar145._8_4_;
  fVar287 = auVar231._12_4_;
  auVar152._12_4_ = fVar287 * auVar145._12_4_;
  fVar290 = auVar231._16_4_;
  auVar152._16_4_ = fVar290 * auVar145._16_4_;
  fVar292 = auVar231._20_4_;
  auVar152._20_4_ = fVar292 * auVar145._20_4_;
  fVar293 = auVar231._24_4_;
  auVar152._24_4_ = fVar293 * auVar145._24_4_;
  auVar152._28_4_ = auVar145._28_4_;
  auVar145 = vsubps_avx(auVar300,auVar152);
  fVar274 = fVar274 + fVar274 * auVar145._0_4_;
  fVar283 = fVar283 + fVar283 * auVar145._4_4_;
  fVar285 = fVar285 + fVar285 * auVar145._8_4_;
  fVar287 = fVar287 + fVar287 * auVar145._12_4_;
  fVar290 = fVar290 + fVar290 * auVar145._16_4_;
  fVar292 = fVar292 + fVar292 * auVar145._20_4_;
  fVar293 = fVar293 + fVar293 * auVar145._24_4_;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *(ulong *)(prim + uVar131 * 7 + 6);
  auVar243 = vpmovsxwd_avx(auVar243);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar131 * 7 + 0xe);
  auVar24 = vpmovsxwd_avx(auVar24);
  auVar139._16_16_ = auVar24;
  auVar139._0_16_ = auVar243;
  auVar145 = vcvtdq2ps_avx(auVar139);
  auVar145 = vsubps_avx(auVar145,auVar178);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar131 * 9 + 6);
  auVar243 = vpmovsxwd_avx(auVar200);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar131 * 9 + 0xe);
  auVar24 = vpmovsxwd_avx(auVar222);
  auVar134._0_4_ = fVar195 * auVar145._0_4_;
  auVar134._4_4_ = fVar213 * auVar145._4_4_;
  auVar134._8_4_ = fVar215 * auVar145._8_4_;
  auVar134._12_4_ = fVar216 * auVar145._12_4_;
  auVar20._16_4_ = fVar217 * auVar145._16_4_;
  auVar20._0_16_ = auVar134;
  auVar20._20_4_ = fVar218 * auVar145._20_4_;
  auVar20._24_4_ = fVar219 * auVar145._24_4_;
  auVar20._28_4_ = auVar145._28_4_;
  auVar301._16_16_ = auVar24;
  auVar301._0_16_ = auVar243;
  auVar145 = vcvtdq2ps_avx(auVar301);
  auVar145 = vsubps_avx(auVar145,auVar178);
  auVar174._0_4_ = fVar195 * auVar145._0_4_;
  auVar174._4_4_ = fVar213 * auVar145._4_4_;
  auVar174._8_4_ = fVar215 * auVar145._8_4_;
  auVar174._12_4_ = fVar216 * auVar145._12_4_;
  auVar21._16_4_ = fVar217 * auVar145._16_4_;
  auVar21._0_16_ = auVar174;
  auVar21._20_4_ = fVar218 * auVar145._20_4_;
  auVar21._24_4_ = fVar219 * auVar145._24_4_;
  auVar21._28_4_ = auVar145._28_4_;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + uVar131 * 0xe + 6);
  auVar243 = vpmovsxwd_avx(auVar204);
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *(ulong *)(prim + uVar131 * 0xe + 0xe);
  auVar24 = vpmovsxwd_avx(auVar202);
  auVar207._16_16_ = auVar24;
  auVar207._0_16_ = auVar243;
  auVar145 = vcvtdq2ps_avx(auVar207);
  auVar145 = vsubps_avx(auVar145,auVar244);
  auVar197._0_4_ = fVar257 * auVar145._0_4_;
  auVar197._4_4_ = fVar265 * auVar145._4_4_;
  auVar197._8_4_ = fVar267 * auVar145._8_4_;
  auVar197._12_4_ = fVar269 * auVar145._12_4_;
  auVar22._16_4_ = fVar271 * auVar145._16_4_;
  auVar22._0_16_ = auVar197;
  auVar22._20_4_ = fVar272 * auVar145._20_4_;
  auVar22._24_4_ = fVar273 * auVar145._24_4_;
  auVar22._28_4_ = auVar145._28_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  auVar243 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + 0xe);
  auVar24 = vpmovsxwd_avx(auVar9);
  auVar302._16_16_ = auVar24;
  auVar302._0_16_ = auVar243;
  auVar145 = vcvtdq2ps_avx(auVar302);
  auVar145 = vsubps_avx(auVar145,auVar244);
  auVar241._0_4_ = fVar257 * auVar145._0_4_;
  auVar241._4_4_ = fVar265 * auVar145._4_4_;
  auVar241._8_4_ = fVar267 * auVar145._8_4_;
  auVar241._12_4_ = fVar269 * auVar145._12_4_;
  auVar231._16_4_ = fVar271 * auVar145._16_4_;
  auVar231._0_16_ = auVar241;
  auVar231._20_4_ = fVar272 * auVar145._20_4_;
  auVar231._24_4_ = fVar273 * auVar145._24_4_;
  auVar231._28_4_ = auVar145._28_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar131 * 0x15 + 6);
  auVar243 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar131 * 0x15 + 0xe);
  auVar24 = vpmovsxwd_avx(auVar11);
  auVar262._16_16_ = auVar24;
  auVar262._0_16_ = auVar243;
  auVar145 = vcvtdq2ps_avx(auVar262);
  auVar145 = vsubps_avx(auVar145,auVar225);
  auVar260._0_4_ = fVar274 * auVar145._0_4_;
  auVar260._4_4_ = fVar283 * auVar145._4_4_;
  auVar260._8_4_ = fVar285 * auVar145._8_4_;
  auVar260._12_4_ = fVar287 * auVar145._12_4_;
  auVar23._16_4_ = fVar290 * auVar145._16_4_;
  auVar23._0_16_ = auVar260;
  auVar23._20_4_ = fVar292 * auVar145._20_4_;
  auVar23._24_4_ = fVar293 * auVar145._24_4_;
  auVar23._28_4_ = auVar145._28_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar131 * 0x17 + 6);
  auVar243 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar131 * 0x17 + 0xe);
  auVar24 = vpmovsxwd_avx(auVar13);
  auVar303._16_16_ = auVar24;
  auVar303._0_16_ = auVar243;
  auVar145 = vcvtdq2ps_avx(auVar303);
  auVar145 = vsubps_avx(auVar145,auVar225);
  auVar220._0_4_ = fVar274 * auVar145._0_4_;
  auVar220._4_4_ = fVar283 * auVar145._4_4_;
  auVar220._8_4_ = fVar285 * auVar145._8_4_;
  auVar220._12_4_ = fVar287 * auVar145._12_4_;
  auVar25._16_4_ = fVar290 * auVar145._16_4_;
  auVar25._0_16_ = auVar220;
  auVar25._20_4_ = fVar292 * auVar145._20_4_;
  auVar25._24_4_ = fVar293 * auVar145._24_4_;
  auVar25._28_4_ = auVar145._28_4_;
  auVar243 = vpminsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar24 = vpminsd_avx(auVar134,auVar174);
  auVar338._16_16_ = auVar243;
  auVar338._0_16_ = auVar24;
  auVar200 = auVar231._16_16_;
  auVar316 = ZEXT1664(auVar200);
  auVar243 = vpminsd_avx(auVar22._16_16_,auVar200);
  auVar24 = vpminsd_avx(auVar197,auVar241);
  auVar349._16_16_ = auVar243;
  auVar349._0_16_ = auVar24;
  auVar145 = vmaxps_avx(auVar338,auVar349);
  auVar243 = vpminsd_avx(auVar23._16_16_,auVar25._16_16_);
  auVar24 = vpminsd_avx(auVar260,auVar220);
  auVar360._16_16_ = auVar243;
  auVar360._0_16_ = auVar24;
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar371._4_4_ = uVar6;
  auVar371._0_4_ = uVar6;
  auVar371._8_4_ = uVar6;
  auVar371._12_4_ = uVar6;
  auVar371._16_4_ = uVar6;
  auVar371._20_4_ = uVar6;
  auVar371._24_4_ = uVar6;
  auVar371._28_4_ = uVar6;
  auVar231 = vmaxps_avx(auVar360,auVar371);
  auVar145 = vmaxps_avx(auVar145,auVar231);
  local_80._4_4_ = auVar145._4_4_ * 0.99999964;
  local_80._0_4_ = auVar145._0_4_ * 0.99999964;
  local_80._8_4_ = auVar145._8_4_ * 0.99999964;
  local_80._12_4_ = auVar145._12_4_ * 0.99999964;
  local_80._16_4_ = auVar145._16_4_ * 0.99999964;
  local_80._20_4_ = auVar145._20_4_ * 0.99999964;
  local_80._24_4_ = auVar145._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar243 = vpmaxsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar24 = vpmaxsd_avx(auVar134,auVar174);
  auVar140._16_16_ = auVar243;
  auVar140._0_16_ = auVar24;
  auVar243 = vpmaxsd_avx(auVar22._16_16_,auVar200);
  auVar24 = vpmaxsd_avx(auVar197,auVar241);
  auVar179._16_16_ = auVar243;
  auVar179._0_16_ = auVar24;
  auVar145 = vminps_avx(auVar140,auVar179);
  auVar243 = vpmaxsd_avx(auVar23._16_16_,auVar25._16_16_);
  auVar24 = vpmaxsd_avx(auVar260,auVar220);
  auVar180._16_16_ = auVar243;
  auVar180._0_16_ = auVar24;
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar208._4_4_ = uVar6;
  auVar208._0_4_ = uVar6;
  auVar208._8_4_ = uVar6;
  auVar208._12_4_ = uVar6;
  auVar208._16_4_ = uVar6;
  auVar208._20_4_ = uVar6;
  auVar208._24_4_ = uVar6;
  auVar208._28_4_ = uVar6;
  auVar231 = vminps_avx(auVar180,auVar208);
  auVar145 = vminps_avx(auVar145,auVar231);
  auVar26._4_4_ = auVar145._4_4_ * 1.0000004;
  auVar26._0_4_ = auVar145._0_4_ * 1.0000004;
  auVar26._8_4_ = auVar145._8_4_ * 1.0000004;
  auVar26._12_4_ = auVar145._12_4_ * 1.0000004;
  auVar26._16_4_ = auVar145._16_4_ * 1.0000004;
  auVar26._20_4_ = auVar145._20_4_ * 1.0000004;
  auVar26._24_4_ = auVar145._24_4_ * 1.0000004;
  auVar26._28_4_ = auVar145._28_4_;
  auVar145 = vcmpps_avx(local_80,auVar26,2);
  auVar243 = vpshufd_avx(ZEXT116((byte)PVar14),0);
  auVar181._16_16_ = auVar243;
  auVar181._0_16_ = auVar243;
  auVar231 = vcvtdq2ps_avx(auVar181);
  auVar231 = vcmpps_avx(_DAT_01f7b060,auVar231,1);
  auVar145 = vandps_avx(auVar145,auVar231);
  uVar124 = vmovmskps_avx(auVar145);
  local_648 = pre->ray_space + k;
  local_640 = mm_lookupmask_ps._16_8_;
  uStack_638 = mm_lookupmask_ps._24_8_;
  uStack_630 = mm_lookupmask_ps._16_8_;
  uStack_628 = mm_lookupmask_ps._24_8_;
  local_788 = (undefined1 (*) [32])&local_180;
  uVar128 = 1 << ((byte)k & 0x1f);
  local_7a0 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar128 & 0xf) << 4));
  local_7a8 = mm_lookupmask_ps + (long)((int)uVar128 >> 4) * 0x10;
  do {
    uVar131 = (ulong)uVar124;
    if (uVar131 == 0) {
      return;
    }
    auVar145 = auVar316._0_32_;
    lVar127 = 0;
    if (uVar131 != 0) {
      for (; (uVar124 >> lVar127 & 1) == 0; lVar127 = lVar127 + 1) {
      }
    }
    uVar131 = uVar131 - 1 & uVar131;
    uVar124 = *(uint *)(prim + 2);
    uVar128 = *(uint *)(prim + lVar127 * 4 + 6);
    pGVar17 = (context->scene->geometries).items[uVar124].ptr;
    uVar129 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                              pGVar17[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * (ulong)uVar128);
    p_Var18 = pGVar17[1].intersectionFilterN;
    lVar127 = *(long *)&pGVar17[1].time_range.upper;
    auVar243 = *(undefined1 (*) [16])(lVar127 + (long)p_Var18 * uVar129);
    auVar24 = *(undefined1 (*) [16])(lVar127 + (uVar129 + 1) * (long)p_Var18);
    auVar200 = *(undefined1 (*) [16])(lVar127 + (uVar129 + 2) * (long)p_Var18);
    lVar130 = 0;
    if (uVar131 != 0) {
      for (; (uVar131 >> lVar130 & 1) == 0; lVar130 = lVar130 + 1) {
      }
    }
    auVar222 = *(undefined1 (*) [16])(lVar127 + (uVar129 + 3) * (long)p_Var18);
    if (((uVar131 != 0) && (uVar129 = uVar131 - 1 & uVar131, uVar129 != 0)) &&
       (lVar127 = 0, uVar129 != 0)) {
      for (; (uVar129 >> lVar127 & 1) == 0; lVar127 = lVar127 + 1) {
      }
    }
    uVar15 = (uint)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar204 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    auVar9 = vinsertps_avx(auVar204,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar8 = vsubps_avx(auVar243,auVar9);
    auVar204 = vshufps_avx(auVar8,auVar8,0);
    auVar202 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    fVar195 = (local_648->vx).field_0.m128[0];
    fVar213 = (local_648->vx).field_0.m128[1];
    fVar215 = (local_648->vx).field_0.m128[2];
    fVar216 = (local_648->vx).field_0.m128[3];
    fVar217 = (local_648->vy).field_0.m128[0];
    fVar218 = (local_648->vy).field_0.m128[1];
    fVar219 = (local_648->vy).field_0.m128[2];
    fVar257 = (local_648->vy).field_0.m128[3];
    fVar265 = (local_648->vz).field_0.m128[0];
    fVar267 = (local_648->vz).field_0.m128[1];
    fVar269 = (local_648->vz).field_0.m128[2];
    fVar271 = (local_648->vz).field_0.m128[3];
    auVar175._0_4_ = auVar204._0_4_ * fVar195 + auVar202._0_4_ * fVar217 + fVar265 * auVar8._0_4_;
    auVar175._4_4_ = auVar204._4_4_ * fVar213 + auVar202._4_4_ * fVar218 + fVar267 * auVar8._4_4_;
    auVar175._8_4_ = auVar204._8_4_ * fVar215 + auVar202._8_4_ * fVar219 + fVar269 * auVar8._8_4_;
    auVar175._12_4_ =
         auVar204._12_4_ * fVar216 + auVar202._12_4_ * fVar257 + fVar271 * auVar8._12_4_;
    auVar204 = vblendps_avx(auVar175,auVar243,8);
    auVar10 = vsubps_avx(auVar24,auVar9);
    auVar202 = vshufps_avx(auVar10,auVar10,0);
    auVar8 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar359._0_4_ = auVar202._0_4_ * fVar195 + auVar8._0_4_ * fVar217 + fVar265 * auVar10._0_4_;
    auVar359._4_4_ = auVar202._4_4_ * fVar213 + auVar8._4_4_ * fVar218 + fVar267 * auVar10._4_4_;
    auVar359._8_4_ = auVar202._8_4_ * fVar215 + auVar8._8_4_ * fVar219 + fVar269 * auVar10._8_4_;
    auVar359._12_4_ = auVar202._12_4_ * fVar216 + auVar8._12_4_ * fVar257 + fVar271 * auVar10._12_4_
    ;
    auVar202 = vblendps_avx(auVar359,auVar24,8);
    auVar11 = vsubps_avx(auVar200,auVar9);
    auVar8 = vshufps_avx(auVar11,auVar11,0);
    auVar10 = vshufps_avx(auVar11,auVar11,0x55);
    auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
    auVar311._0_4_ = auVar8._0_4_ * fVar195 + auVar10._0_4_ * fVar217 + fVar265 * auVar11._0_4_;
    auVar311._4_4_ = auVar8._4_4_ * fVar213 + auVar10._4_4_ * fVar218 + fVar267 * auVar11._4_4_;
    auVar311._8_4_ = auVar8._8_4_ * fVar215 + auVar10._8_4_ * fVar219 + fVar269 * auVar11._8_4_;
    auVar311._12_4_ = auVar8._12_4_ * fVar216 + auVar10._12_4_ * fVar257 + fVar271 * auVar11._12_4_;
    auVar11 = vshufps_avx(auVar200,auVar200,0xff);
    auVar8 = vblendps_avx(auVar311,auVar200,8);
    auVar12 = vsubps_avx(auVar222,auVar9);
    auVar9 = vshufps_avx(auVar12,auVar12,0);
    auVar10 = vshufps_avx(auVar12,auVar12,0x55);
    auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
    auVar326._0_4_ = auVar9._0_4_ * fVar195 + auVar10._0_4_ * fVar217 + fVar265 * auVar12._0_4_;
    auVar326._4_4_ = auVar9._4_4_ * fVar213 + auVar10._4_4_ * fVar218 + fVar267 * auVar12._4_4_;
    auVar326._8_4_ = auVar9._8_4_ * fVar215 + auVar10._8_4_ * fVar219 + fVar269 * auVar12._8_4_;
    auVar326._12_4_ = auVar9._12_4_ * fVar216 + auVar10._12_4_ * fVar257 + fVar271 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar222,auVar222,0xff);
    auVar9 = vblendps_avx(auVar326,auVar222,8);
    auVar242._8_4_ = 0x7fffffff;
    auVar242._0_8_ = 0x7fffffff7fffffff;
    auVar242._12_4_ = 0x7fffffff;
    auVar204 = vandps_avx(auVar204,auVar242);
    auVar202 = vandps_avx(auVar202,auVar242);
    auVar10 = vmaxps_avx(auVar204,auVar202);
    auVar204 = vandps_avx(auVar8,auVar242);
    auVar202 = vandps_avx(auVar9,auVar242);
    auVar204 = vmaxps_avx(auVar204,auVar202);
    auVar204 = vmaxps_avx(auVar10,auVar204);
    auVar202 = vmovshdup_avx(auVar204);
    auVar202 = vmaxss_avx(auVar202,auVar204);
    auVar204 = vshufpd_avx(auVar204,auVar204,1);
    auVar204 = vmaxss_avx(auVar204,auVar202);
    lVar127 = (long)(int)uVar15 * 0x44;
    fVar318 = *(float *)(bezier_basis0 + lVar127 + 0x908);
    fVar320 = *(float *)(bezier_basis0 + lVar127 + 0x90c);
    fVar236 = *(float *)(bezier_basis0 + lVar127 + 0x910);
    fVar307 = *(float *)(bezier_basis0 + lVar127 + 0x914);
    fVar322 = *(float *)(bezier_basis0 + lVar127 + 0x918);
    fVar289 = *(float *)(bezier_basis0 + lVar127 + 0x91c);
    fVar237 = *(float *)(bezier_basis0 + lVar127 + 0x920);
    local_820._0_16_ = auVar311;
    auVar202 = vshufps_avx(auVar311,auVar311,0);
    local_5a0._16_16_ = auVar202;
    local_5a0._0_16_ = auVar202;
    auVar8 = vshufps_avx(auVar311,auVar311,0x55);
    register0x00001390 = auVar8;
    _local_4e0 = auVar8;
    register0x00001410 = auVar11;
    _local_400 = auVar11;
    fVar195 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar127 + 0xd8c);
    fVar213 = *(float *)(bezier_basis0 + lVar127 + 0xd90);
    fVar215 = *(float *)(bezier_basis0 + lVar127 + 0xd94);
    fVar216 = *(float *)(bezier_basis0 + lVar127 + 0xd98);
    fVar217 = *(float *)(bezier_basis0 + lVar127 + 0xd9c);
    fVar218 = *(float *)(bezier_basis0 + lVar127 + 0xda0);
    fVar219 = *(float *)(bezier_basis0 + lVar127 + 0xda4);
    auVar118 = *(undefined1 (*) [28])(bezier_basis0 + lVar127 + 0xd8c);
    auVar9 = vshufps_avx(auVar326,auVar326,0);
    register0x00001310 = auVar9;
    _local_520 = auVar9;
    auVar10 = vshufps_avx(auVar326,auVar326,0x55);
    register0x000015d0 = auVar10;
    _local_6a0 = auVar10;
    register0x000013d0 = auVar12;
    _local_a0 = auVar12;
    fVar239 = auVar9._0_4_;
    fVar250 = auVar9._4_4_;
    fVar252 = auVar9._8_4_;
    fVar254 = auVar9._12_4_;
    fVar376 = auVar10._0_4_;
    fVar379 = auVar10._4_4_;
    fVar380 = auVar10._8_4_;
    fVar381 = auVar10._12_4_;
    fVar335 = auVar202._0_4_;
    fVar342 = auVar202._4_4_;
    fVar344 = auVar202._8_4_;
    fVar346 = auVar202._12_4_;
    fVar275 = auVar8._0_4_;
    fVar284 = auVar8._4_4_;
    fVar286 = auVar8._8_4_;
    fVar288 = auVar8._12_4_;
    fVar274 = auVar12._0_4_;
    fVar285 = auVar12._4_4_;
    fVar287 = auVar12._8_4_;
    fVar292 = auVar12._12_4_;
    fVar293 = auVar11._0_4_;
    fVar240 = auVar11._4_4_;
    fVar251 = auVar11._8_4_;
    auVar202 = vshufps_avx(auVar359,auVar359,0);
    register0x00001490 = auVar202;
    _local_c0 = auVar202;
    fVar308 = *(float *)(bezier_basis0 + lVar127 + 0x484);
    fVar323 = *(float *)(bezier_basis0 + lVar127 + 0x488);
    fVar324 = *(float *)(bezier_basis0 + lVar127 + 0x48c);
    fVar238 = *(float *)(bezier_basis0 + lVar127 + 0x490);
    fStack_5b0 = *(float *)(bezier_basis0 + lVar127 + 0x494);
    fStack_5ac = *(float *)(bezier_basis0 + lVar127 + 0x498);
    fStack_5a8 = *(float *)(bezier_basis0 + lVar127 + 0x49c);
    fStack_5a4 = *(float *)(bezier_basis0 + lVar127 + 0x4a0);
    fVar336 = auVar202._0_4_;
    fVar343 = auVar202._4_4_;
    fVar345 = auVar202._8_4_;
    fVar347 = auVar202._12_4_;
    auVar8 = vshufps_avx(auVar359,auVar359,0x55);
    register0x00001410 = auVar8;
    _local_500 = auVar8;
    fVar310 = auVar8._0_4_;
    fVar317 = auVar8._4_4_;
    fVar319 = auVar8._8_4_;
    fVar321 = auVar8._12_4_;
    auVar8 = vshufps_avx(auVar24,auVar24,0xff);
    register0x00001590 = auVar8;
    _local_280 = auVar8;
    fVar332 = auVar8._0_4_;
    fVar333 = auVar8._4_4_;
    fVar358 = auVar8._8_4_;
    fVar366 = auVar8._12_4_;
    fVar369 = *(float *)(bezier_basis0 + lVar127 + 0x924) + 0.0 + 0.0;
    auVar8 = vshufps_avx(auVar175,auVar175,0);
    register0x00001350 = auVar8;
    _local_3e0 = auVar8;
    fVar257 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar127);
    fVar265 = *(float *)(bezier_basis0 + lVar127 + 4);
    fVar267 = *(float *)(bezier_basis0 + lVar127 + 8);
    fVar269 = *(float *)(bezier_basis0 + lVar127 + 0xc);
    fVar271 = *(float *)(bezier_basis0 + lVar127 + 0x10);
    fVar272 = *(float *)(bezier_basis0 + lVar127 + 0x14);
    fVar273 = *(float *)(bezier_basis0 + lVar127 + 0x18);
    auVar119 = *(undefined1 (*) [28])(bezier_basis0 + lVar127);
    fVar258 = auVar8._0_4_;
    fVar266 = auVar8._4_4_;
    fVar268 = auVar8._8_4_;
    fVar270 = auVar8._12_4_;
    auVar350._0_4_ = fVar258 * fVar257 + fVar336 * fVar308 + fVar335 * fVar318 + fVar239 * fVar195;
    auVar350._4_4_ = fVar266 * fVar265 + fVar343 * fVar323 + fVar342 * fVar320 + fVar250 * fVar213;
    auVar350._8_4_ = fVar268 * fVar267 + fVar345 * fVar324 + fVar344 * fVar236 + fVar252 * fVar215;
    auVar350._12_4_ = fVar270 * fVar269 + fVar347 * fVar238 + fVar346 * fVar307 + fVar254 * fVar216;
    auVar350._16_4_ =
         fVar258 * fVar271 + fVar336 * fStack_5b0 + fVar335 * fVar322 + fVar239 * fVar217;
    auVar350._20_4_ =
         fVar266 * fVar272 + fVar343 * fStack_5ac + fVar342 * fVar289 + fVar250 * fVar218;
    auVar350._24_4_ =
         fVar268 * fVar273 + fVar345 * fStack_5a8 + fVar344 * fVar237 + fVar252 * fVar219;
    auVar350._28_4_ = fVar288 + 0.0;
    auVar8 = vshufps_avx(auVar175,auVar175,0x55);
    register0x00001290 = auVar8;
    _local_780 = auVar8;
    fVar196 = auVar8._0_4_;
    fVar214 = auVar8._4_4_;
    fVar309 = auVar8._8_4_;
    fVar296 = auVar8._12_4_;
    auVar352._0_4_ = fVar196 * fVar257 + fVar310 * fVar308 + fVar275 * fVar318 + fVar376 * fVar195;
    auVar352._4_4_ = fVar214 * fVar265 + fVar317 * fVar323 + fVar284 * fVar320 + fVar379 * fVar213;
    auVar352._8_4_ = fVar309 * fVar267 + fVar319 * fVar324 + fVar286 * fVar236 + fVar380 * fVar215;
    auVar352._12_4_ = fVar296 * fVar269 + fVar321 * fVar238 + fVar288 * fVar307 + fVar381 * fVar216;
    auVar352._16_4_ =
         fVar196 * fVar271 + fVar310 * fStack_5b0 + fVar275 * fVar322 + fVar376 * fVar217;
    auVar352._20_4_ =
         fVar214 * fVar272 + fVar317 * fStack_5ac + fVar284 * fVar289 + fVar379 * fVar218;
    auVar352._24_4_ =
         fVar309 * fVar273 + fVar319 * fStack_5a8 + fVar286 * fVar237 + fVar380 * fVar219;
    auVar352._28_4_ = 0;
    auVar8 = vpermilps_avx(auVar243,0xff);
    register0x00001450 = auVar8;
    _local_e0 = auVar8;
    fVar253 = auVar8._0_4_;
    fVar255 = auVar8._4_4_;
    fVar325 = auVar8._8_4_;
    fVar132 = fVar332 * fVar308 + fVar293 * fVar318 + fVar274 * fVar195 + fVar253 * fVar257;
    fVar156 = fVar333 * fVar323 + fVar240 * fVar320 + fVar285 * fVar213 + fVar255 * fVar265;
    fVar159 = fVar358 * fVar324 + fVar251 * fVar236 + fVar287 * fVar215 + fVar325 * fVar267;
    fVar163 = fVar366 * fVar238 + auVar11._12_4_ * fVar307 + fVar292 * fVar216 +
              auVar8._12_4_ * fVar269;
    fVar165 = fVar332 * fStack_5b0 + fVar293 * fVar322 + fVar274 * fVar217 + fVar253 * fVar271;
    fVar167 = fVar333 * fStack_5ac + fVar240 * fVar289 + fVar285 * fVar218 + fVar255 * fVar272;
    fVar169 = fVar358 * fStack_5a8 + fVar251 * fVar237 + fVar287 * fVar219 + fVar325 * fVar273;
    fVar171 = fVar369 + 0.0;
    fVar193 = *(float *)(bezier_basis1 + lVar127 + 0x908);
    fVar291 = *(float *)(bezier_basis1 + lVar127 + 0x90c);
    fVar294 = *(float *)(bezier_basis1 + lVar127 + 0x910);
    fVar157 = *(float *)(bezier_basis1 + lVar127 + 0x914);
    fVar334 = *(float *)(bezier_basis1 + lVar127 + 0x918);
    fVar160 = *(float *)(bezier_basis1 + lVar127 + 0x91c);
    fVar161 = *(float *)(bezier_basis1 + lVar127 + 0x920);
    fVar133 = *(float *)(bezier_basis1 + lVar127 + 0xd8c);
    fVar158 = *(float *)(bezier_basis1 + lVar127 + 0xd90);
    fVar162 = *(float *)(bezier_basis1 + lVar127 + 0xd94);
    fVar164 = *(float *)(bezier_basis1 + lVar127 + 0xd98);
    fVar166 = *(float *)(bezier_basis1 + lVar127 + 0xd9c);
    fVar168 = *(float *)(bezier_basis1 + lVar127 + 0xda0);
    fVar170 = *(float *)(bezier_basis1 + lVar127 + 0xda4);
    auVar231 = *(undefined1 (*) [32])(bezier_basis1 + lVar127 + 0x484);
    auVar282 = ZEXT3264(auVar231);
    fVar195 = auVar231._0_4_;
    fVar216 = auVar231._4_4_;
    fVar219 = auVar231._8_4_;
    fVar267 = auVar231._12_4_;
    fVar272 = auVar231._16_4_;
    fVar283 = auVar231._20_4_;
    fVar290 = auVar231._24_4_;
    fVar172 = *(float *)(bezier_basis1 + lVar127);
    fVar256 = *(float *)(bezier_basis1 + lVar127 + 4);
    fVar295 = *(float *)(bezier_basis1 + lVar127 + 8);
    fVar194 = *(float *)(bezier_basis1 + lVar127 + 0xc);
    fVar233 = *(float *)(bezier_basis1 + lVar127 + 0x10);
    fVar234 = *(float *)(bezier_basis1 + lVar127 + 0x14);
    fVar235 = *(float *)(bezier_basis1 + lVar127 + 0x18);
    auVar245._0_4_ = fVar258 * fVar172 + fVar336 * fVar195 + fVar193 * fVar335 + fVar239 * fVar133;
    auVar245._4_4_ = fVar266 * fVar256 + fVar343 * fVar216 + fVar291 * fVar342 + fVar250 * fVar158;
    auVar245._8_4_ = fVar268 * fVar295 + fVar345 * fVar219 + fVar294 * fVar344 + fVar252 * fVar162;
    auVar245._12_4_ = fVar270 * fVar194 + fVar347 * fVar267 + fVar157 * fVar346 + fVar254 * fVar164;
    auVar245._16_4_ = fVar258 * fVar233 + fVar336 * fVar272 + fVar334 * fVar335 + fVar239 * fVar166;
    auVar245._20_4_ = fVar266 * fVar234 + fVar343 * fVar283 + fVar160 * fVar342 + fVar250 * fVar168;
    auVar245._24_4_ = fVar268 * fVar235 + fVar345 * fVar290 + fVar161 * fVar344 + fVar252 * fVar170;
    auVar245._28_4_ = fVar366 + fVar369 + fVar254 + 0.0;
    local_720._0_4_ = fVar196 * fVar172 + fVar310 * fVar195 + fVar193 * fVar275 + fVar376 * fVar133;
    local_720._4_4_ = fVar214 * fVar256 + fVar317 * fVar216 + fVar291 * fVar284 + fVar379 * fVar158;
    fStack_718 = fVar309 * fVar295 + fVar319 * fVar219 + fVar294 * fVar286 + fVar380 * fVar162;
    fStack_714 = fVar296 * fVar194 + fVar321 * fVar267 + fVar157 * fVar288 + fVar381 * fVar164;
    auVar226._16_4_ = fVar196 * fVar233 + fVar310 * fVar272 + fVar334 * fVar275 + fVar376 * fVar166;
    auVar226._0_16_ = _local_720;
    auVar226._20_4_ = fVar214 * fVar234 + fVar317 * fVar283 + fVar160 * fVar284 + fVar379 * fVar168;
    auVar226._24_4_ = fVar309 * fVar235 + fVar319 * fVar290 + fVar161 * fVar286 + fVar380 * fVar170;
    auVar226._28_4_ = fVar296 + fVar369 + fVar288 + 0.0;
    auVar312._0_4_ = fVar332 * fVar195 + fVar193 * fVar293 + fVar274 * fVar133 + fVar253 * fVar172;
    auVar312._4_4_ = fVar333 * fVar216 + fVar291 * fVar240 + fVar285 * fVar158 + fVar255 * fVar256;
    auVar312._8_4_ = fVar358 * fVar219 + fVar294 * fVar251 + fVar287 * fVar162 + fVar325 * fVar295;
    auVar312._12_4_ =
         fVar366 * fVar267 + fVar157 * auVar11._12_4_ + fVar292 * fVar164 + auVar8._12_4_ * fVar194;
    auVar312._16_4_ = fVar332 * fVar272 + fVar334 * fVar293 + fVar274 * fVar166 + fVar253 * fVar233;
    auVar312._20_4_ = fVar333 * fVar283 + fVar160 * fVar240 + fVar285 * fVar168 + fVar255 * fVar234;
    auVar312._24_4_ = fVar358 * fVar290 + fVar161 * fVar251 + fVar287 * fVar170 + fVar325 * fVar235;
    auVar312._28_4_ = fVar369 + fVar292 + fVar288 + fVar296;
    auVar19 = vsubps_avx(auVar245,auVar350);
    auVar20 = vsubps_avx(auVar226,auVar352);
    fVar213 = auVar19._0_4_;
    fVar217 = auVar19._4_4_;
    auVar27._4_4_ = auVar352._4_4_ * fVar217;
    auVar27._0_4_ = auVar352._0_4_ * fVar213;
    fVar257 = auVar19._8_4_;
    auVar27._8_4_ = auVar352._8_4_ * fVar257;
    fVar269 = auVar19._12_4_;
    auVar27._12_4_ = auVar352._12_4_ * fVar269;
    fVar273 = auVar19._16_4_;
    auVar27._16_4_ = auVar352._16_4_ * fVar273;
    fVar285 = auVar19._20_4_;
    auVar27._20_4_ = auVar352._20_4_ * fVar285;
    fVar292 = auVar19._24_4_;
    auVar27._24_4_ = auVar352._24_4_ * fVar292;
    auVar27._28_4_ = fVar296;
    fVar215 = auVar20._0_4_;
    fVar218 = auVar20._4_4_;
    auVar28._4_4_ = auVar350._4_4_ * fVar218;
    auVar28._0_4_ = auVar350._0_4_ * fVar215;
    fVar265 = auVar20._8_4_;
    auVar28._8_4_ = auVar350._8_4_ * fVar265;
    fVar271 = auVar20._12_4_;
    auVar28._12_4_ = auVar350._12_4_ * fVar271;
    fVar274 = auVar20._16_4_;
    auVar28._16_4_ = auVar350._16_4_ * fVar274;
    fVar287 = auVar20._20_4_;
    auVar28._20_4_ = auVar350._20_4_ * fVar287;
    fVar293 = auVar20._24_4_;
    auVar28._24_4_ = auVar350._24_4_ * fVar293;
    auVar28._28_4_ = auVar226._28_4_;
    auVar313 = vsubps_avx(auVar27,auVar28);
    auVar112._4_4_ = fVar156;
    auVar112._0_4_ = fVar132;
    auVar112._8_4_ = fVar159;
    auVar112._12_4_ = fVar163;
    auVar112._16_4_ = fVar165;
    auVar112._20_4_ = fVar167;
    auVar112._24_4_ = fVar169;
    auVar112._28_4_ = fVar171;
    auVar152 = vmaxps_avx(auVar112,auVar312);
    auVar29._4_4_ = auVar152._4_4_ * auVar152._4_4_ * (fVar217 * fVar217 + fVar218 * fVar218);
    auVar29._0_4_ = auVar152._0_4_ * auVar152._0_4_ * (fVar213 * fVar213 + fVar215 * fVar215);
    auVar29._8_4_ = auVar152._8_4_ * auVar152._8_4_ * (fVar257 * fVar257 + fVar265 * fVar265);
    auVar29._12_4_ = auVar152._12_4_ * auVar152._12_4_ * (fVar269 * fVar269 + fVar271 * fVar271);
    auVar29._16_4_ = auVar152._16_4_ * auVar152._16_4_ * (fVar273 * fVar273 + fVar274 * fVar274);
    auVar29._20_4_ = auVar152._20_4_ * auVar152._20_4_ * (fVar285 * fVar285 + fVar287 * fVar287);
    auVar29._24_4_ = auVar152._24_4_ * auVar152._24_4_ * (fVar292 * fVar292 + fVar293 * fVar293);
    auVar29._28_4_ = auVar20._28_4_ + auVar226._28_4_;
    auVar30._4_4_ = auVar313._4_4_ * auVar313._4_4_;
    auVar30._0_4_ = auVar313._0_4_ * auVar313._0_4_;
    auVar30._8_4_ = auVar313._8_4_ * auVar313._8_4_;
    auVar30._12_4_ = auVar313._12_4_ * auVar313._12_4_;
    auVar30._16_4_ = auVar313._16_4_ * auVar313._16_4_;
    auVar30._20_4_ = auVar313._20_4_ * auVar313._20_4_;
    auVar30._24_4_ = auVar313._24_4_ * auVar313._24_4_;
    auVar30._28_4_ = auVar313._28_4_;
    auVar152 = vcmpps_avx(auVar30,auVar29,2);
    auVar221._0_4_ = (float)(int)uVar15;
    auVar221._4_12_ = auVar202._4_12_;
    local_540._0_16_ = auVar221;
    auVar202 = vshufps_avx(auVar221,auVar221,0);
    auVar227._16_16_ = auVar202;
    auVar227._0_16_ = auVar202;
    auVar313 = vcmpps_avx(_DAT_01f7b060,auVar227,1);
    auVar232 = ZEXT3264(auVar313);
    auVar202 = vpermilps_avx(auVar175,0xaa);
    register0x00001450 = auVar202;
    _local_600 = auVar202;
    auVar8 = vpermilps_avx(auVar359,0xaa);
    register0x00001550 = auVar8;
    _local_420 = auVar8;
    auVar9 = vpermilps_avx(auVar311,0xaa);
    register0x00001590 = auVar9;
    _local_100 = auVar9;
    auVar10 = vpermilps_avx(auVar326,0xaa);
    register0x00001310 = auVar10;
    _local_120 = auVar10;
    auVar21 = auVar313 & auVar152;
    uVar7 = *(uint *)(ray + k * 4 + 0x60);
    local_580._0_16_ = ZEXT416(uVar124);
    local_560._0_16_ = ZEXT416(uVar128);
    auVar204 = ZEXT416((uint)(auVar204._0_4_ * 4.7683716e-07));
    local_970 = auVar243._0_4_;
    fStack_96c = auVar243._4_4_;
    fStack_968 = auVar243._8_4_;
    fStack_964 = auVar243._12_4_;
    fVar213 = auVar24._0_4_;
    fVar215 = auVar24._4_4_;
    fVar217 = auVar24._8_4_;
    fVar218 = auVar24._12_4_;
    local_960 = auVar200._0_4_;
    fStack_95c = auVar200._4_4_;
    fStack_958 = auVar200._8_4_;
    fStack_954 = auVar200._12_4_;
    local_900 = auVar222._0_4_;
    fStack_8fc = auVar222._4_4_;
    fStack_8f8 = auVar222._8_4_;
    fStack_8f4 = auVar222._12_4_;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0x7f,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar21 >> 0xbf,0) == '\0') &&
        (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f]) {
      auVar316 = ZEXT3264(auVar145);
      auVar357 = ZEXT3264(_local_780);
    }
    else {
      local_440 = vandps_avx(auVar152,auVar313);
      fVar325 = auVar202._0_4_;
      fVar369 = auVar202._4_4_;
      fVar332 = auVar202._8_4_;
      fVar333 = auVar202._12_4_;
      fVar358 = auVar8._0_4_;
      fVar366 = auVar8._4_4_;
      fVar367 = auVar8._8_4_;
      fVar368 = auVar8._12_4_;
      fVar370 = auVar9._0_4_;
      fVar373 = auVar9._4_4_;
      fVar374 = auVar9._8_4_;
      fVar375 = auVar9._12_4_;
      fVar240 = auVar10._0_4_;
      fVar251 = auVar10._4_4_;
      fVar253 = auVar10._8_4_;
      fVar255 = auVar10._12_4_;
      fVar257 = auVar313._28_4_ + *(float *)(bezier_basis1 + lVar127 + 0x924) + 0.0;
      local_460._0_4_ =
           fVar325 * fVar172 + fVar358 * fVar195 + fVar370 * fVar193 + fVar240 * fVar133;
      local_460._4_4_ =
           fVar369 * fVar256 + fVar366 * fVar216 + fVar373 * fVar291 + fVar251 * fVar158;
      fStack_458 = fVar332 * fVar295 + fVar367 * fVar219 + fVar374 * fVar294 + fVar253 * fVar162;
      fStack_454 = fVar333 * fVar194 + fVar368 * fVar267 + fVar375 * fVar157 + fVar255 * fVar164;
      fStack_450 = fVar325 * fVar233 + fVar358 * fVar272 + fVar370 * fVar334 + fVar240 * fVar166;
      fStack_44c = fVar369 * fVar234 + fVar366 * fVar283 + fVar373 * fVar160 + fVar251 * fVar168;
      fStack_448 = fVar332 * fVar235 + fVar367 * fVar290 + fVar374 * fVar161 + fVar253 * fVar170;
      fStack_444 = local_440._28_4_ + fVar257;
      local_6e0._0_4_ = auVar119._0_4_;
      local_6e0._4_4_ = auVar119._4_4_;
      fStack_6d8 = auVar119._8_4_;
      fStack_6d4 = auVar119._12_4_;
      fStack_6d0 = auVar119._16_4_;
      fStack_6cc = auVar119._20_4_;
      fStack_6c8 = auVar119._24_4_;
      local_760._0_4_ = auVar118._0_4_;
      local_760._4_4_ = auVar118._4_4_;
      fStack_758 = auVar118._8_4_;
      fStack_754 = auVar118._12_4_;
      fStack_750 = auVar118._16_4_;
      fStack_74c = auVar118._20_4_;
      fStack_748 = auVar118._24_4_;
      fVar291 = fVar325 * (float)local_6e0._0_4_ +
                fVar358 * fVar308 + fVar370 * fVar318 + fVar240 * (float)local_760._0_4_;
      fVar157 = fVar369 * (float)local_6e0._4_4_ +
                fVar366 * fVar323 + fVar373 * fVar320 + fVar251 * (float)local_760._4_4_;
      fVar160 = fVar332 * fStack_6d8 + fVar367 * fVar324 + fVar374 * fVar236 + fVar253 * fStack_758;
      fVar133 = fVar333 * fStack_6d4 + fVar368 * fVar238 + fVar375 * fVar307 + fVar255 * fStack_754;
      fVar162 = fVar325 * fStack_6d0 +
                fVar358 * fStack_5b0 + fVar370 * fVar322 + fVar240 * fStack_750;
      fVar166 = fVar369 * fStack_6cc +
                fVar366 * fStack_5ac + fVar373 * fVar289 + fVar251 * fStack_74c;
      fVar170 = fVar332 * fStack_6c8 +
                fVar367 * fStack_5a8 + fVar374 * fVar237 + fVar253 * fStack_748;
      fVar256 = fStack_444 + fVar257 + local_440._28_4_ + auVar313._28_4_;
      fVar195 = *(float *)(bezier_basis0 + lVar127 + 0x1210);
      fVar216 = *(float *)(bezier_basis0 + lVar127 + 0x1214);
      fVar219 = *(float *)(bezier_basis0 + lVar127 + 0x1218);
      fVar257 = *(float *)(bezier_basis0 + lVar127 + 0x121c);
      fVar265 = *(float *)(bezier_basis0 + lVar127 + 0x1220);
      fVar267 = *(float *)(bezier_basis0 + lVar127 + 0x1224);
      fVar269 = *(float *)(bezier_basis0 + lVar127 + 0x1228);
      fVar271 = *(float *)(bezier_basis0 + lVar127 + 0x1694);
      fVar272 = *(float *)(bezier_basis0 + lVar127 + 0x1698);
      fVar273 = *(float *)(bezier_basis0 + lVar127 + 0x169c);
      fVar274 = *(float *)(bezier_basis0 + lVar127 + 0x16a0);
      fVar283 = *(float *)(bezier_basis0 + lVar127 + 0x16a4);
      fVar285 = *(float *)(bezier_basis0 + lVar127 + 0x16a8);
      fVar287 = *(float *)(bezier_basis0 + lVar127 + 0x16ac);
      fVar290 = *(float *)(bezier_basis0 + lVar127 + 0x1b18);
      fVar292 = *(float *)(bezier_basis0 + lVar127 + 0x1b1c);
      fVar293 = *(float *)(bezier_basis0 + lVar127 + 0x1b20);
      fVar318 = *(float *)(bezier_basis0 + lVar127 + 0x1b24);
      fVar320 = *(float *)(bezier_basis0 + lVar127 + 0x1b28);
      fVar236 = *(float *)(bezier_basis0 + lVar127 + 0x1b2c);
      fVar307 = *(float *)(bezier_basis0 + lVar127 + 0x1b30);
      fVar322 = *(float *)(bezier_basis0 + lVar127 + 0x1f9c);
      fVar289 = *(float *)(bezier_basis0 + lVar127 + 0x1fa0);
      fVar237 = *(float *)(bezier_basis0 + lVar127 + 0x1fa4);
      fVar308 = *(float *)(bezier_basis0 + lVar127 + 0x1fa8);
      fVar323 = *(float *)(bezier_basis0 + lVar127 + 0x1fac);
      fVar324 = *(float *)(bezier_basis0 + lVar127 + 0x1fb0);
      fVar238 = *(float *)(bezier_basis0 + lVar127 + 0x1fb4);
      local_820._0_16_ = auVar204;
      fVar294 = fVar333 + auVar231._28_4_;
      fVar193 = *(float *)(bezier_basis0 + lVar127 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar127 + 0x1fb8);
      fVar334 = *(float *)(bezier_basis0 + lVar127 + 0x16b0) + fVar193;
      local_5c0 = fVar258 * fVar195 + fVar336 * fVar271 + fVar335 * fVar290 + fVar239 * fVar322;
      fStack_5bc = fVar266 * fVar216 + fVar343 * fVar272 + fVar342 * fVar292 + fVar250 * fVar289;
      fStack_5b8 = fVar268 * fVar219 + fVar345 * fVar273 + fVar344 * fVar293 + fVar252 * fVar237;
      fStack_5b4 = fVar270 * fVar257 + fVar347 * fVar274 + fVar346 * fVar318 + fVar254 * fVar308;
      fStack_5b0 = fVar258 * fVar265 + fVar336 * fVar283 + fVar335 * fVar320 + fVar239 * fVar323;
      fStack_5ac = fVar266 * fVar267 + fVar343 * fVar285 + fVar342 * fVar236 + fVar250 * fVar324;
      fStack_5a8 = fVar268 * fVar269 + fVar345 * fVar287 + fVar344 * fVar307 + fVar252 * fVar238;
      fStack_5a4 = *(float *)(bezier_basis0 + lVar127 + 0x16b0) +
                   *(float *)(bezier_basis0 + lVar127 + 0x1fb8) + fVar294;
      auVar182._0_4_ = fVar196 * fVar195 + fVar275 * fVar290 + fVar376 * fVar322 + fVar310 * fVar271
      ;
      auVar182._4_4_ = fVar214 * fVar216 + fVar284 * fVar292 + fVar379 * fVar289 + fVar317 * fVar272
      ;
      auVar182._8_4_ = fVar309 * fVar219 + fVar286 * fVar293 + fVar380 * fVar237 + fVar319 * fVar273
      ;
      auVar182._12_4_ =
           fVar296 * fVar257 + fVar288 * fVar318 + fVar381 * fVar308 + fVar321 * fVar274;
      auVar182._16_4_ =
           fVar196 * fVar265 + fVar275 * fVar320 + fVar376 * fVar323 + fVar310 * fVar283;
      auVar182._20_4_ =
           fVar214 * fVar267 + fVar284 * fVar236 + fVar379 * fVar324 + fVar317 * fVar285;
      auVar182._24_4_ =
           fVar309 * fVar269 + fVar286 * fVar307 + fVar380 * fVar238 + fVar319 * fVar287;
      auVar182._28_4_ = fVar193 + fVar333 + 0.0 + fVar294;
      local_6e0._4_4_ =
           fVar366 * fVar272 + fVar373 * fVar292 + fVar251 * fVar289 + fVar369 * fVar216;
      local_6e0._0_4_ =
           fVar358 * fVar271 + fVar370 * fVar290 + fVar240 * fVar322 + fVar325 * fVar195;
      fStack_6d8 = fVar367 * fVar273 + fVar374 * fVar293 + fVar253 * fVar237 + fVar332 * fVar219;
      fStack_6d4 = fVar368 * fVar274 + fVar375 * fVar318 + fVar255 * fVar308 + fVar333 * fVar257;
      fStack_6d0 = fVar358 * fVar283 + fVar370 * fVar320 + fVar240 * fVar323 + fVar325 * fVar265;
      fStack_6cc = fVar366 * fVar285 + fVar373 * fVar236 + fVar251 * fVar324 + fVar369 * fVar267;
      fStack_6c8 = fVar367 * fVar287 + fVar374 * fVar307 + fVar253 * fVar238 + fVar332 * fVar269;
      fStack_6c4 = fVar334 + *(float *)(bezier_basis0 + lVar127 + 0x122c);
      fVar195 = *(float *)(bezier_basis1 + lVar127 + 0x1b18);
      fVar216 = *(float *)(bezier_basis1 + lVar127 + 0x1b1c);
      fVar219 = *(float *)(bezier_basis1 + lVar127 + 0x1b20);
      fVar257 = *(float *)(bezier_basis1 + lVar127 + 0x1b24);
      fVar265 = *(float *)(bezier_basis1 + lVar127 + 0x1b28);
      fVar267 = *(float *)(bezier_basis1 + lVar127 + 0x1b2c);
      fVar269 = *(float *)(bezier_basis1 + lVar127 + 0x1b30);
      fVar271 = *(float *)(bezier_basis1 + lVar127 + 0x1f9c);
      fVar272 = *(float *)(bezier_basis1 + lVar127 + 0x1fa0);
      fVar273 = *(float *)(bezier_basis1 + lVar127 + 0x1fa4);
      fVar274 = *(float *)(bezier_basis1 + lVar127 + 0x1fa8);
      fVar283 = *(float *)(bezier_basis1 + lVar127 + 0x1fac);
      fVar285 = *(float *)(bezier_basis1 + lVar127 + 0x1fb0);
      fVar287 = *(float *)(bezier_basis1 + lVar127 + 0x1fb4);
      fVar290 = *(float *)(bezier_basis1 + lVar127 + 0x1694);
      fVar292 = *(float *)(bezier_basis1 + lVar127 + 0x1698);
      fVar293 = *(float *)(bezier_basis1 + lVar127 + 0x169c);
      fVar318 = *(float *)(bezier_basis1 + lVar127 + 0x16a0);
      fVar320 = *(float *)(bezier_basis1 + lVar127 + 0x16a4);
      fVar236 = *(float *)(bezier_basis1 + lVar127 + 0x16a8);
      fVar307 = *(float *)(bezier_basis1 + lVar127 + 0x16ac);
      fVar322 = *(float *)(bezier_basis1 + lVar127 + 0x1210);
      fVar289 = *(float *)(bezier_basis1 + lVar127 + 0x1214);
      fVar237 = *(float *)(bezier_basis1 + lVar127 + 0x1218);
      fVar308 = *(float *)(bezier_basis1 + lVar127 + 0x121c);
      fVar323 = *(float *)(bezier_basis1 + lVar127 + 0x1220);
      fVar324 = *(float *)(bezier_basis1 + lVar127 + 0x1224);
      fVar238 = *(float *)(bezier_basis1 + lVar127 + 0x1228);
      auVar304._0_4_ = fVar258 * fVar322 + fVar336 * fVar290 + fVar335 * fVar195 + fVar239 * fVar271
      ;
      auVar304._4_4_ = fVar266 * fVar289 + fVar343 * fVar292 + fVar342 * fVar216 + fVar250 * fVar272
      ;
      auVar304._8_4_ = fVar268 * fVar237 + fVar345 * fVar293 + fVar344 * fVar219 + fVar252 * fVar273
      ;
      auVar304._12_4_ =
           fVar270 * fVar308 + fVar347 * fVar318 + fVar346 * fVar257 + fVar254 * fVar274;
      auVar304._16_4_ =
           fVar258 * fVar323 + fVar336 * fVar320 + fVar335 * fVar265 + fVar239 * fVar283;
      auVar304._20_4_ =
           fVar266 * fVar324 + fVar343 * fVar236 + fVar342 * fVar267 + fVar250 * fVar285;
      auVar304._24_4_ =
           fVar268 * fVar238 + fVar345 * fVar307 + fVar344 * fVar269 + fVar252 * fVar287;
      auVar304._28_4_ = fVar288 + fVar288 + fVar334 + fVar254;
      auVar328._0_4_ = fVar196 * fVar322 + fVar310 * fVar290 + fVar275 * fVar195 + fVar376 * fVar271
      ;
      auVar328._4_4_ = fVar214 * fVar289 + fVar317 * fVar292 + fVar284 * fVar216 + fVar379 * fVar272
      ;
      auVar328._8_4_ = fVar309 * fVar237 + fVar319 * fVar293 + fVar286 * fVar219 + fVar380 * fVar273
      ;
      auVar328._12_4_ =
           fVar296 * fVar308 + fVar321 * fVar318 + fVar288 * fVar257 + fVar381 * fVar274;
      auVar328._16_4_ =
           fVar196 * fVar323 + fVar310 * fVar320 + fVar275 * fVar265 + fVar376 * fVar283;
      auVar328._20_4_ =
           fVar214 * fVar324 + fVar317 * fVar236 + fVar284 * fVar267 + fVar379 * fVar285;
      auVar328._24_4_ =
           fVar309 * fVar238 + fVar319 * fVar307 + fVar286 * fVar269 + fVar380 * fVar287;
      auVar328._28_4_ = fVar288 + fVar288 + fVar288 + fVar334;
      auVar209._0_4_ = fVar325 * fVar322 + fVar358 * fVar290 + fVar370 * fVar195 + fVar240 * fVar271
      ;
      auVar209._4_4_ = fVar369 * fVar289 + fVar366 * fVar292 + fVar373 * fVar216 + fVar251 * fVar272
      ;
      auVar209._8_4_ = fVar332 * fVar237 + fVar367 * fVar293 + fVar374 * fVar219 + fVar253 * fVar273
      ;
      auVar209._12_4_ =
           fVar333 * fVar308 + fVar368 * fVar318 + fVar375 * fVar257 + fVar255 * fVar274;
      auVar209._16_4_ =
           fVar325 * fVar323 + fVar358 * fVar320 + fVar370 * fVar265 + fVar240 * fVar283;
      auVar209._20_4_ =
           fVar369 * fVar324 + fVar366 * fVar236 + fVar373 * fVar267 + fVar251 * fVar285;
      auVar209._24_4_ =
           fVar332 * fVar238 + fVar367 * fVar307 + fVar374 * fVar269 + fVar253 * fVar287;
      auVar209._28_4_ =
           *(float *)(bezier_basis1 + lVar127 + 0x122c) +
           *(float *)(bezier_basis1 + lVar127 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar127 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar127 + 0x1fb8);
      auVar246._8_4_ = 0x7fffffff;
      auVar246._0_8_ = 0x7fffffff7fffffff;
      auVar246._12_4_ = 0x7fffffff;
      auVar246._16_4_ = 0x7fffffff;
      auVar246._20_4_ = 0x7fffffff;
      auVar246._24_4_ = 0x7fffffff;
      auVar246._28_4_ = 0x7fffffff;
      auVar117._4_4_ = fStack_5bc;
      auVar117._0_4_ = local_5c0;
      auVar117._8_4_ = fStack_5b8;
      auVar117._12_4_ = fStack_5b4;
      auVar117._16_4_ = fStack_5b0;
      auVar117._20_4_ = fStack_5ac;
      auVar117._24_4_ = fStack_5a8;
      auVar117._28_4_ = fStack_5a4;
      auVar231 = vandps_avx(auVar117,auVar246);
      auVar152 = vandps_avx(auVar182,auVar246);
      auVar152 = vmaxps_avx(auVar231,auVar152);
      auVar231 = vandps_avx(auVar246,_local_6e0);
      auVar231 = vmaxps_avx(auVar152,auVar231);
      auVar243 = vpermilps_avx(auVar204,0);
      auVar277._16_16_ = auVar243;
      auVar277._0_16_ = auVar243;
      auVar231 = vcmpps_avx(auVar231,auVar277,1);
      auVar313 = vblendvps_avx(auVar117,auVar19,auVar231);
      auVar21 = vblendvps_avx(auVar182,auVar20,auVar231);
      auVar231 = vandps_avx(auVar304,auVar246);
      auVar152 = vandps_avx(auVar328,auVar246);
      auVar22 = vmaxps_avx(auVar231,auVar152);
      auVar231 = vandps_avx(auVar209,auVar246);
      auVar231 = vmaxps_avx(auVar22,auVar231);
      auVar22 = vcmpps_avx(auVar231,auVar277,1);
      auVar231 = vblendvps_avx(auVar304,auVar19,auVar22);
      auVar19 = vblendvps_avx(auVar328,auVar20,auVar22);
      fVar294 = auVar313._0_4_;
      fVar334 = auVar313._4_4_;
      fVar161 = auVar313._8_4_;
      fVar158 = auVar313._12_4_;
      fVar164 = auVar313._16_4_;
      fVar168 = auVar313._20_4_;
      fVar172 = auVar313._24_4_;
      fVar295 = auVar231._0_4_;
      fVar194 = auVar231._4_4_;
      fVar233 = auVar231._8_4_;
      fVar234 = auVar231._12_4_;
      fVar235 = auVar231._16_4_;
      fVar196 = auVar231._20_4_;
      fVar214 = auVar231._24_4_;
      fVar309 = -auVar231._28_4_;
      fVar195 = auVar21._0_4_;
      fVar265 = auVar21._4_4_;
      fVar272 = auVar21._8_4_;
      fVar285 = auVar21._12_4_;
      fVar293 = auVar21._16_4_;
      fVar307 = auVar21._20_4_;
      fVar308 = auVar21._24_4_;
      auVar141._0_4_ = fVar195 * fVar195 + fVar294 * fVar294;
      auVar141._4_4_ = fVar265 * fVar265 + fVar334 * fVar334;
      auVar141._8_4_ = fVar272 * fVar272 + fVar161 * fVar161;
      auVar141._12_4_ = fVar285 * fVar285 + fVar158 * fVar158;
      auVar141._16_4_ = fVar293 * fVar293 + fVar164 * fVar164;
      auVar141._20_4_ = fVar307 * fVar307 + fVar168 * fVar168;
      auVar141._24_4_ = fVar308 * fVar308 + fVar172 * fVar172;
      auVar141._28_4_ = auVar328._28_4_ + auVar313._28_4_;
      auVar313 = vrsqrtps_avx(auVar141);
      fVar216 = auVar313._0_4_;
      fVar219 = auVar313._4_4_;
      auVar31._4_4_ = fVar219 * 1.5;
      auVar31._0_4_ = fVar216 * 1.5;
      fVar257 = auVar313._8_4_;
      auVar31._8_4_ = fVar257 * 1.5;
      fVar267 = auVar313._12_4_;
      auVar31._12_4_ = fVar267 * 1.5;
      fVar269 = auVar313._16_4_;
      auVar31._16_4_ = fVar269 * 1.5;
      fVar271 = auVar313._20_4_;
      auVar31._20_4_ = fVar271 * 1.5;
      fVar273 = auVar313._24_4_;
      fVar193 = auVar152._28_4_;
      auVar31._24_4_ = fVar273 * 1.5;
      auVar31._28_4_ = fVar193;
      auVar32._4_4_ = fVar219 * fVar219 * fVar219 * auVar141._4_4_ * 0.5;
      auVar32._0_4_ = fVar216 * fVar216 * fVar216 * auVar141._0_4_ * 0.5;
      auVar32._8_4_ = fVar257 * fVar257 * fVar257 * auVar141._8_4_ * 0.5;
      auVar32._12_4_ = fVar267 * fVar267 * fVar267 * auVar141._12_4_ * 0.5;
      auVar32._16_4_ = fVar269 * fVar269 * fVar269 * auVar141._16_4_ * 0.5;
      auVar32._20_4_ = fVar271 * fVar271 * fVar271 * auVar141._20_4_ * 0.5;
      auVar32._24_4_ = fVar273 * fVar273 * fVar273 * auVar141._24_4_ * 0.5;
      auVar32._28_4_ = auVar141._28_4_;
      auVar152 = vsubps_avx(auVar31,auVar32);
      fVar216 = auVar152._0_4_;
      fVar267 = auVar152._4_4_;
      fVar273 = auVar152._8_4_;
      fVar287 = auVar152._12_4_;
      fVar318 = auVar152._16_4_;
      fVar322 = auVar152._20_4_;
      fVar323 = auVar152._24_4_;
      fVar219 = auVar19._0_4_;
      fVar269 = auVar19._4_4_;
      fVar274 = auVar19._8_4_;
      fVar290 = auVar19._12_4_;
      fVar320 = auVar19._16_4_;
      fVar289 = auVar19._20_4_;
      fVar324 = auVar19._24_4_;
      auVar142._0_4_ = fVar219 * fVar219 + fVar295 * fVar295;
      auVar142._4_4_ = fVar269 * fVar269 + fVar194 * fVar194;
      auVar142._8_4_ = fVar274 * fVar274 + fVar233 * fVar233;
      auVar142._12_4_ = fVar290 * fVar290 + fVar234 * fVar234;
      auVar142._16_4_ = fVar320 * fVar320 + fVar235 * fVar235;
      auVar142._20_4_ = fVar289 * fVar289 + fVar196 * fVar196;
      auVar142._24_4_ = fVar324 * fVar324 + fVar214 * fVar214;
      auVar142._28_4_ = auVar231._28_4_ + auVar152._28_4_;
      auVar231 = vrsqrtps_avx(auVar142);
      fVar257 = auVar231._0_4_;
      fVar271 = auVar231._4_4_;
      auVar33._4_4_ = fVar271 * 1.5;
      auVar33._0_4_ = fVar257 * 1.5;
      fVar283 = auVar231._8_4_;
      auVar33._8_4_ = fVar283 * 1.5;
      fVar292 = auVar231._12_4_;
      auVar33._12_4_ = fVar292 * 1.5;
      fVar236 = auVar231._16_4_;
      auVar33._16_4_ = fVar236 * 1.5;
      fVar237 = auVar231._20_4_;
      auVar33._20_4_ = fVar237 * 1.5;
      fVar238 = auVar231._24_4_;
      auVar33._24_4_ = fVar238 * 1.5;
      auVar33._28_4_ = fVar193;
      auVar34._4_4_ = fVar271 * fVar271 * fVar271 * auVar142._4_4_ * 0.5;
      auVar34._0_4_ = fVar257 * fVar257 * fVar257 * auVar142._0_4_ * 0.5;
      auVar34._8_4_ = fVar283 * fVar283 * fVar283 * auVar142._8_4_ * 0.5;
      auVar34._12_4_ = fVar292 * fVar292 * fVar292 * auVar142._12_4_ * 0.5;
      auVar34._16_4_ = fVar236 * fVar236 * fVar236 * auVar142._16_4_ * 0.5;
      auVar34._20_4_ = fVar237 * fVar237 * fVar237 * auVar142._20_4_ * 0.5;
      auVar34._24_4_ = fVar238 * fVar238 * fVar238 * auVar142._24_4_ * 0.5;
      auVar34._28_4_ = auVar142._28_4_;
      auVar231 = vsubps_avx(auVar33,auVar34);
      fVar257 = auVar231._0_4_;
      fVar271 = auVar231._4_4_;
      fVar283 = auVar231._8_4_;
      fVar292 = auVar231._12_4_;
      fVar236 = auVar231._16_4_;
      fVar237 = auVar231._20_4_;
      fVar238 = auVar231._24_4_;
      fVar195 = fVar132 * fVar195 * fVar216;
      fVar265 = fVar156 * fVar265 * fVar267;
      auVar35._4_4_ = fVar265;
      auVar35._0_4_ = fVar195;
      fVar272 = fVar159 * fVar272 * fVar273;
      auVar35._8_4_ = fVar272;
      fVar285 = fVar163 * fVar285 * fVar287;
      auVar35._12_4_ = fVar285;
      fVar293 = fVar165 * fVar293 * fVar318;
      auVar35._16_4_ = fVar293;
      fVar307 = fVar167 * fVar307 * fVar322;
      auVar35._20_4_ = fVar307;
      fVar308 = fVar169 * fVar308 * fVar323;
      auVar35._24_4_ = fVar308;
      auVar35._28_4_ = fVar309;
      local_760._4_4_ = auVar350._4_4_ + fVar265;
      local_760._0_4_ = auVar350._0_4_ + fVar195;
      fStack_758 = auVar350._8_4_ + fVar272;
      fStack_754 = auVar350._12_4_ + fVar285;
      fStack_750 = auVar350._16_4_ + fVar293;
      fStack_74c = auVar350._20_4_ + fVar307;
      fStack_748 = auVar350._24_4_ + fVar308;
      fStack_744 = auVar350._28_4_ + fVar309;
      fVar195 = fVar132 * fVar216 * -fVar294;
      fVar265 = fVar156 * fVar267 * -fVar334;
      auVar36._4_4_ = fVar265;
      auVar36._0_4_ = fVar195;
      fVar272 = fVar159 * fVar273 * -fVar161;
      auVar36._8_4_ = fVar272;
      fVar285 = fVar163 * fVar287 * -fVar158;
      auVar36._12_4_ = fVar285;
      fVar293 = fVar165 * fVar318 * -fVar164;
      auVar36._16_4_ = fVar293;
      fVar307 = fVar167 * fVar322 * -fVar168;
      auVar36._20_4_ = fVar307;
      fVar308 = fVar169 * fVar323 * -fVar172;
      auVar36._24_4_ = fVar308;
      auVar36._28_4_ = fVar193;
      local_6c0._4_4_ = fVar265 + auVar352._4_4_;
      local_6c0._0_4_ = fVar195 + auVar352._0_4_;
      fStack_6b8 = fVar272 + auVar352._8_4_;
      fStack_6b4 = fVar285 + auVar352._12_4_;
      fStack_6b0 = fVar293 + auVar352._16_4_;
      fStack_6ac = fVar307 + auVar352._20_4_;
      fStack_6a8 = fVar308 + auVar352._24_4_;
      fStack_6a4 = fVar193 + 0.0;
      fVar195 = fVar132 * fVar216 * 0.0;
      fVar216 = fVar156 * fVar267 * 0.0;
      auVar37._4_4_ = fVar216;
      auVar37._0_4_ = fVar195;
      fVar265 = fVar159 * fVar273 * 0.0;
      auVar37._8_4_ = fVar265;
      fVar267 = fVar163 * fVar287 * 0.0;
      auVar37._12_4_ = fVar267;
      fVar272 = fVar165 * fVar318 * 0.0;
      auVar37._16_4_ = fVar272;
      fVar273 = fVar167 * fVar322 * 0.0;
      auVar37._20_4_ = fVar273;
      fVar285 = fVar169 * fVar323 * 0.0;
      auVar37._24_4_ = fVar285;
      auVar37._28_4_ = fVar296;
      auVar114._4_4_ = fVar157;
      auVar114._0_4_ = fVar291;
      auVar114._8_4_ = fVar160;
      auVar114._12_4_ = fVar133;
      auVar114._16_4_ = fVar162;
      auVar114._20_4_ = fVar166;
      auVar114._24_4_ = fVar170;
      auVar114._28_4_ = fVar256;
      auVar278._0_4_ = fVar195 + fVar291;
      auVar278._4_4_ = fVar216 + fVar157;
      auVar278._8_4_ = fVar265 + fVar160;
      auVar278._12_4_ = fVar267 + fVar133;
      auVar278._16_4_ = fVar272 + fVar162;
      auVar278._20_4_ = fVar273 + fVar166;
      auVar278._24_4_ = fVar285 + fVar170;
      auVar278._28_4_ = fVar296 + fVar256;
      fVar195 = auVar312._0_4_ * fVar219 * fVar257;
      fVar216 = auVar312._4_4_ * fVar269 * fVar271;
      auVar38._4_4_ = fVar216;
      auVar38._0_4_ = fVar195;
      fVar219 = auVar312._8_4_ * fVar274 * fVar283;
      auVar38._8_4_ = fVar219;
      fVar265 = auVar312._12_4_ * fVar290 * fVar292;
      auVar38._12_4_ = fVar265;
      fVar267 = auVar312._16_4_ * fVar320 * fVar236;
      auVar38._16_4_ = fVar267;
      fVar269 = auVar312._20_4_ * fVar289 * fVar237;
      auVar38._20_4_ = fVar269;
      fVar272 = auVar312._24_4_ * fVar324 * fVar238;
      auVar38._24_4_ = fVar272;
      auVar38._28_4_ = auVar19._28_4_;
      auVar22 = vsubps_avx(auVar350,auVar35);
      auVar329._0_4_ = auVar245._0_4_ + fVar195;
      auVar329._4_4_ = auVar245._4_4_ + fVar216;
      auVar329._8_4_ = auVar245._8_4_ + fVar219;
      auVar329._12_4_ = auVar245._12_4_ + fVar265;
      auVar329._16_4_ = auVar245._16_4_ + fVar267;
      auVar329._20_4_ = auVar245._20_4_ + fVar269;
      auVar329._24_4_ = auVar245._24_4_ + fVar272;
      auVar329._28_4_ = auVar245._28_4_ + auVar19._28_4_;
      fVar195 = auVar312._0_4_ * fVar257 * -fVar295;
      fVar216 = auVar312._4_4_ * fVar271 * -fVar194;
      auVar39._4_4_ = fVar216;
      auVar39._0_4_ = fVar195;
      fVar219 = auVar312._8_4_ * fVar283 * -fVar233;
      auVar39._8_4_ = fVar219;
      fVar265 = auVar312._12_4_ * fVar292 * -fVar234;
      auVar39._12_4_ = fVar265;
      fVar267 = auVar312._16_4_ * fVar236 * -fVar235;
      auVar39._16_4_ = fVar267;
      fVar269 = auVar312._20_4_ * fVar237 * -fVar196;
      auVar39._20_4_ = fVar269;
      fVar272 = auVar312._24_4_ * fVar238 * -fVar214;
      auVar39._24_4_ = fVar272;
      auVar39._28_4_ = fVar368;
      auVar23 = vsubps_avx(auVar352,auVar36);
      auVar339._0_4_ = fVar195 + (float)local_720._0_4_;
      auVar339._4_4_ = fVar216 + (float)local_720._4_4_;
      auVar339._8_4_ = fVar219 + fStack_718;
      auVar339._12_4_ = fVar265 + fStack_714;
      auVar339._16_4_ = fVar267 + auVar226._16_4_;
      auVar339._20_4_ = fVar269 + auVar226._20_4_;
      auVar339._24_4_ = fVar272 + auVar226._24_4_;
      auVar339._28_4_ = fVar368 + auVar226._28_4_;
      fVar195 = auVar312._0_4_ * fVar257 * 0.0;
      fVar216 = auVar312._4_4_ * fVar271 * 0.0;
      auVar40._4_4_ = fVar216;
      auVar40._0_4_ = fVar195;
      fVar219 = auVar312._8_4_ * fVar283 * 0.0;
      auVar40._8_4_ = fVar219;
      fVar257 = auVar312._12_4_ * fVar292 * 0.0;
      auVar40._12_4_ = fVar257;
      fVar265 = auVar312._16_4_ * fVar236 * 0.0;
      auVar40._16_4_ = fVar265;
      fVar267 = auVar312._20_4_ * fVar237 * 0.0;
      auVar40._20_4_ = fVar267;
      fVar269 = auVar312._24_4_ * fVar238 * 0.0;
      auVar40._24_4_ = fVar269;
      auVar40._28_4_ = 0x3f000000;
      auVar25 = vsubps_avx(auVar114,auVar37);
      auVar372._0_4_ = fVar195 + (float)local_460._0_4_;
      auVar372._4_4_ = fVar216 + (float)local_460._4_4_;
      auVar372._8_4_ = fVar219 + fStack_458;
      auVar372._12_4_ = fVar257 + fStack_454;
      auVar372._16_4_ = fVar265 + fStack_450;
      auVar372._20_4_ = fVar267 + fStack_44c;
      auVar372._24_4_ = fVar269 + fStack_448;
      auVar372._28_4_ = fStack_444 + 0.5;
      auVar231 = vsubps_avx(auVar245,auVar38);
      auVar152 = vsubps_avx(auVar226,auVar39);
      auVar138 = vsubps_avx(_local_460,auVar40);
      auVar313 = vsubps_avx(auVar339,auVar23);
      auVar19 = vsubps_avx(auVar372,auVar25);
      auVar41._4_4_ = auVar25._4_4_ * auVar313._4_4_;
      auVar41._0_4_ = auVar25._0_4_ * auVar313._0_4_;
      auVar41._8_4_ = auVar25._8_4_ * auVar313._8_4_;
      auVar41._12_4_ = auVar25._12_4_ * auVar313._12_4_;
      auVar41._16_4_ = auVar25._16_4_ * auVar313._16_4_;
      auVar41._20_4_ = auVar25._20_4_ * auVar313._20_4_;
      auVar41._24_4_ = auVar25._24_4_ * auVar313._24_4_;
      auVar41._28_4_ = fVar347;
      auVar42._4_4_ = auVar23._4_4_ * auVar19._4_4_;
      auVar42._0_4_ = auVar23._0_4_ * auVar19._0_4_;
      auVar42._8_4_ = auVar23._8_4_ * auVar19._8_4_;
      auVar42._12_4_ = auVar23._12_4_ * auVar19._12_4_;
      auVar42._16_4_ = auVar23._16_4_ * auVar19._16_4_;
      auVar42._20_4_ = auVar23._20_4_ * auVar19._20_4_;
      auVar42._24_4_ = auVar23._24_4_ * auVar19._24_4_;
      auVar42._28_4_ = auVar226._28_4_;
      auVar20 = vsubps_avx(auVar42,auVar41);
      auVar43._4_4_ = auVar22._4_4_ * auVar19._4_4_;
      auVar43._0_4_ = auVar22._0_4_ * auVar19._0_4_;
      auVar43._8_4_ = auVar22._8_4_ * auVar19._8_4_;
      auVar43._12_4_ = auVar22._12_4_ * auVar19._12_4_;
      auVar43._16_4_ = auVar22._16_4_ * auVar19._16_4_;
      auVar43._20_4_ = auVar22._20_4_ * auVar19._20_4_;
      auVar43._24_4_ = auVar22._24_4_ * auVar19._24_4_;
      auVar43._28_4_ = auVar19._28_4_;
      auVar21 = vsubps_avx(auVar329,auVar22);
      auVar44._4_4_ = auVar25._4_4_ * auVar21._4_4_;
      auVar44._0_4_ = auVar25._0_4_ * auVar21._0_4_;
      auVar44._8_4_ = auVar25._8_4_ * auVar21._8_4_;
      auVar44._12_4_ = auVar25._12_4_ * auVar21._12_4_;
      auVar44._16_4_ = auVar25._16_4_ * auVar21._16_4_;
      auVar44._20_4_ = auVar25._20_4_ * auVar21._20_4_;
      auVar44._24_4_ = auVar25._24_4_ * auVar21._24_4_;
      auVar44._28_4_ = auVar245._28_4_;
      auVar26 = vsubps_avx(auVar44,auVar43);
      auVar45._4_4_ = auVar21._4_4_ * auVar23._4_4_;
      auVar45._0_4_ = auVar21._0_4_ * auVar23._0_4_;
      auVar45._8_4_ = auVar21._8_4_ * auVar23._8_4_;
      auVar45._12_4_ = auVar21._12_4_ * auVar23._12_4_;
      auVar45._16_4_ = auVar21._16_4_ * auVar23._16_4_;
      auVar45._20_4_ = auVar21._20_4_ * auVar23._20_4_;
      auVar45._24_4_ = auVar21._24_4_ * auVar23._24_4_;
      auVar45._28_4_ = auVar19._28_4_;
      auVar46._4_4_ = auVar22._4_4_ * auVar313._4_4_;
      auVar46._0_4_ = auVar22._0_4_ * auVar313._0_4_;
      auVar46._8_4_ = auVar22._8_4_ * auVar313._8_4_;
      auVar46._12_4_ = auVar22._12_4_ * auVar313._12_4_;
      auVar46._16_4_ = auVar22._16_4_ * auVar313._16_4_;
      auVar46._20_4_ = auVar22._20_4_ * auVar313._20_4_;
      auVar46._24_4_ = auVar22._24_4_ * auVar313._24_4_;
      auVar46._28_4_ = auVar313._28_4_;
      auVar313 = vsubps_avx(auVar46,auVar45);
      auVar143._0_4_ = auVar20._0_4_ * 0.0 + auVar313._0_4_ + auVar26._0_4_ * 0.0;
      auVar143._4_4_ = auVar20._4_4_ * 0.0 + auVar313._4_4_ + auVar26._4_4_ * 0.0;
      auVar143._8_4_ = auVar20._8_4_ * 0.0 + auVar313._8_4_ + auVar26._8_4_ * 0.0;
      auVar143._12_4_ = auVar20._12_4_ * 0.0 + auVar313._12_4_ + auVar26._12_4_ * 0.0;
      auVar143._16_4_ = auVar20._16_4_ * 0.0 + auVar313._16_4_ + auVar26._16_4_ * 0.0;
      auVar143._20_4_ = auVar20._20_4_ * 0.0 + auVar313._20_4_ + auVar26._20_4_ * 0.0;
      auVar143._24_4_ = auVar20._24_4_ * 0.0 + auVar313._24_4_ + auVar26._24_4_ * 0.0;
      auVar143._28_4_ = auVar313._28_4_ + auVar313._28_4_ + auVar26._28_4_;
      auVar26 = vcmpps_avx(auVar143,ZEXT432(0) << 0x20,2);
      auVar231 = vblendvps_avx(auVar231,_local_760,auVar26);
      auVar152 = vblendvps_avx(auVar152,_local_6c0,auVar26);
      auVar313 = vblendvps_avx(auVar138,auVar278,auVar26);
      auVar282 = ZEXT3264(auVar313);
      auVar19 = vblendvps_avx(auVar22,auVar329,auVar26);
      auVar20 = vblendvps_avx(auVar23,auVar339,auVar26);
      auVar21 = vblendvps_avx(auVar25,auVar372,auVar26);
      auVar22 = vblendvps_avx(auVar329,auVar22,auVar26);
      auVar23 = vblendvps_avx(auVar339,auVar23,auVar26);
      auVar243 = vpackssdw_avx(local_440._0_16_,local_440._16_16_);
      auVar25 = vblendvps_avx(auVar372,auVar25,auVar26);
      auVar22 = vsubps_avx(auVar22,auVar231);
      auVar139 = vsubps_avx(auVar23,auVar152);
      auVar25 = vsubps_avx(auVar25,auVar313);
      auVar140 = vsubps_avx(auVar152,auVar20);
      fVar195 = auVar139._0_4_;
      fVar133 = auVar313._0_4_;
      fVar267 = auVar139._4_4_;
      fVar158 = auVar313._4_4_;
      auVar47._4_4_ = fVar158 * fVar267;
      auVar47._0_4_ = fVar133 * fVar195;
      fVar274 = auVar139._8_4_;
      fVar162 = auVar313._8_4_;
      auVar47._8_4_ = fVar162 * fVar274;
      fVar292 = auVar139._12_4_;
      fVar164 = auVar313._12_4_;
      auVar47._12_4_ = fVar164 * fVar292;
      fVar307 = auVar139._16_4_;
      fVar166 = auVar313._16_4_;
      auVar47._16_4_ = fVar166 * fVar307;
      fVar323 = auVar139._20_4_;
      fVar168 = auVar313._20_4_;
      auVar47._20_4_ = fVar168 * fVar323;
      fVar294 = auVar139._24_4_;
      fVar170 = auVar313._24_4_;
      auVar47._24_4_ = fVar170 * fVar294;
      auVar47._28_4_ = auVar23._28_4_;
      fVar216 = auVar152._0_4_;
      fVar196 = auVar25._0_4_;
      fVar269 = auVar152._4_4_;
      fVar214 = auVar25._4_4_;
      auVar48._4_4_ = fVar214 * fVar269;
      auVar48._0_4_ = fVar196 * fVar216;
      fVar283 = auVar152._8_4_;
      fVar309 = auVar25._8_4_;
      auVar48._8_4_ = fVar309 * fVar283;
      fVar293 = auVar152._12_4_;
      fVar296 = auVar25._12_4_;
      auVar48._12_4_ = fVar296 * fVar293;
      fVar322 = auVar152._16_4_;
      fVar239 = auVar25._16_4_;
      auVar48._16_4_ = fVar239 * fVar322;
      fVar324 = auVar152._20_4_;
      fVar250 = auVar25._20_4_;
      auVar48._20_4_ = fVar250 * fVar324;
      fVar157 = auVar152._24_4_;
      fVar252 = auVar25._24_4_;
      uVar6 = auVar138._28_4_;
      auVar48._24_4_ = fVar252 * fVar157;
      auVar48._28_4_ = uVar6;
      auVar152 = vsubps_avx(auVar48,auVar47);
      fVar219 = auVar231._0_4_;
      fVar271 = auVar231._4_4_;
      auVar49._4_4_ = fVar214 * fVar271;
      auVar49._0_4_ = fVar196 * fVar219;
      fVar285 = auVar231._8_4_;
      auVar49._8_4_ = fVar309 * fVar285;
      fVar318 = auVar231._12_4_;
      auVar49._12_4_ = fVar296 * fVar318;
      fVar289 = auVar231._16_4_;
      auVar49._16_4_ = fVar239 * fVar289;
      fVar238 = auVar231._20_4_;
      auVar49._20_4_ = fVar250 * fVar238;
      fVar334 = auVar231._24_4_;
      auVar49._24_4_ = fVar252 * fVar334;
      auVar49._28_4_ = uVar6;
      fVar257 = auVar22._0_4_;
      fVar272 = auVar22._4_4_;
      auVar50._4_4_ = fVar158 * fVar272;
      auVar50._0_4_ = fVar133 * fVar257;
      fVar287 = auVar22._8_4_;
      auVar50._8_4_ = fVar162 * fVar287;
      fVar320 = auVar22._12_4_;
      auVar50._12_4_ = fVar164 * fVar320;
      fVar237 = auVar22._16_4_;
      auVar50._16_4_ = fVar166 * fVar237;
      fVar193 = auVar22._20_4_;
      auVar50._20_4_ = fVar168 * fVar193;
      fVar160 = auVar22._24_4_;
      auVar50._24_4_ = fVar170 * fVar160;
      auVar50._28_4_ = auVar372._28_4_;
      auVar23 = vsubps_avx(auVar50,auVar49);
      auVar51._4_4_ = fVar269 * fVar272;
      auVar51._0_4_ = fVar216 * fVar257;
      auVar51._8_4_ = fVar283 * fVar287;
      auVar51._12_4_ = fVar293 * fVar320;
      auVar51._16_4_ = fVar322 * fVar237;
      auVar51._20_4_ = fVar324 * fVar193;
      auVar51._24_4_ = fVar157 * fVar160;
      auVar51._28_4_ = uVar6;
      auVar377._0_4_ = fVar219 * fVar195;
      auVar377._4_4_ = fVar271 * fVar267;
      auVar377._8_4_ = fVar285 * fVar274;
      auVar377._12_4_ = fVar318 * fVar292;
      auVar377._16_4_ = fVar289 * fVar307;
      auVar377._20_4_ = fVar238 * fVar323;
      auVar377._24_4_ = fVar334 * fVar294;
      auVar377._28_4_ = 0;
      auVar138 = vsubps_avx(auVar377,auVar51);
      auVar178 = vsubps_avx(auVar313,auVar21);
      fVar265 = auVar138._28_4_ + auVar23._28_4_;
      auVar183._0_4_ = auVar138._0_4_ + auVar23._0_4_ * 0.0 + auVar152._0_4_ * 0.0;
      auVar183._4_4_ = auVar138._4_4_ + auVar23._4_4_ * 0.0 + auVar152._4_4_ * 0.0;
      auVar183._8_4_ = auVar138._8_4_ + auVar23._8_4_ * 0.0 + auVar152._8_4_ * 0.0;
      auVar183._12_4_ = auVar138._12_4_ + auVar23._12_4_ * 0.0 + auVar152._12_4_ * 0.0;
      auVar183._16_4_ = auVar138._16_4_ + auVar23._16_4_ * 0.0 + auVar152._16_4_ * 0.0;
      auVar183._20_4_ = auVar138._20_4_ + auVar23._20_4_ * 0.0 + auVar152._20_4_ * 0.0;
      auVar183._24_4_ = auVar138._24_4_ + auVar23._24_4_ * 0.0 + auVar152._24_4_ * 0.0;
      auVar183._28_4_ = fVar265 + auVar152._28_4_;
      fVar172 = auVar140._0_4_;
      fVar256 = auVar140._4_4_;
      auVar52._4_4_ = fVar256 * auVar21._4_4_;
      auVar52._0_4_ = fVar172 * auVar21._0_4_;
      fVar295 = auVar140._8_4_;
      auVar52._8_4_ = fVar295 * auVar21._8_4_;
      fVar194 = auVar140._12_4_;
      auVar52._12_4_ = fVar194 * auVar21._12_4_;
      fVar233 = auVar140._16_4_;
      auVar52._16_4_ = fVar233 * auVar21._16_4_;
      fVar234 = auVar140._20_4_;
      auVar52._20_4_ = fVar234 * auVar21._20_4_;
      fVar235 = auVar140._24_4_;
      auVar52._24_4_ = fVar235 * auVar21._24_4_;
      auVar52._28_4_ = fVar265;
      fVar265 = auVar178._0_4_;
      fVar273 = auVar178._4_4_;
      auVar53._4_4_ = auVar20._4_4_ * fVar273;
      auVar53._0_4_ = auVar20._0_4_ * fVar265;
      fVar290 = auVar178._8_4_;
      auVar53._8_4_ = auVar20._8_4_ * fVar290;
      fVar236 = auVar178._12_4_;
      auVar53._12_4_ = auVar20._12_4_ * fVar236;
      fVar308 = auVar178._16_4_;
      auVar53._16_4_ = auVar20._16_4_ * fVar308;
      fVar291 = auVar178._20_4_;
      auVar53._20_4_ = auVar20._20_4_ * fVar291;
      fVar161 = auVar178._24_4_;
      auVar53._24_4_ = auVar20._24_4_ * fVar161;
      auVar53._28_4_ = auVar138._28_4_;
      auVar23 = vsubps_avx(auVar53,auVar52);
      auVar231 = vsubps_avx(auVar231,auVar19);
      fVar254 = auVar231._0_4_;
      fVar258 = auVar231._4_4_;
      auVar54._4_4_ = fVar258 * auVar21._4_4_;
      auVar54._0_4_ = fVar254 * auVar21._0_4_;
      fVar266 = auVar231._8_4_;
      auVar54._8_4_ = fVar266 * auVar21._8_4_;
      fVar268 = auVar231._12_4_;
      auVar54._12_4_ = fVar268 * auVar21._12_4_;
      fVar270 = auVar231._16_4_;
      auVar54._16_4_ = fVar270 * auVar21._16_4_;
      fVar275 = auVar231._20_4_;
      auVar54._20_4_ = fVar275 * auVar21._20_4_;
      fVar284 = auVar231._24_4_;
      auVar54._24_4_ = fVar284 * auVar21._24_4_;
      auVar54._28_4_ = auVar21._28_4_;
      auVar55._4_4_ = auVar19._4_4_ * fVar273;
      auVar55._0_4_ = auVar19._0_4_ * fVar265;
      auVar55._8_4_ = auVar19._8_4_ * fVar290;
      auVar55._12_4_ = auVar19._12_4_ * fVar236;
      auVar55._16_4_ = auVar19._16_4_ * fVar308;
      auVar55._20_4_ = auVar19._20_4_ * fVar291;
      auVar55._24_4_ = auVar19._24_4_ * fVar161;
      auVar55._28_4_ = auVar152._28_4_;
      auVar231 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = auVar20._4_4_ * fVar258;
      auVar56._0_4_ = auVar20._0_4_ * fVar254;
      auVar56._8_4_ = auVar20._8_4_ * fVar266;
      auVar56._12_4_ = auVar20._12_4_ * fVar268;
      auVar56._16_4_ = auVar20._16_4_ * fVar270;
      auVar56._20_4_ = auVar20._20_4_ * fVar275;
      auVar56._24_4_ = auVar20._24_4_ * fVar284;
      auVar56._28_4_ = auVar21._28_4_;
      auVar57._4_4_ = auVar19._4_4_ * fVar256;
      auVar57._0_4_ = auVar19._0_4_ * fVar172;
      auVar57._8_4_ = auVar19._8_4_ * fVar295;
      auVar57._12_4_ = auVar19._12_4_ * fVar194;
      auVar57._16_4_ = auVar19._16_4_ * fVar233;
      auVar57._20_4_ = auVar19._20_4_ * fVar234;
      auVar57._24_4_ = auVar19._24_4_ * fVar235;
      auVar57._28_4_ = auVar19._28_4_;
      auVar152 = vsubps_avx(auVar57,auVar56);
      auVar247._0_4_ = auVar23._0_4_ * 0.0 + auVar152._0_4_ + auVar231._0_4_ * 0.0;
      auVar247._4_4_ = auVar23._4_4_ * 0.0 + auVar152._4_4_ + auVar231._4_4_ * 0.0;
      auVar247._8_4_ = auVar23._8_4_ * 0.0 + auVar152._8_4_ + auVar231._8_4_ * 0.0;
      auVar247._12_4_ = auVar23._12_4_ * 0.0 + auVar152._12_4_ + auVar231._12_4_ * 0.0;
      auVar247._16_4_ = auVar23._16_4_ * 0.0 + auVar152._16_4_ + auVar231._16_4_ * 0.0;
      auVar247._20_4_ = auVar23._20_4_ * 0.0 + auVar152._20_4_ + auVar231._20_4_ * 0.0;
      auVar247._24_4_ = auVar23._24_4_ * 0.0 + auVar152._24_4_ + auVar231._24_4_ * 0.0;
      auVar247._28_4_ = auVar152._28_4_ + auVar152._28_4_ + auVar231._28_4_;
      auVar231 = vmaxps_avx(auVar183,auVar247);
      auVar231 = vcmpps_avx(auVar231,ZEXT832(0) << 0x20,2);
      auVar200 = vpackssdw_avx(auVar231._0_16_,auVar231._16_16_);
      auVar243 = vpand_avx(auVar200,auVar243);
      auVar200 = vpmovsxwd_avx(auVar243);
      auVar222 = vpunpckhwd_avx(auVar243,auVar243);
      auVar228._16_16_ = auVar222;
      auVar228._0_16_ = auVar200;
      if ((((((((auVar228 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar228 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar228 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar228 >> 0x7f,0) == '\0') &&
            (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar222 >> 0x3f,0) == '\0') &&
          (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar222[0xf]
         ) {
LAB_00a4a366:
        auVar316 = ZEXT3264(auVar145);
        auVar232 = ZEXT3264(auVar228);
        auVar192 = ZEXT3264(CONCAT824(uStack_628,
                                      CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
        auVar361._4_4_ = fVar156;
        auVar361._0_4_ = fVar132;
        auVar361._8_4_ = fVar159;
        auVar361._12_4_ = fVar163;
        auVar361._16_4_ = fVar165;
        auVar361._20_4_ = fVar167;
        auVar361._24_4_ = fVar169;
        auVar361._28_4_ = fVar171;
      }
      else {
        auVar58._4_4_ = fVar273 * fVar267;
        auVar58._0_4_ = fVar265 * fVar195;
        auVar58._8_4_ = fVar290 * fVar274;
        auVar58._12_4_ = fVar236 * fVar292;
        auVar58._16_4_ = fVar308 * fVar307;
        auVar58._20_4_ = fVar291 * fVar323;
        auVar58._24_4_ = fVar161 * fVar294;
        auVar58._28_4_ = auVar222._12_4_;
        auVar353._0_4_ = fVar172 * fVar196;
        auVar353._4_4_ = fVar256 * fVar214;
        auVar353._8_4_ = fVar295 * fVar309;
        auVar353._12_4_ = fVar194 * fVar296;
        auVar353._16_4_ = fVar233 * fVar239;
        auVar353._20_4_ = fVar234 * fVar250;
        auVar353._24_4_ = fVar235 * fVar252;
        auVar353._28_4_ = 0;
        auVar231 = vsubps_avx(auVar353,auVar58);
        auVar59._4_4_ = fVar258 * fVar214;
        auVar59._0_4_ = fVar254 * fVar196;
        auVar59._8_4_ = fVar266 * fVar309;
        auVar59._12_4_ = fVar268 * fVar296;
        auVar59._16_4_ = fVar270 * fVar239;
        auVar59._20_4_ = fVar275 * fVar250;
        auVar59._24_4_ = fVar284 * fVar252;
        auVar59._28_4_ = auVar25._28_4_;
        auVar60._4_4_ = fVar273 * fVar272;
        auVar60._0_4_ = fVar265 * fVar257;
        auVar60._8_4_ = fVar290 * fVar287;
        auVar60._12_4_ = fVar236 * fVar320;
        auVar60._16_4_ = fVar308 * fVar237;
        auVar60._20_4_ = fVar291 * fVar193;
        auVar60._24_4_ = fVar161 * fVar160;
        auVar60._28_4_ = auVar178._28_4_;
        auVar152 = vsubps_avx(auVar60,auVar59);
        auVar61._4_4_ = fVar256 * fVar272;
        auVar61._0_4_ = fVar172 * fVar257;
        auVar61._8_4_ = fVar295 * fVar287;
        auVar61._12_4_ = fVar194 * fVar320;
        auVar61._16_4_ = fVar233 * fVar237;
        auVar61._20_4_ = fVar234 * fVar193;
        auVar61._24_4_ = fVar235 * fVar160;
        auVar61._28_4_ = auVar183._28_4_;
        auVar62._4_4_ = fVar258 * fVar267;
        auVar62._0_4_ = fVar254 * fVar195;
        auVar62._8_4_ = fVar266 * fVar274;
        auVar62._12_4_ = fVar268 * fVar292;
        auVar62._16_4_ = fVar270 * fVar307;
        auVar62._20_4_ = fVar275 * fVar323;
        auVar62._24_4_ = fVar284 * fVar294;
        auVar62._28_4_ = auVar139._28_4_;
        auVar20 = vsubps_avx(auVar62,auVar61);
        auVar305._0_4_ = auVar231._0_4_ * 0.0 + auVar20._0_4_ + auVar152._0_4_ * 0.0;
        auVar305._4_4_ = auVar231._4_4_ * 0.0 + auVar20._4_4_ + auVar152._4_4_ * 0.0;
        auVar305._8_4_ = auVar231._8_4_ * 0.0 + auVar20._8_4_ + auVar152._8_4_ * 0.0;
        auVar305._12_4_ = auVar231._12_4_ * 0.0 + auVar20._12_4_ + auVar152._12_4_ * 0.0;
        auVar305._16_4_ = auVar231._16_4_ * 0.0 + auVar20._16_4_ + auVar152._16_4_ * 0.0;
        auVar305._20_4_ = auVar231._20_4_ * 0.0 + auVar20._20_4_ + auVar152._20_4_ * 0.0;
        auVar305._24_4_ = auVar231._24_4_ * 0.0 + auVar20._24_4_ + auVar152._24_4_ * 0.0;
        auVar305._28_4_ = auVar139._28_4_ + auVar20._28_4_ + auVar183._28_4_;
        auVar19 = vrcpps_avx(auVar305);
        fVar195 = auVar19._0_4_;
        fVar257 = auVar19._4_4_;
        auVar63._4_4_ = auVar305._4_4_ * fVar257;
        auVar63._0_4_ = auVar305._0_4_ * fVar195;
        fVar265 = auVar19._8_4_;
        auVar63._8_4_ = auVar305._8_4_ * fVar265;
        fVar267 = auVar19._12_4_;
        auVar63._12_4_ = auVar305._12_4_ * fVar267;
        fVar272 = auVar19._16_4_;
        auVar63._16_4_ = auVar305._16_4_ * fVar272;
        fVar273 = auVar19._20_4_;
        auVar63._20_4_ = auVar305._20_4_ * fVar273;
        fVar274 = auVar19._24_4_;
        auVar63._24_4_ = auVar305._24_4_ * fVar274;
        auVar63._28_4_ = auVar178._28_4_;
        auVar354._8_4_ = 0x3f800000;
        auVar354._0_8_ = 0x3f8000003f800000;
        auVar354._12_4_ = 0x3f800000;
        auVar354._16_4_ = 0x3f800000;
        auVar354._20_4_ = 0x3f800000;
        auVar354._24_4_ = 0x3f800000;
        auVar354._28_4_ = 0x3f800000;
        auVar21 = vsubps_avx(auVar354,auVar63);
        fVar195 = auVar21._0_4_ * fVar195 + fVar195;
        fVar257 = auVar21._4_4_ * fVar257 + fVar257;
        fVar265 = auVar21._8_4_ * fVar265 + fVar265;
        fVar267 = auVar21._12_4_ * fVar267 + fVar267;
        fVar272 = auVar21._16_4_ * fVar272 + fVar272;
        fVar273 = auVar21._20_4_ * fVar273 + fVar273;
        fVar274 = auVar21._24_4_ * fVar274 + fVar274;
        auVar64._4_4_ =
             (auVar231._4_4_ * fVar271 + auVar152._4_4_ * fVar269 + auVar20._4_4_ * fVar158) *
             fVar257;
        auVar64._0_4_ =
             (auVar231._0_4_ * fVar219 + auVar152._0_4_ * fVar216 + auVar20._0_4_ * fVar133) *
             fVar195;
        auVar64._8_4_ =
             (auVar231._8_4_ * fVar285 + auVar152._8_4_ * fVar283 + auVar20._8_4_ * fVar162) *
             fVar265;
        auVar64._12_4_ =
             (auVar231._12_4_ * fVar318 + auVar152._12_4_ * fVar293 + auVar20._12_4_ * fVar164) *
             fVar267;
        auVar64._16_4_ =
             (auVar231._16_4_ * fVar289 + auVar152._16_4_ * fVar322 + auVar20._16_4_ * fVar166) *
             fVar272;
        auVar64._20_4_ =
             (auVar231._20_4_ * fVar238 + auVar152._20_4_ * fVar324 + auVar20._20_4_ * fVar168) *
             fVar273;
        auVar64._24_4_ =
             (auVar231._24_4_ * fVar334 + auVar152._24_4_ * fVar157 + auVar20._24_4_ * fVar170) *
             fVar274;
        auVar64._28_4_ = auVar22._28_4_ + auVar313._28_4_;
        auVar200 = vpermilps_avx(ZEXT416(uVar7),0);
        auVar144._16_16_ = auVar200;
        auVar144._0_16_ = auVar200;
        auVar231 = vcmpps_avx(auVar144,auVar64,2);
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar229._4_4_ = uVar6;
        auVar229._0_4_ = uVar6;
        auVar229._8_4_ = uVar6;
        auVar229._12_4_ = uVar6;
        auVar229._16_4_ = uVar6;
        auVar229._20_4_ = uVar6;
        auVar229._24_4_ = uVar6;
        auVar229._28_4_ = uVar6;
        auVar152 = vcmpps_avx(auVar64,auVar229,2);
        auVar231 = vandps_avx(auVar152,auVar231);
        auVar200 = vpackssdw_avx(auVar231._0_16_,auVar231._16_16_);
        auVar243 = vpand_avx(auVar243,auVar200);
        auVar200 = vpmovsxwd_avx(auVar243);
        auVar222 = vpshufd_avx(auVar243,0xee);
        auVar222 = vpmovsxwd_avx(auVar222);
        auVar282 = ZEXT1664(auVar222);
        auVar228._16_16_ = auVar222;
        auVar228._0_16_ = auVar200;
        if ((((((((auVar228 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar228 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar228 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar228 >> 0x7f,0) == '\0') &&
              (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar222 >> 0x3f,0) == '\0') &&
            (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar222[0xf]) goto LAB_00a4a366;
        auVar231 = vcmpps_avx(ZEXT832(0) << 0x20,auVar305,4);
        auVar200 = vpackssdw_avx(auVar231._0_16_,auVar231._16_16_);
        auVar243 = vpand_avx(auVar243,auVar200);
        auVar200 = vpmovsxwd_avx(auVar243);
        auVar232 = ZEXT1664(auVar200);
        auVar243 = vpunpckhwd_avx(auVar243,auVar243);
        auVar279._16_16_ = auVar243;
        auVar279._0_16_ = auVar200;
        auVar282 = ZEXT3264(auVar279);
        auVar192 = ZEXT3264(CONCAT824(uStack_628,
                                      CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
        auVar316 = ZEXT3264(auVar145);
        auVar361._4_4_ = fVar156;
        auVar361._0_4_ = fVar132;
        auVar361._8_4_ = fVar159;
        auVar361._12_4_ = fVar163;
        auVar361._16_4_ = fVar165;
        auVar361._20_4_ = fVar167;
        auVar361._24_4_ = fVar169;
        auVar361._28_4_ = fVar171;
        if ((((((((auVar279 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar279 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar279 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar279 >> 0x7f,0) != '\0') ||
              (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar243 >> 0x3f,0) != '\0') ||
            (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar243[0xf] < '\0') {
          auVar65._4_4_ = auVar183._4_4_ * fVar257;
          auVar65._0_4_ = auVar183._0_4_ * fVar195;
          auVar65._8_4_ = auVar183._8_4_ * fVar265;
          auVar65._12_4_ = auVar183._12_4_ * fVar267;
          auVar65._16_4_ = auVar183._16_4_ * fVar272;
          auVar65._20_4_ = auVar183._20_4_ * fVar273;
          auVar65._24_4_ = auVar183._24_4_ * fVar274;
          auVar65._28_4_ = SUB84(uStack_628,4);
          auVar66._4_4_ = auVar247._4_4_ * fVar257;
          auVar66._0_4_ = auVar247._0_4_ * fVar195;
          auVar66._8_4_ = auVar247._8_4_ * fVar265;
          auVar66._12_4_ = auVar247._12_4_ * fVar267;
          auVar66._16_4_ = auVar247._16_4_ * fVar272;
          auVar66._20_4_ = auVar247._20_4_ * fVar273;
          auVar66._24_4_ = auVar247._24_4_ * fVar274;
          auVar66._28_4_ = auVar21._28_4_ + auVar19._28_4_;
          auVar248._8_4_ = 0x3f800000;
          auVar248._0_8_ = 0x3f8000003f800000;
          auVar248._12_4_ = 0x3f800000;
          auVar248._16_4_ = 0x3f800000;
          auVar248._20_4_ = 0x3f800000;
          auVar248._24_4_ = 0x3f800000;
          auVar248._28_4_ = 0x3f800000;
          auVar145 = vsubps_avx(auVar248,auVar65);
          auVar232 = ZEXT3264(auVar145);
          auVar145 = vblendvps_avx(auVar145,auVar65,auVar26);
          auVar316 = ZEXT3264(auVar145);
          auVar145 = vsubps_avx(auVar248,auVar66);
          _local_4a0 = vblendvps_avx(auVar145,auVar66,auVar26);
          auVar192 = ZEXT3264(auVar279);
          local_480 = auVar64;
        }
      }
      auVar357 = ZEXT3264(_local_780);
      auVar145 = auVar192._0_32_;
      if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar145 >> 0x7f,0) != '\0') ||
            (auVar192 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
           SUB321(auVar145 >> 0xbf,0) != '\0') ||
          (auVar192 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
          auVar192[0x1f] < '\0') {
        auVar231 = vsubps_avx(auVar312,auVar361);
        fVar216 = auVar361._0_4_ + auVar316._0_4_ * auVar231._0_4_;
        fVar219 = auVar361._4_4_ + auVar316._4_4_ * auVar231._4_4_;
        fVar257 = auVar361._8_4_ + auVar316._8_4_ * auVar231._8_4_;
        fVar265 = auVar361._12_4_ + auVar316._12_4_ * auVar231._12_4_;
        fVar267 = auVar361._16_4_ + auVar316._16_4_ * auVar231._16_4_;
        fVar269 = auVar361._20_4_ + auVar316._20_4_ * auVar231._20_4_;
        fVar271 = auVar361._24_4_ + auVar316._24_4_ * auVar231._24_4_;
        fVar272 = auVar361._28_4_ + auVar231._28_4_;
        fVar195 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar67._4_4_ = (fVar219 + fVar219) * fVar195;
        auVar67._0_4_ = (fVar216 + fVar216) * fVar195;
        auVar67._8_4_ = (fVar257 + fVar257) * fVar195;
        auVar67._12_4_ = (fVar265 + fVar265) * fVar195;
        auVar67._16_4_ = (fVar267 + fVar267) * fVar195;
        auVar67._20_4_ = (fVar269 + fVar269) * fVar195;
        auVar67._24_4_ = (fVar271 + fVar271) * fVar195;
        auVar67._28_4_ = fVar272 + fVar272;
        auVar231 = vcmpps_avx(local_480,auVar67,6);
        auVar152 = auVar145 & auVar231;
        if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar152 >> 0x7f,0) != '\0') ||
              (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar152 >> 0xbf,0) != '\0') ||
            (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar152[0x1f] < '\0') {
          auVar232 = ZEXT3264(CONCAT428(0xbf800000,
                                        CONCAT424(0xbf800000,
                                                  CONCAT420(0xbf800000,
                                                            CONCAT416(0xbf800000,
                                                                      CONCAT412(0xbf800000,
                                                                                CONCAT48(0xbf800000,
                                                                                                                                                                                  
                                                  0xbf800000bf800000)))))));
          local_3a0 = (float)local_4a0._0_4_ + (float)local_4a0._0_4_ + -1.0;
          fStack_39c = (float)local_4a0._4_4_ + (float)local_4a0._4_4_ + -1.0;
          fStack_398 = (float)uStack_498 + (float)uStack_498 + -1.0;
          fStack_394 = uStack_498._4_4_ + uStack_498._4_4_ + -1.0;
          fStack_390 = (float)uStack_490 + (float)uStack_490 + -1.0;
          fStack_38c = uStack_490._4_4_ + uStack_490._4_4_ + -1.0;
          fStack_388 = (float)uStack_488 + (float)uStack_488 + -1.0;
          fStack_384 = uStack_488._4_4_ + uStack_488._4_4_ + -1.0;
          auVar313 = auVar316._0_32_;
          local_4a0._4_4_ = fStack_39c;
          local_4a0._0_4_ = local_3a0;
          uStack_498._0_4_ = fStack_398;
          uStack_498._4_4_ = fStack_394;
          uStack_490._0_4_ = fStack_390;
          uStack_490._4_4_ = fStack_38c;
          auVar123 = _local_4a0;
          uStack_488._0_4_ = fStack_388;
          uStack_488._4_4_ = fStack_384;
          auVar152 = _local_4a0;
          local_380 = local_480;
          local_360 = 0;
          fStack_34c = fStack_96c;
          fStack_348 = fStack_968;
          fStack_344 = fStack_964;
          fStack_32c = fStack_95c;
          fStack_328 = fStack_958;
          fStack_324 = fStack_954;
          local_320 = local_900;
          fStack_31c = fStack_8fc;
          fStack_318 = fStack_8f8;
          fStack_314 = fStack_8f4;
          _local_4a0 = auVar152;
          if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            local_680 = vandps_avx(auVar231,auVar145);
            auVar198._0_4_ = 1.0 / auVar221._0_4_;
            auVar198._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar243 = vshufps_avx(auVar198,auVar198,0);
            local_2e0[0] = auVar243._0_4_ * (auVar316._0_4_ + 0.0);
            local_2e0[1] = auVar243._4_4_ * (auVar316._4_4_ + 1.0);
            local_2e0[2] = auVar243._8_4_ * (auVar316._8_4_ + 2.0);
            local_2e0[3] = auVar243._12_4_ * (auVar316._12_4_ + 3.0);
            fStack_2d0 = auVar243._0_4_ * (auVar316._16_4_ + 4.0);
            fStack_2cc = auVar243._4_4_ * (auVar316._20_4_ + 5.0);
            fStack_2c8 = auVar243._8_4_ * (auVar316._24_4_ + 6.0);
            fStack_2c4 = auVar316._28_4_ + 7.0;
            uStack_490 = auVar123._16_8_;
            uStack_488 = auVar152._24_8_;
            local_2c0 = local_4a0;
            uStack_2b8 = uStack_498;
            uStack_2b0 = uStack_490;
            uStack_2a8 = uStack_488;
            local_2a0 = local_480;
            auVar184._8_4_ = 0x7f800000;
            auVar184._0_8_ = 0x7f8000007f800000;
            auVar184._12_4_ = 0x7f800000;
            auVar184._16_4_ = 0x7f800000;
            auVar184._20_4_ = 0x7f800000;
            auVar184._24_4_ = 0x7f800000;
            auVar184._28_4_ = 0x7f800000;
            auVar145 = vblendvps_avx(auVar184,local_480,local_680);
            auVar231 = vshufps_avx(auVar145,auVar145,0xb1);
            auVar231 = vminps_avx(auVar145,auVar231);
            auVar152 = vshufpd_avx(auVar231,auVar231,5);
            auVar231 = vminps_avx(auVar231,auVar152);
            auVar152 = vperm2f128_avx(auVar231,auVar231,1);
            auVar231 = vminps_avx(auVar231,auVar152);
            auVar231 = vcmpps_avx(auVar145,auVar231,0);
            auVar152 = local_680 & auVar231;
            auVar145 = local_680;
            if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar152 >> 0x7f,0) != '\0') ||
                  (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar152 >> 0xbf,0) != '\0') ||
                (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar152[0x1f] < '\0') {
              auVar145 = vandps_avx(auVar231,local_680);
            }
            auVar231 = vcmpps_avx(ZEXT1632(auVar24),ZEXT1632(auVar24),0xf);
            auVar192 = ZEXT3264(auVar231);
            uVar125 = vmovmskps_avx(auVar145);
            uVar126 = 0;
            if (uVar125 != 0) {
              for (; (uVar125 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
              }
            }
            uVar129 = (ulong)uVar126;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar195 = local_2e0[uVar129];
              uVar6 = *(undefined4 *)((long)&local_2c0 + uVar129 * 4);
              fVar219 = 1.0 - fVar195;
              fVar216 = fVar195 * fVar219 + fVar195 * fVar219;
              auVar282 = ZEXT464(0x40400000);
              auVar243 = ZEXT416((uint)(fVar195 * fVar195 * 3.0));
              auVar243 = vshufps_avx(auVar243,auVar243,0);
              auVar200 = ZEXT416((uint)((fVar216 - fVar195 * fVar195) * 3.0));
              auVar200 = vshufps_avx(auVar200,auVar200,0);
              auVar222 = ZEXT416((uint)((fVar219 * fVar219 - fVar216) * 3.0));
              auVar222 = vshufps_avx(auVar222,auVar222,0);
              auVar204 = ZEXT416((uint)(fVar219 * fVar219 * -3.0));
              auVar204 = vshufps_avx(auVar204,auVar204,0);
              auVar199._0_4_ =
                   local_970 * auVar204._0_4_ +
                   fVar213 * auVar222._0_4_ +
                   local_900 * auVar243._0_4_ + local_960 * auVar200._0_4_;
              auVar199._4_4_ =
                   fStack_96c * auVar204._4_4_ +
                   fVar215 * auVar222._4_4_ +
                   fStack_8fc * auVar243._4_4_ + fStack_95c * auVar200._4_4_;
              auVar199._8_4_ =
                   fStack_968 * auVar204._8_4_ +
                   fVar217 * auVar222._8_4_ +
                   fStack_8f8 * auVar243._8_4_ + fStack_958 * auVar200._8_4_;
              auVar199._12_4_ =
                   fStack_964 * auVar204._12_4_ +
                   fVar218 * auVar222._12_4_ +
                   fStack_8f4 * auVar243._12_4_ + fStack_954 * auVar200._12_4_;
              auVar232 = ZEXT464(*(uint *)(local_2a0 + uVar129 * 4));
              *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_2a0 + uVar129 * 4);
              *(float *)(ray + k * 4 + 0x180) = auVar199._0_4_;
              uVar16 = vextractps_avx(auVar199,1);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar16;
              uVar16 = vextractps_avx(auVar199,2);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar16;
              *(float *)(ray + k * 4 + 0x1e0) = fVar195;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar6;
              *(uint *)(ray + k * 4 + 0x220) = uVar128;
              *(uint *)(ray + k * 4 + 0x240) = uVar124;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            }
            else {
              auVar243 = vpermilps_avx(ZEXT416(uVar124),0);
              local_700._16_16_ = auVar243;
              local_700._0_16_ = auVar243;
              auVar243 = vpermilps_avx(ZEXT416(uVar128),0);
              register0x00001210 = auVar243;
              _local_800 = auVar243;
              uStack_710 = *(undefined8 *)(local_7a8 + 0x10);
              uStack_708 = *(undefined8 *)(local_7a8 + 0x18);
              _local_840 = ZEXT1632(*local_7a0);
              local_740 = (float)*(undefined8 *)*local_7a0;
              fStack_73c = (float)((ulong)*(undefined8 *)*local_7a0 >> 0x20);
              fStack_738 = (float)*(undefined8 *)(*local_7a0 + 8);
              fStack_734 = (float)((ulong)*(undefined8 *)(*local_7a0 + 8) >> 0x20);
              fStack_730 = (float)uStack_710;
              fStack_72c = (float)((ulong)uStack_710 >> 0x20);
              fStack_728 = (float)uStack_708;
              fStack_724 = (float)((ulong)uStack_708 >> 0x20);
              auVar306 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
              local_798 = context;
              local_790 = k;
              local_3c0 = auVar313;
              local_35c = uVar15;
              local_350 = local_970;
              local_340 = auVar24;
              local_330 = local_960;
              while( true ) {
                local_200 = local_2e0[uVar129];
                local_1e0 = *(undefined4 *)((long)&local_2c0 + uVar129 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar129 * 4);
                fVar216 = 1.0 - local_200;
                fVar195 = local_200 * fVar216 + local_200 * fVar216;
                auVar282 = ZEXT464(0x40400000);
                auVar243 = ZEXT416((uint)(local_200 * local_200 * 3.0));
                auVar243 = vshufps_avx(auVar243,auVar243,0);
                auVar200 = ZEXT416((uint)((fVar195 - local_200 * local_200) * 3.0));
                auVar200 = vshufps_avx(auVar200,auVar200,0);
                auVar222 = ZEXT416((uint)((fVar216 * fVar216 - fVar195) * 3.0));
                auVar222 = vshufps_avx(auVar222,auVar222,0);
                local_870.context = context->user;
                auVar204 = ZEXT416((uint)(fVar216 * fVar216 * -3.0));
                auVar204 = vshufps_avx(auVar204,auVar204,0);
                auVar205._0_4_ =
                     local_970 * auVar204._0_4_ +
                     fVar213 * auVar222._0_4_ +
                     local_900 * auVar243._0_4_ + local_960 * auVar200._0_4_;
                auVar205._4_4_ =
                     fStack_96c * auVar204._4_4_ +
                     fVar215 * auVar222._4_4_ +
                     fStack_8fc * auVar243._4_4_ + fStack_95c * auVar200._4_4_;
                auVar205._8_4_ =
                     fStack_968 * auVar204._8_4_ +
                     fVar217 * auVar222._8_4_ +
                     fStack_8f8 * auVar243._8_4_ + fStack_958 * auVar200._8_4_;
                auVar205._12_4_ =
                     fStack_964 * auVar204._12_4_ +
                     fVar218 * auVar222._12_4_ +
                     fStack_8f4 * auVar243._12_4_ + fStack_954 * auVar200._12_4_;
                auStack_250 = vshufps_avx(auVar205,auVar205,0);
                local_260[0] = (RTCHitN)auStack_250[0];
                local_260[1] = (RTCHitN)auStack_250[1];
                local_260[2] = (RTCHitN)auStack_250[2];
                local_260[3] = (RTCHitN)auStack_250[3];
                local_260[4] = (RTCHitN)auStack_250[4];
                local_260[5] = (RTCHitN)auStack_250[5];
                local_260[6] = (RTCHitN)auStack_250[6];
                local_260[7] = (RTCHitN)auStack_250[7];
                local_260[8] = (RTCHitN)auStack_250[8];
                local_260[9] = (RTCHitN)auStack_250[9];
                local_260[10] = (RTCHitN)auStack_250[10];
                local_260[0xb] = (RTCHitN)auStack_250[0xb];
                local_260[0xc] = (RTCHitN)auStack_250[0xc];
                local_260[0xd] = (RTCHitN)auStack_250[0xd];
                local_260[0xe] = (RTCHitN)auStack_250[0xe];
                local_260[0xf] = (RTCHitN)auStack_250[0xf];
                auStack_230 = vshufps_avx(auVar205,auVar205,0x55);
                local_240 = auStack_230;
                auStack_210 = vshufps_avx(auVar205,auVar205,0xaa);
                local_220 = auStack_210;
                fStack_1fc = local_200;
                fStack_1f8 = local_200;
                fStack_1f4 = local_200;
                fStack_1f0 = local_200;
                fStack_1ec = local_200;
                fStack_1e8 = local_200;
                fStack_1e4 = local_200;
                uStack_1dc = local_1e0;
                uStack_1d8 = local_1e0;
                uStack_1d4 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1cc = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_1c4 = local_1e0;
                local_1c0 = local_800;
                uStack_1b8 = uStack_7f8;
                uStack_1b0 = uStack_7f0;
                uStack_1a8 = uStack_7e8;
                local_1a0 = local_700._0_8_;
                uStack_198 = local_700._8_8_;
                uStack_190 = local_700._16_8_;
                uStack_188 = local_700._24_8_;
                local_788[1] = auVar192._0_32_;
                *local_788 = auVar192._0_32_;
                local_180 = (local_870.context)->instID[0];
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160 = (local_870.context)->instPrimID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_7e0 = CONCAT44(fStack_73c,local_740);
                uStack_7d8 = CONCAT44(fStack_734,fStack_738);
                uStack_7d0 = CONCAT44(fStack_72c,fStack_730);
                uStack_7c8 = CONCAT44(fStack_724,fStack_728);
                local_870.valid = (int *)&local_7e0;
                local_870.geometryUserPtr = pGVar17->userPtr;
                local_870.hit = local_260;
                local_870.N = 8;
                auVar177 = local_840._0_16_;
                auVar137 = _local_720;
                local_870.ray = (RTCRayN *)ray;
                if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar282 = ZEXT1664(auVar282._0_16_);
                  auVar145 = ZEXT1632(auVar192._0_16_);
                  (*pGVar17->intersectionFilterN)(&local_870);
                  auVar306 = ZEXT1664(auVar306._0_16_);
                  auVar357 = ZEXT3264(_local_780);
                  auVar316 = ZEXT3264(auVar313);
                  auVar145 = vcmpps_avx(auVar145,auVar145,0xf);
                  auVar192 = ZEXT3264(auVar145);
                  auVar177._8_8_ = uStack_7d8;
                  auVar177._0_8_ = local_7e0;
                  auVar137._8_8_ = uStack_7c8;
                  auVar137._0_8_ = uStack_7d0;
                  context = local_798;
                  k = local_790;
                }
                auVar243 = vpcmpeqd_avx(auVar177,ZEXT816(0) << 0x40);
                auVar200 = vpcmpeqd_avx(auVar137,ZEXT816(0) << 0x40);
                auVar212._16_16_ = auVar200;
                auVar212._0_16_ = auVar243;
                auVar145 = auVar192._0_32_ & ~auVar212;
                if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar145 >> 0x7f,0) == '\0') &&
                      (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar145 >> 0xbf,0) == '\0') &&
                    (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar145[0x1f]) {
                  auVar153._0_4_ = auVar243._0_4_ ^ auVar192._0_4_;
                  auVar153._4_4_ = auVar243._4_4_ ^ auVar192._4_4_;
                  auVar153._8_4_ = auVar243._8_4_ ^ auVar192._8_4_;
                  auVar153._12_4_ = auVar243._12_4_ ^ auVar192._12_4_;
                  auVar153._16_4_ = auVar200._0_4_ ^ auVar192._16_4_;
                  auVar153._20_4_ = auVar200._4_4_ ^ auVar192._20_4_;
                  auVar153._24_4_ = auVar200._8_4_ ^ auVar192._24_4_;
                  auVar153._28_4_ = auVar200._12_4_ ^ auVar192._28_4_;
                }
                else {
                  p_Var18 = context->args->filter;
                  if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar17->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar282 = ZEXT1664(auVar282._0_16_);
                    auVar145 = ZEXT1632(auVar192._0_16_);
                    (*p_Var18)(&local_870);
                    auVar306 = ZEXT1664(auVar306._0_16_);
                    auVar357 = ZEXT3264(_local_780);
                    auVar316 = ZEXT3264(auVar313);
                    auVar145 = vcmpps_avx(auVar145,auVar145,0xf);
                    auVar192 = ZEXT3264(auVar145);
                    auVar177._8_8_ = uStack_7d8;
                    auVar177._0_8_ = local_7e0;
                    auVar137._8_8_ = uStack_7c8;
                    auVar137._0_8_ = uStack_7d0;
                    context = local_798;
                    k = local_790;
                  }
                  auVar243 = vpcmpeqd_avx(auVar177,ZEXT816(0) << 0x40);
                  auVar200 = vpcmpeqd_avx(auVar137,ZEXT816(0) << 0x40);
                  auVar190._16_16_ = auVar200;
                  auVar190._0_16_ = auVar243;
                  auVar153._0_4_ = auVar243._0_4_ ^ auVar192._0_4_;
                  auVar153._4_4_ = auVar243._4_4_ ^ auVar192._4_4_;
                  auVar153._8_4_ = auVar243._8_4_ ^ auVar192._8_4_;
                  auVar153._12_4_ = auVar243._12_4_ ^ auVar192._12_4_;
                  auVar153._16_4_ = auVar200._0_4_ ^ auVar192._16_4_;
                  auVar153._20_4_ = auVar200._4_4_ ^ auVar192._20_4_;
                  auVar153._24_4_ = auVar200._8_4_ ^ auVar192._24_4_;
                  auVar153._28_4_ = auVar200._12_4_ ^ auVar192._28_4_;
                  auVar145 = auVar192._0_32_ & ~auVar190;
                  if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar145 >> 0x7f,0) != '\0') ||
                        (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar145 >> 0xbf,0) != '\0') ||
                      (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar145[0x1f] < '\0') {
                    auVar145 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])local_870.hit);
                    *(undefined1 (*) [32])(local_870.ray + 0x180) = auVar145;
                    auVar145 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])(local_870.hit + 0x20))
                    ;
                    *(undefined1 (*) [32])(local_870.ray + 0x1a0) = auVar145;
                    auVar145 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])(local_870.hit + 0x40))
                    ;
                    *(undefined1 (*) [32])(local_870.ray + 0x1c0) = auVar145;
                    auVar145 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])(local_870.hit + 0x60))
                    ;
                    *(undefined1 (*) [32])(local_870.ray + 0x1e0) = auVar145;
                    auVar145 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])(local_870.hit + 0x80))
                    ;
                    *(undefined1 (*) [32])(local_870.ray + 0x200) = auVar145;
                    auVar145 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])(local_870.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_870.ray + 0x220) = auVar145;
                    auVar145 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])(local_870.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_870.ray + 0x240) = auVar145;
                    auVar145 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])(local_870.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_870.ray + 0x260) = auVar145;
                    auVar145 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])(local_870.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_870.ray + 0x280) = auVar145;
                  }
                }
                auVar145 = local_480;
                if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar153 >> 0x7f,0) == '\0') &&
                      (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar153 >> 0xbf,0) == '\0') &&
                    (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar153[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar306._0_4_;
                }
                else {
                  auVar306 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_680 + uVar129 * 4) = 0;
                auVar243 = vshufps_avx(auVar306._0_16_,auVar306._0_16_,0);
                auVar154._16_16_ = auVar243;
                auVar154._0_16_ = auVar243;
                auVar232 = ZEXT3264(auVar145);
                auVar152 = vcmpps_avx(auVar145,auVar154,2);
                auVar231 = vandps_avx(auVar152,local_680);
                local_680 = local_680 & auVar152;
                if ((((((((local_680 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_680 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_680 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_680 >> 0x7f,0) == '\0') &&
                      (local_680 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_680 >> 0xbf,0) == '\0') &&
                    (local_680 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_680[0x1f]) break;
                auVar191._8_4_ = 0x7f800000;
                auVar191._0_8_ = 0x7f8000007f800000;
                auVar191._12_4_ = 0x7f800000;
                auVar191._16_4_ = 0x7f800000;
                auVar191._20_4_ = 0x7f800000;
                auVar191._24_4_ = 0x7f800000;
                auVar191._28_4_ = 0x7f800000;
                auVar145 = vblendvps_avx(auVar191,auVar145,auVar231);
                auVar152 = vshufps_avx(auVar145,auVar145,0xb1);
                auVar152 = vminps_avx(auVar145,auVar152);
                auVar19 = vshufpd_avx(auVar152,auVar152,5);
                auVar152 = vminps_avx(auVar152,auVar19);
                auVar19 = vperm2f128_avx(auVar152,auVar152,1);
                auVar152 = vminps_avx(auVar152,auVar19);
                auVar152 = vcmpps_avx(auVar145,auVar152,0);
                auVar19 = auVar231 & auVar152;
                auVar145 = auVar231;
                if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar19 >> 0x7f,0) != '\0') ||
                      (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0xbf,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar19[0x1f] < '\0') {
                  auVar145 = vandps_avx(auVar152,auVar231);
                }
                uVar125 = vmovmskps_avx(auVar145);
                uVar126 = 0;
                if (uVar125 != 0) {
                  for (; (uVar125 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
                  }
                }
                uVar129 = (ulong)uVar126;
                local_680 = auVar231;
              }
            }
          }
        }
      }
      auVar204 = local_820._0_16_;
    }
    auVar192 = ZEXT3264(local_620);
    auVar306 = ZEXT3264(_local_6a0);
    if (8 < (int)uVar15) {
      auVar243 = vpshufd_avx(ZEXT416(uVar15),0);
      local_5c0 = auVar243._0_4_;
      fStack_5bc = auVar243._4_4_;
      fStack_5b8 = auVar243._8_4_;
      fStack_5b4 = auVar243._12_4_;
      auVar243 = vshufps_avx(auVar204,auVar204,0);
      local_440._16_16_ = auVar243;
      local_440._0_16_ = auVar243;
      auVar243 = vpermilps_avx(ZEXT416(uVar7),0);
      register0x00001210 = auVar243;
      _local_460 = auVar243;
      auVar135._0_4_ = 1.0 / (float)local_540._0_4_;
      auVar135._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar243 = vshufps_avx(auVar135,auVar135,0);
      register0x00001210 = auVar243;
      _local_140 = auVar243;
      auVar243 = vpermilps_avx(local_580._0_16_,0);
      local_580._16_16_ = auVar243;
      local_580._0_16_ = auVar243;
      auVar243 = vpermilps_avx(local_560._0_16_,0);
      local_560._16_16_ = auVar243;
      local_560._0_16_ = auVar243;
      auVar155 = ZEXT3264(local_560);
      auVar145 = auVar316._0_32_;
      for (lVar130 = 8; local_620 = auVar192._0_32_, lVar130 < (int)uVar15; lVar130 = lVar130 + 8) {
        pauVar1 = (undefined1 (*) [28])(bezier_basis0 + lVar130 * 4 + lVar127);
        fVar195 = *(float *)*pauVar1;
        fVar216 = *(float *)(*pauVar1 + 4);
        fVar219 = *(float *)(*pauVar1 + 8);
        fVar257 = *(float *)(*pauVar1 + 0xc);
        fVar265 = *(float *)(*pauVar1 + 0x10);
        fVar267 = *(float *)(*pauVar1 + 0x14);
        fVar269 = *(float *)(*pauVar1 + 0x18);
        auVar120 = *pauVar1;
        pauVar1 = (undefined1 (*) [28])(lVar127 + 0x21fb768 + lVar130 * 4);
        fVar271 = *(float *)*pauVar1;
        fVar272 = *(float *)(*pauVar1 + 4);
        fVar273 = *(float *)(*pauVar1 + 8);
        fVar274 = *(float *)(*pauVar1 + 0xc);
        fVar283 = *(float *)(*pauVar1 + 0x10);
        fVar285 = *(float *)(*pauVar1 + 0x14);
        fVar287 = *(float *)(*pauVar1 + 0x18);
        auVar119 = *pauVar1;
        pauVar1 = (undefined1 (*) [28])(lVar127 + 0x21fbbec + lVar130 * 4);
        fVar290 = *(float *)*pauVar1;
        fVar292 = *(float *)(*pauVar1 + 4);
        fVar293 = *(float *)(*pauVar1 + 8);
        fVar318 = *(float *)(*pauVar1 + 0xc);
        fVar320 = *(float *)(*pauVar1 + 0x10);
        fVar236 = *(float *)(*pauVar1 + 0x14);
        fVar307 = *(float *)(*pauVar1 + 0x18);
        auVar118 = *pauVar1;
        pfVar2 = (float *)(lVar127 + 0x21fc070 + lVar130 * 4);
        fVar322 = *pfVar2;
        fVar289 = pfVar2[1];
        fVar237 = pfVar2[2];
        fVar308 = pfVar2[3];
        fVar323 = pfVar2[4];
        fVar324 = pfVar2[5];
        fVar238 = pfVar2[6];
        fVar233 = local_5a0._0_4_;
        fVar234 = local_5a0._4_4_;
        fVar235 = local_5a0._8_4_;
        fVar132 = local_5a0._12_4_;
        fVar156 = local_5a0._16_4_;
        fVar159 = local_5a0._20_4_;
        fVar163 = local_5a0._24_4_;
        fVar193 = auVar232._28_4_;
        local_8c0._0_4_ =
             (float)local_3e0._0_4_ * fVar195 +
             (float)local_c0._0_4_ * fVar271 + fVar233 * fVar290 + (float)local_520._0_4_ * fVar322;
        local_8c0._4_4_ =
             (float)local_3e0._4_4_ * fVar216 +
             (float)local_c0._4_4_ * fVar272 + fVar234 * fVar292 + (float)local_520._4_4_ * fVar289;
        fStack_8b8 = fStack_3d8 * fVar219 +
                     fStack_b8 * fVar273 + fVar235 * fVar293 + fStack_518 * fVar237;
        fStack_8b4 = fStack_3d4 * fVar257 +
                     fStack_b4 * fVar274 + fVar132 * fVar318 + fStack_514 * fVar308;
        fStack_8b0 = fStack_3d0 * fVar265 +
                     fStack_b0 * fVar283 + fVar156 * fVar320 + fStack_510 * fVar323;
        fStack_8ac = fStack_3cc * fVar267 +
                     fStack_ac * fVar285 + fVar159 * fVar236 + fStack_50c * fVar324;
        fStack_8a8 = fStack_3c8 * fVar269 +
                     fStack_a8 * fVar287 + fVar163 * fVar307 + fStack_508 * fVar238;
        fStack_8a4 = fVar193 + pfVar2[7] + fVar193 + fVar193 + auVar155._28_4_;
        fVar165 = auVar357._0_4_;
        fVar167 = auVar357._4_4_;
        fVar169 = auVar357._8_4_;
        fVar171 = auVar357._12_4_;
        fVar196 = auVar357._16_4_;
        fVar214 = auVar357._20_4_;
        fVar309 = auVar357._24_4_;
        local_820._0_4_ =
             fVar165 * fVar195 +
             fVar271 * (float)local_500._0_4_ +
             (float)local_4e0._0_4_ * fVar290 + auVar306._0_4_ * fVar322;
        local_820._4_4_ =
             fVar167 * fVar216 +
             fVar272 * (float)local_500._4_4_ +
             (float)local_4e0._4_4_ * fVar292 + auVar306._4_4_ * fVar289;
        local_820._8_4_ =
             fVar169 * fVar219 +
             fVar273 * fStack_4f8 + fStack_4d8 * fVar293 + auVar306._8_4_ * fVar237;
        local_820._12_4_ =
             fVar171 * fVar257 +
             fVar274 * fStack_4f4 + fStack_4d4 * fVar318 + auVar306._12_4_ * fVar308;
        local_820._16_4_ =
             fVar196 * fVar265 +
             fVar283 * fStack_4f0 + fStack_4d0 * fVar320 + auVar306._16_4_ * fVar323;
        local_820._20_4_ =
             fVar214 * fVar267 +
             fVar285 * fStack_4ec + fStack_4cc * fVar236 + auVar306._20_4_ * fVar324;
        local_820._24_4_ =
             fVar309 * fVar269 +
             fVar287 * fStack_4e8 + fStack_4c8 * fVar307 + auVar306._24_4_ * fVar238;
        local_820._28_4_ = fStack_8a4 + fVar193 + fVar193 + auVar282._28_4_;
        auVar232 = ZEXT3264(local_820);
        fVar133 = fVar271 * (float)local_280._0_4_ +
                  fVar290 * (float)local_400._0_4_ + (float)local_a0._0_4_ * fVar322 +
                  (float)local_e0._0_4_ * fVar195;
        fVar158 = fVar272 * (float)local_280._4_4_ +
                  fVar292 * (float)local_400._4_4_ + (float)local_a0._4_4_ * fVar289 +
                  (float)local_e0._4_4_ * fVar216;
        fVar162 = fVar273 * fStack_278 + fVar293 * fStack_3f8 + fStack_98 * fVar237 +
                  fStack_d8 * fVar219;
        fVar164 = fVar274 * fStack_274 + fVar318 * fStack_3f4 + fStack_94 * fVar308 +
                  fStack_d4 * fVar257;
        fVar166 = fVar283 * fStack_270 + fVar320 * fStack_3f0 + fStack_90 * fVar323 +
                  fStack_d0 * fVar265;
        fVar168 = fVar285 * fStack_26c + fVar236 * fStack_3ec + fStack_8c * fVar324 +
                  fStack_cc * fVar267;
        fVar170 = fVar287 * fStack_268 + fVar307 * fStack_3e8 + fStack_88 * fVar238 +
                  fStack_c8 * fVar269;
        fVar172 = fVar193 + fVar193 + pfVar2[7] + fStack_8a4;
        pfVar2 = (float *)(bezier_basis1 + lVar130 * 4 + lVar127);
        fVar290 = *pfVar2;
        fVar292 = pfVar2[1];
        fVar293 = pfVar2[2];
        fVar318 = pfVar2[3];
        fVar320 = pfVar2[4];
        fVar236 = pfVar2[5];
        fVar307 = pfVar2[6];
        pfVar3 = (float *)(lVar127 + 0x21fdb88 + lVar130 * 4);
        fVar193 = *pfVar3;
        fVar291 = pfVar3[1];
        fVar294 = pfVar3[2];
        fVar157 = pfVar3[3];
        fVar334 = pfVar3[4];
        fVar160 = pfVar3[5];
        fVar161 = pfVar3[6];
        pauVar1 = (undefined1 (*) [28])(lVar127 + 0x21fe00c + lVar130 * 4);
        fVar195 = *(float *)*pauVar1;
        fVar216 = *(float *)(*pauVar1 + 4);
        fVar219 = *(float *)(*pauVar1 + 8);
        fVar257 = *(float *)(*pauVar1 + 0xc);
        fVar265 = *(float *)(*pauVar1 + 0x10);
        fVar267 = *(float *)(*pauVar1 + 0x14);
        fVar269 = *(float *)(*pauVar1 + 0x18);
        auVar122 = *pauVar1;
        pauVar1 = (undefined1 (*) [28])(lVar127 + 0x21fe490 + lVar130 * 4);
        fVar271 = *(float *)*pauVar1;
        fVar272 = *(float *)(*pauVar1 + 4);
        fVar273 = *(float *)(*pauVar1 + 8);
        fVar274 = *(float *)(*pauVar1 + 0xc);
        fVar283 = *(float *)(*pauVar1 + 0x10);
        fVar285 = *(float *)(*pauVar1 + 0x14);
        fVar287 = *(float *)(*pauVar1 + 0x18);
        auVar121 = *pauVar1;
        fVar194 = auVar306._28_4_;
        fVar295 = fVar194 + *(float *)pauVar1[1];
        fVar256 = fVar194 + fVar194 + fStack_504;
        auVar155 = ZEXT3264(local_5a0);
        auVar280._0_4_ =
             (float)local_3e0._0_4_ * fVar290 +
             (float)local_c0._0_4_ * fVar193 + fVar233 * fVar195 + (float)local_520._0_4_ * fVar271;
        auVar280._4_4_ =
             (float)local_3e0._4_4_ * fVar292 +
             (float)local_c0._4_4_ * fVar291 + fVar234 * fVar216 + (float)local_520._4_4_ * fVar272;
        auVar280._8_4_ =
             fStack_3d8 * fVar293 + fStack_b8 * fVar294 + fVar235 * fVar219 + fStack_518 * fVar273;
        auVar280._12_4_ =
             fStack_3d4 * fVar318 + fStack_b4 * fVar157 + fVar132 * fVar257 + fStack_514 * fVar274;
        auVar280._16_4_ =
             fStack_3d0 * fVar320 + fStack_b0 * fVar334 + fVar156 * fVar265 + fStack_510 * fVar283;
        auVar280._20_4_ =
             fStack_3cc * fVar236 + fStack_ac * fVar160 + fVar159 * fVar267 + fStack_50c * fVar285;
        auVar280._24_4_ =
             fStack_3c8 * fVar307 + fStack_a8 * fVar161 + fVar163 * fVar269 + fStack_508 * fVar287;
        auVar280._28_4_ = fVar295 + fVar256;
        local_700._0_4_ =
             fVar165 * fVar290 +
             fVar193 * (float)local_500._0_4_ +
             (float)local_4e0._0_4_ * fVar195 + auVar306._0_4_ * fVar271;
        local_700._4_4_ =
             fVar167 * fVar292 +
             fVar291 * (float)local_500._4_4_ +
             (float)local_4e0._4_4_ * fVar216 + auVar306._4_4_ * fVar272;
        local_700._8_4_ =
             fVar169 * fVar293 +
             fVar294 * fStack_4f8 + fStack_4d8 * fVar219 + auVar306._8_4_ * fVar273;
        local_700._12_4_ =
             fVar171 * fVar318 +
             fVar157 * fStack_4f4 + fStack_4d4 * fVar257 + auVar306._12_4_ * fVar274;
        auVar263._16_4_ =
             fVar196 * fVar320 +
             fVar334 * fStack_4f0 + fStack_4d0 * fVar265 + auVar306._16_4_ * fVar283;
        auVar263._0_16_ = local_700._0_16_;
        auVar263._20_4_ =
             fVar214 * fVar236 +
             fVar160 * fStack_4ec + fStack_4cc * fVar267 + auVar306._20_4_ * fVar285;
        auVar263._24_4_ =
             fVar309 * fVar307 +
             fVar161 * fStack_4e8 + fStack_4c8 * fVar269 + auVar306._24_4_ * fVar287;
        auVar263._28_4_ = fVar256 + fVar194 + fVar194 + fVar172;
        auVar362._0_4_ =
             fVar193 * (float)local_280._0_4_ +
             fVar195 * (float)local_400._0_4_ + (float)local_a0._0_4_ * fVar271 +
             fVar290 * (float)local_e0._0_4_;
        auVar362._4_4_ =
             fVar291 * (float)local_280._4_4_ +
             fVar216 * (float)local_400._4_4_ + (float)local_a0._4_4_ * fVar272 +
             fVar292 * (float)local_e0._4_4_;
        auVar362._8_4_ =
             fVar294 * fStack_278 + fVar219 * fStack_3f8 + fStack_98 * fVar273 + fVar293 * fStack_d8
        ;
        auVar362._12_4_ =
             fVar157 * fStack_274 + fVar257 * fStack_3f4 + fStack_94 * fVar274 + fVar318 * fStack_d4
        ;
        auVar362._16_4_ =
             fVar334 * fStack_270 + fVar265 * fStack_3f0 + fStack_90 * fVar283 + fVar320 * fStack_d0
        ;
        auVar362._20_4_ =
             fVar160 * fStack_26c + fVar267 * fStack_3ec + fStack_8c * fVar285 + fVar236 * fStack_cc
        ;
        auVar362._24_4_ =
             fVar161 * fStack_268 + fVar269 * fStack_3e8 + fStack_88 * fVar287 + fVar307 * fStack_c8
        ;
        auVar362._28_4_ = fVar194 + fVar295 + fVar256;
        auVar152 = vsubps_avx(auVar280,_local_8c0);
        auVar313 = vsubps_avx(auVar263,local_820);
        fVar195 = auVar152._0_4_;
        fVar219 = auVar152._4_4_;
        auVar68._4_4_ = local_820._4_4_ * fVar219;
        auVar68._0_4_ = local_820._0_4_ * fVar195;
        fVar265 = auVar152._8_4_;
        auVar68._8_4_ = local_820._8_4_ * fVar265;
        fVar269 = auVar152._12_4_;
        auVar68._12_4_ = local_820._12_4_ * fVar269;
        fVar272 = auVar152._16_4_;
        auVar68._16_4_ = local_820._16_4_ * fVar272;
        fVar274 = auVar152._20_4_;
        auVar68._20_4_ = local_820._20_4_ * fVar274;
        fVar285 = auVar152._24_4_;
        auVar68._24_4_ = local_820._24_4_ * fVar285;
        auVar68._28_4_ = fVar256;
        fVar216 = auVar313._0_4_;
        fVar257 = auVar313._4_4_;
        auVar69._4_4_ = (float)local_8c0._4_4_ * fVar257;
        auVar69._0_4_ = (float)local_8c0._0_4_ * fVar216;
        fVar267 = auVar313._8_4_;
        auVar69._8_4_ = fStack_8b8 * fVar267;
        fVar271 = auVar313._12_4_;
        auVar69._12_4_ = fStack_8b4 * fVar271;
        fVar273 = auVar313._16_4_;
        auVar69._16_4_ = fStack_8b0 * fVar273;
        fVar283 = auVar313._20_4_;
        auVar69._20_4_ = fStack_8ac * fVar283;
        fVar287 = auVar313._24_4_;
        auVar69._24_4_ = fStack_8a8 * fVar287;
        auVar69._28_4_ = auVar263._28_4_;
        auVar19 = vsubps_avx(auVar68,auVar69);
        auVar113._4_4_ = fVar158;
        auVar113._0_4_ = fVar133;
        auVar113._8_4_ = fVar162;
        auVar113._12_4_ = fVar164;
        auVar113._16_4_ = fVar166;
        auVar113._20_4_ = fVar168;
        auVar113._24_4_ = fVar170;
        auVar113._28_4_ = fVar172;
        auVar231 = vmaxps_avx(auVar113,auVar362);
        auVar70._4_4_ = auVar231._4_4_ * auVar231._4_4_ * (fVar219 * fVar219 + fVar257 * fVar257);
        auVar70._0_4_ = auVar231._0_4_ * auVar231._0_4_ * (fVar195 * fVar195 + fVar216 * fVar216);
        auVar70._8_4_ = auVar231._8_4_ * auVar231._8_4_ * (fVar265 * fVar265 + fVar267 * fVar267);
        auVar70._12_4_ = auVar231._12_4_ * auVar231._12_4_ * (fVar269 * fVar269 + fVar271 * fVar271)
        ;
        auVar70._16_4_ = auVar231._16_4_ * auVar231._16_4_ * (fVar272 * fVar272 + fVar273 * fVar273)
        ;
        auVar70._20_4_ = auVar231._20_4_ * auVar231._20_4_ * (fVar274 * fVar274 + fVar283 * fVar283)
        ;
        auVar70._24_4_ = auVar231._24_4_ * auVar231._24_4_ * (fVar285 * fVar285 + fVar287 * fVar287)
        ;
        auVar70._28_4_ = auVar280._28_4_ + auVar263._28_4_;
        auVar71._4_4_ = auVar19._4_4_ * auVar19._4_4_;
        auVar71._0_4_ = auVar19._0_4_ * auVar19._0_4_;
        auVar71._8_4_ = auVar19._8_4_ * auVar19._8_4_;
        auVar71._12_4_ = auVar19._12_4_ * auVar19._12_4_;
        auVar71._16_4_ = auVar19._16_4_ * auVar19._16_4_;
        auVar71._20_4_ = auVar19._20_4_ * auVar19._20_4_;
        auVar71._24_4_ = auVar19._24_4_ * auVar19._24_4_;
        auVar71._28_4_ = auVar19._28_4_;
        _local_6e0 = vcmpps_avx(auVar71,auVar70,2);
        local_360 = (uint)lVar130;
        auVar200 = vpshufd_avx(ZEXT416(local_360),0);
        auVar243 = vpor_avx(auVar200,_DAT_01f4ad30);
        auVar200 = vpor_avx(auVar200,_DAT_01f7afa0);
        auVar116._4_4_ = fStack_5bc;
        auVar116._0_4_ = local_5c0;
        auVar116._8_4_ = fStack_5b8;
        auVar116._12_4_ = fStack_5b4;
        auVar243 = vpcmpgtd_avx(auVar116,auVar243);
        auVar282 = ZEXT1664(auVar243);
        auVar200 = vpcmpgtd_avx(auVar116,auVar200);
        auVar210._16_16_ = auVar200;
        auVar210._0_16_ = auVar243;
        auVar231 = auVar210 & _local_6e0;
        local_840 = (undefined1  [8])prim;
        if ((((((((auVar231 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar231 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar231 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar231 >> 0x7f,0) == '\0') &&
              (auVar231 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar231 >> 0xbf,0) == '\0') &&
            (auVar231 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar231[0x1f]) {
          auVar192 = ZEXT3264(local_620);
          auVar306 = ZEXT3264(_local_6a0);
          auVar357 = ZEXT3264(auVar357._0_32_);
        }
        else {
          local_760._0_4_ = auVar122._0_4_;
          local_760._4_4_ = auVar122._4_4_;
          fStack_758 = auVar122._8_4_;
          fStack_754 = auVar122._12_4_;
          fStack_750 = auVar122._16_4_;
          fStack_74c = auVar122._20_4_;
          fStack_748 = auVar122._24_4_;
          local_6c0._0_4_ = auVar121._0_4_;
          local_6c0._4_4_ = auVar121._4_4_;
          fStack_6b8 = auVar121._8_4_;
          fStack_6b4 = auVar121._12_4_;
          fStack_6b0 = auVar121._16_4_;
          fStack_6ac = auVar121._20_4_;
          fStack_6a8 = auVar121._24_4_;
          fVar216 = auVar313._28_4_;
          local_6c0._0_4_ =
               fVar290 * (float)local_600._0_4_ +
               fVar193 * (float)local_420._0_4_ +
               (float)local_100._0_4_ * (float)local_760._0_4_ +
               (float)local_120._0_4_ * (float)local_6c0._0_4_;
          local_6c0._4_4_ =
               fVar292 * (float)local_600._4_4_ +
               fVar291 * (float)local_420._4_4_ +
               (float)local_100._4_4_ * (float)local_760._4_4_ +
               (float)local_120._4_4_ * (float)local_6c0._4_4_;
          fStack_6b8 = fVar293 * fStack_5f8 +
                       fVar294 * fStack_418 + fStack_f8 * fStack_758 + fStack_118 * fStack_6b8;
          fStack_6b4 = fVar318 * fStack_5f4 +
                       fVar157 * fStack_414 + fStack_f4 * fStack_754 + fStack_114 * fStack_6b4;
          fStack_6b0 = fVar320 * fStack_5f0 +
                       fVar334 * fStack_410 + fStack_f0 * fStack_750 + fStack_110 * fStack_6b0;
          fStack_6ac = fVar236 * fStack_5ec +
                       fVar160 * fStack_40c + fStack_ec * fStack_74c + fStack_10c * fStack_6ac;
          fStack_6a8 = fVar307 * fStack_5e8 +
                       fVar161 * fStack_408 + fStack_e8 * fStack_748 + fStack_108 * fStack_6a8;
          fStack_6a4 = pfVar2[7] + local_5a0._28_4_ + fVar216 + 0.0;
          local_840._0_4_ = auVar119._0_4_;
          local_840._4_4_ = auVar119._4_4_;
          auStack_838._0_4_ = auVar119._8_4_;
          auStack_838._4_4_ = auVar119._12_4_;
          fStack_830 = auVar119._16_4_;
          fStack_82c = auVar119._20_4_;
          fStack_828 = auVar119._24_4_;
          local_720._0_4_ = auVar118._0_4_;
          local_720._4_4_ = auVar118._4_4_;
          fStack_718 = auVar118._8_4_;
          fStack_714 = auVar118._12_4_;
          uStack_710._0_4_ = auVar118._16_4_;
          uStack_710._4_4_ = auVar118._20_4_;
          uStack_708._0_4_ = auVar118._24_4_;
          pfVar2 = (float *)(lVar127 + 0x21fcdfc + lVar130 * 4);
          fVar195 = *pfVar2;
          fVar219 = pfVar2[1];
          fVar257 = pfVar2[2];
          fVar265 = pfVar2[3];
          fVar267 = pfVar2[4];
          fVar269 = pfVar2[5];
          fVar271 = pfVar2[6];
          pfVar3 = (float *)(lVar127 + 0x21fd280 + lVar130 * 4);
          fVar272 = *pfVar3;
          fVar273 = pfVar3[1];
          fVar274 = pfVar3[2];
          fVar283 = pfVar3[3];
          fVar285 = pfVar3[4];
          fVar287 = pfVar3[5];
          fVar290 = pfVar3[6];
          pfVar4 = (float *)(lVar127 + 0x21fc978 + lVar130 * 4);
          fVar292 = *pfVar4;
          fVar293 = pfVar4[1];
          fVar318 = pfVar4[2];
          fVar320 = pfVar4[3];
          fVar236 = pfVar4[4];
          fVar307 = pfVar4[5];
          fVar193 = pfVar4[6];
          fVar295 = pfVar2[7] + pfVar3[7];
          fVar194 = pfVar3[7] + fStack_3c4 + 0.0;
          fVar296 = fStack_3c4 + auVar362._28_4_ + fStack_3c4 + 0.0;
          pfVar2 = (float *)(lVar127 + 0x21fc4f4 + lVar130 * 4);
          fVar291 = *pfVar2;
          fVar294 = pfVar2[1];
          fVar157 = pfVar2[2];
          fVar334 = pfVar2[3];
          fVar160 = pfVar2[4];
          fVar161 = pfVar2[5];
          fVar256 = pfVar2[6];
          local_740 = (float)local_3e0._0_4_ * fVar291 +
                      (float)local_c0._0_4_ * fVar292 +
                      fVar233 * fVar195 + (float)local_520._0_4_ * fVar272;
          fStack_73c = (float)local_3e0._4_4_ * fVar294 +
                       (float)local_c0._4_4_ * fVar293 +
                       fVar234 * fVar219 + (float)local_520._4_4_ * fVar273;
          fStack_738 = fStack_3d8 * fVar157 +
                       fStack_b8 * fVar318 + fVar235 * fVar257 + fStack_518 * fVar274;
          fStack_734 = fStack_3d4 * fVar334 +
                       fStack_b4 * fVar320 + fVar132 * fVar265 + fStack_514 * fVar283;
          fStack_730 = fStack_3d0 * fVar160 +
                       fStack_b0 * fVar236 + fVar156 * fVar267 + fStack_510 * fVar285;
          fStack_72c = fStack_3cc * fVar161 +
                       fStack_ac * fVar307 + fVar159 * fVar269 + fStack_50c * fVar287;
          fStack_728 = fStack_3c8 * fVar256 +
                       fStack_a8 * fVar193 + fVar163 * fVar271 + fStack_508 * fVar290;
          fStack_724 = fVar295 + fVar194;
          auVar185._0_4_ =
               fVar165 * fVar291 +
               (float)local_4e0._0_4_ * fVar195 + (float)local_6a0._0_4_ * fVar272 +
               fVar292 * (float)local_500._0_4_;
          auVar185._4_4_ =
               fVar167 * fVar294 +
               (float)local_4e0._4_4_ * fVar219 + (float)local_6a0._4_4_ * fVar273 +
               fVar293 * (float)local_500._4_4_;
          auVar185._8_4_ =
               fVar169 * fVar157 +
               fStack_4d8 * fVar257 + fStack_698 * fVar274 + fVar318 * fStack_4f8;
          auVar185._12_4_ =
               fVar171 * fVar334 +
               fStack_4d4 * fVar265 + fStack_694 * fVar283 + fVar320 * fStack_4f4;
          auVar185._16_4_ =
               fVar196 * fVar160 +
               fStack_4d0 * fVar267 + fStack_690 * fVar285 + fVar236 * fStack_4f0;
          auVar185._20_4_ =
               fVar214 * fVar161 +
               fStack_4cc * fVar269 + fStack_68c * fVar287 + fVar307 * fStack_4ec;
          auVar185._24_4_ =
               fVar309 * fVar256 +
               fStack_4c8 * fVar271 + fStack_688 * fVar290 + fVar193 * fStack_4e8;
          auVar185._28_4_ = fVar194 + fVar296;
          auVar363._0_4_ =
               fVar292 * (float)local_420._0_4_ +
               (float)local_100._0_4_ * fVar195 + (float)local_120._0_4_ * fVar272 +
               fVar291 * (float)local_600._0_4_;
          auVar363._4_4_ =
               fVar293 * (float)local_420._4_4_ +
               (float)local_100._4_4_ * fVar219 + (float)local_120._4_4_ * fVar273 +
               fVar294 * (float)local_600._4_4_;
          auVar363._8_4_ =
               fVar318 * fStack_418 + fStack_f8 * fVar257 + fStack_118 * fVar274 +
               fVar157 * fStack_5f8;
          auVar363._12_4_ =
               fVar320 * fStack_414 + fStack_f4 * fVar265 + fStack_114 * fVar283 +
               fVar334 * fStack_5f4;
          auVar363._16_4_ =
               fVar236 * fStack_410 + fStack_f0 * fVar267 + fStack_110 * fVar285 +
               fVar160 * fStack_5f0;
          auVar363._20_4_ =
               fVar307 * fStack_40c + fStack_ec * fVar269 + fStack_10c * fVar287 +
               fVar161 * fStack_5ec;
          auVar363._24_4_ =
               fVar193 * fStack_408 + fStack_e8 * fVar271 + fStack_108 * fVar290 +
               fVar256 * fStack_5e8;
          auVar363._28_4_ = pfVar4[7] + fVar295 + fVar296;
          pfVar2 = (float *)(lVar127 + 0x21ff21c + lVar130 * 4);
          fVar219 = *pfVar2;
          fVar257 = pfVar2[1];
          fVar265 = pfVar2[2];
          fVar267 = pfVar2[3];
          fVar269 = pfVar2[4];
          fVar271 = pfVar2[5];
          fVar272 = pfVar2[6];
          pfVar3 = (float *)(lVar127 + 0x21ff6a0 + lVar130 * 4);
          fVar273 = *pfVar3;
          fVar274 = pfVar3[1];
          fVar283 = pfVar3[2];
          fVar285 = pfVar3[3];
          fVar287 = pfVar3[4];
          fVar290 = pfVar3[5];
          fVar292 = pfVar3[6];
          fVar195 = auVar357._28_4_;
          pfVar4 = (float *)(lVar127 + 0x21fed98 + lVar130 * 4);
          fVar293 = *pfVar4;
          fVar318 = pfVar4[1];
          fVar320 = pfVar4[2];
          fVar236 = pfVar4[3];
          fVar307 = pfVar4[4];
          fVar193 = pfVar4[5];
          fVar291 = pfVar4[6];
          pfVar5 = (float *)(lVar127 + 0x21fe914 + lVar130 * 4);
          fVar294 = *pfVar5;
          fVar157 = pfVar5[1];
          fVar334 = pfVar5[2];
          fVar160 = pfVar5[3];
          fVar161 = pfVar5[4];
          fVar256 = pfVar5[5];
          fVar295 = pfVar5[6];
          auVar330._0_4_ =
               (float)local_3e0._0_4_ * fVar294 +
               (float)local_c0._0_4_ * fVar293 +
               fVar219 * fVar233 + (float)local_520._0_4_ * fVar273;
          auVar330._4_4_ =
               (float)local_3e0._4_4_ * fVar157 +
               (float)local_c0._4_4_ * fVar318 +
               fVar257 * fVar234 + (float)local_520._4_4_ * fVar274;
          auVar330._8_4_ =
               fStack_3d8 * fVar334 + fStack_b8 * fVar320 + fVar265 * fVar235 + fStack_518 * fVar283
          ;
          auVar330._12_4_ =
               fStack_3d4 * fVar160 + fStack_b4 * fVar236 + fVar267 * fVar132 + fStack_514 * fVar285
          ;
          auVar330._16_4_ =
               fStack_3d0 * fVar161 + fStack_b0 * fVar307 + fVar269 * fVar156 + fStack_510 * fVar287
          ;
          auVar330._20_4_ =
               fStack_3cc * fVar256 + fStack_ac * fVar193 + fVar271 * fVar159 + fStack_50c * fVar290
          ;
          auVar330._24_4_ =
               fStack_3c8 * fVar295 + fStack_a8 * fVar291 + fVar272 * fVar163 + fStack_508 * fVar292
          ;
          auVar330._28_4_ = fVar195 + fVar195 + fStack_504 + fVar195;
          auVar355._0_4_ =
               fVar294 * (float)local_780._0_4_ +
               fVar293 * (float)local_500._0_4_ +
               (float)local_4e0._0_4_ * fVar219 + (float)local_6a0._0_4_ * fVar273;
          auVar355._4_4_ =
               fVar157 * (float)local_780._4_4_ +
               fVar318 * (float)local_500._4_4_ +
               (float)local_4e0._4_4_ * fVar257 + (float)local_6a0._4_4_ * fVar274;
          auVar355._8_4_ =
               fVar334 * fStack_778 +
               fVar320 * fStack_4f8 + fStack_4d8 * fVar265 + fStack_698 * fVar283;
          auVar355._12_4_ =
               fVar160 * fStack_774 +
               fVar236 * fStack_4f4 + fStack_4d4 * fVar267 + fStack_694 * fVar285;
          auVar355._16_4_ =
               fVar161 * fStack_770 +
               fVar307 * fStack_4f0 + fStack_4d0 * fVar269 + fStack_690 * fVar287;
          auVar355._20_4_ =
               fVar256 * fStack_76c +
               fVar193 * fStack_4ec + fStack_4cc * fVar271 + fStack_68c * fVar290;
          auVar355._24_4_ =
               fVar295 * fStack_768 +
               fVar291 * fStack_4e8 + fStack_4c8 * fVar272 + fStack_688 * fVar292;
          auVar355._28_4_ = fVar195 + fVar195 + fStack_684 + fVar195;
          auVar264._8_4_ = 0x7fffffff;
          auVar264._0_8_ = 0x7fffffff7fffffff;
          auVar264._12_4_ = 0x7fffffff;
          auVar264._16_4_ = 0x7fffffff;
          auVar264._20_4_ = 0x7fffffff;
          auVar264._24_4_ = 0x7fffffff;
          auVar264._28_4_ = 0x7fffffff;
          auVar115._4_4_ = fStack_73c;
          auVar115._0_4_ = local_740;
          auVar115._8_4_ = fStack_738;
          auVar115._12_4_ = fStack_734;
          auVar115._16_4_ = fStack_730;
          auVar115._20_4_ = fStack_72c;
          auVar115._24_4_ = fStack_728;
          auVar115._28_4_ = fStack_724;
          auVar231 = vandps_avx(auVar115,auVar264);
          auVar19 = vandps_avx(auVar185,auVar264);
          auVar19 = vmaxps_avx(auVar231,auVar19);
          auVar231 = vandps_avx(auVar363,auVar264);
          auVar19 = vmaxps_avx(auVar19,auVar231);
          auVar19 = vcmpps_avx(auVar19,local_440,1);
          auVar20 = vblendvps_avx(auVar115,auVar152,auVar19);
          auVar147._0_4_ =
               fVar294 * (float)local_600._0_4_ +
               fVar293 * (float)local_420._0_4_ +
               fVar273 * (float)local_120._0_4_ + (float)local_100._0_4_ * fVar219;
          auVar147._4_4_ =
               fVar157 * (float)local_600._4_4_ +
               fVar318 * (float)local_420._4_4_ +
               fVar274 * (float)local_120._4_4_ + (float)local_100._4_4_ * fVar257;
          auVar147._8_4_ =
               fVar334 * fStack_5f8 +
               fVar320 * fStack_418 + fVar283 * fStack_118 + fStack_f8 * fVar265;
          auVar147._12_4_ =
               fVar160 * fStack_5f4 +
               fVar236 * fStack_414 + fVar285 * fStack_114 + fStack_f4 * fVar267;
          auVar147._16_4_ =
               fVar161 * fStack_5f0 +
               fVar307 * fStack_410 + fVar287 * fStack_110 + fStack_f0 * fVar269;
          auVar147._20_4_ =
               fVar256 * fStack_5ec +
               fVar193 * fStack_40c + fVar290 * fStack_10c + fStack_ec * fVar271;
          auVar147._24_4_ =
               fVar295 * fStack_5e8 +
               fVar291 * fStack_408 + fVar292 * fStack_108 + fStack_e8 * fVar272;
          auVar147._28_4_ = auVar231._28_4_ + pfVar4[7] + pfVar3[7] + pfVar2[7];
          auVar21 = vblendvps_avx(auVar185,auVar313,auVar19);
          auVar231 = vandps_avx(auVar330,auVar264);
          auVar19 = vandps_avx(auVar355,auVar264);
          auVar22 = vmaxps_avx(auVar231,auVar19);
          auVar231 = vandps_avx(auVar147,auVar264);
          auVar231 = vmaxps_avx(auVar22,auVar231);
          local_800._0_4_ = auVar120._0_4_;
          local_800._4_4_ = auVar120._4_4_;
          uStack_7f8._0_4_ = auVar120._8_4_;
          uStack_7f8._4_4_ = auVar120._12_4_;
          uStack_7f0._0_4_ = auVar120._16_4_;
          uStack_7f0._4_4_ = auVar120._20_4_;
          uStack_7e8._0_4_ = auVar120._24_4_;
          auVar19 = vcmpps_avx(auVar231,local_440,1);
          auVar231 = vblendvps_avx(auVar330,auVar152,auVar19);
          auVar148._0_4_ =
               (float)local_600._0_4_ * (float)local_800._0_4_ +
               (float)local_420._0_4_ * (float)local_840._0_4_ +
               (float)local_100._0_4_ * (float)local_720._0_4_ + (float)local_120._0_4_ * fVar322;
          auVar148._4_4_ =
               (float)local_600._4_4_ * (float)local_800._4_4_ +
               (float)local_420._4_4_ * (float)local_840._4_4_ +
               (float)local_100._4_4_ * (float)local_720._4_4_ + (float)local_120._4_4_ * fVar289;
          auVar148._8_4_ =
               fStack_5f8 * (float)uStack_7f8 +
               fStack_418 * (float)auStack_838._0_4_ + fStack_f8 * fStack_718 + fStack_118 * fVar237
          ;
          auVar148._12_4_ =
               fStack_5f4 * uStack_7f8._4_4_ +
               fStack_414 * (float)auStack_838._4_4_ + fStack_f4 * fStack_714 + fStack_114 * fVar308
          ;
          auVar148._16_4_ =
               fStack_5f0 * (float)uStack_7f0 +
               fStack_410 * fStack_830 + fStack_f0 * (float)uStack_710 + fStack_110 * fVar323;
          auVar148._20_4_ =
               fStack_5ec * uStack_7f0._4_4_ +
               fStack_40c * fStack_82c + fStack_ec * uStack_710._4_4_ + fStack_10c * fVar324;
          auVar148._24_4_ =
               fStack_5e8 * (float)uStack_7e8 +
               fStack_408 * fStack_828 + fStack_e8 * (float)uStack_708 + fStack_108 * fVar238;
          auVar148._28_4_ = auVar22._28_4_ + fStack_6a4 + fVar216 + 0.0;
          auVar152 = vblendvps_avx(auVar355,auVar313,auVar19);
          fVar256 = auVar20._0_4_;
          fVar295 = auVar20._4_4_;
          fVar194 = auVar20._8_4_;
          fVar233 = auVar20._12_4_;
          fVar234 = auVar20._16_4_;
          fVar235 = auVar20._20_4_;
          fVar132 = auVar20._24_4_;
          fVar156 = auVar20._28_4_;
          fVar290 = auVar231._0_4_;
          fVar293 = auVar231._4_4_;
          fVar320 = auVar231._8_4_;
          fVar307 = auVar231._12_4_;
          fVar289 = auVar231._16_4_;
          fVar308 = auVar231._20_4_;
          fVar324 = auVar231._24_4_;
          fVar195 = auVar21._0_4_;
          fVar219 = auVar21._4_4_;
          fVar265 = auVar21._8_4_;
          fVar269 = auVar21._12_4_;
          fVar272 = auVar21._16_4_;
          fVar274 = auVar21._20_4_;
          fVar285 = auVar21._24_4_;
          auVar340._0_4_ = fVar195 * fVar195 + fVar256 * fVar256;
          auVar340._4_4_ = fVar219 * fVar219 + fVar295 * fVar295;
          auVar340._8_4_ = fVar265 * fVar265 + fVar194 * fVar194;
          auVar340._12_4_ = fVar269 * fVar269 + fVar233 * fVar233;
          auVar340._16_4_ = fVar272 * fVar272 + fVar234 * fVar234;
          auVar340._20_4_ = fVar274 * fVar274 + fVar235 * fVar235;
          auVar340._24_4_ = fVar285 * fVar285 + fVar132 * fVar132;
          auVar340._28_4_ = fStack_4c4 + fVar216;
          auVar19 = vrsqrtps_avx(auVar340);
          fVar216 = auVar19._0_4_;
          fVar257 = auVar19._4_4_;
          auVar72._4_4_ = fVar257 * 1.5;
          auVar72._0_4_ = fVar216 * 1.5;
          fVar267 = auVar19._8_4_;
          auVar72._8_4_ = fVar267 * 1.5;
          fVar271 = auVar19._12_4_;
          auVar72._12_4_ = fVar271 * 1.5;
          fVar273 = auVar19._16_4_;
          auVar72._16_4_ = fVar273 * 1.5;
          fVar283 = auVar19._20_4_;
          auVar72._20_4_ = fVar283 * 1.5;
          fVar287 = auVar19._24_4_;
          auVar72._24_4_ = fVar287 * 1.5;
          auVar72._28_4_ = auVar355._28_4_;
          auVar73._4_4_ = fVar257 * fVar257 * fVar257 * auVar340._4_4_ * 0.5;
          auVar73._0_4_ = fVar216 * fVar216 * fVar216 * auVar340._0_4_ * 0.5;
          auVar73._8_4_ = fVar267 * fVar267 * fVar267 * auVar340._8_4_ * 0.5;
          auVar73._12_4_ = fVar271 * fVar271 * fVar271 * auVar340._12_4_ * 0.5;
          auVar73._16_4_ = fVar273 * fVar273 * fVar273 * auVar340._16_4_ * 0.5;
          auVar73._20_4_ = fVar283 * fVar283 * fVar283 * auVar340._20_4_ * 0.5;
          auVar73._24_4_ = fVar287 * fVar287 * fVar287 * auVar340._24_4_ * 0.5;
          auVar73._28_4_ = auVar340._28_4_;
          auVar20 = vsubps_avx(auVar72,auVar73);
          fVar193 = auVar20._0_4_;
          fVar291 = auVar20._4_4_;
          fVar294 = auVar20._8_4_;
          fVar157 = auVar20._12_4_;
          fVar334 = auVar20._16_4_;
          fVar160 = auVar20._20_4_;
          fVar161 = auVar20._24_4_;
          fVar216 = auVar152._0_4_;
          fVar257 = auVar152._4_4_;
          fVar267 = auVar152._8_4_;
          fVar271 = auVar152._12_4_;
          fVar273 = auVar152._16_4_;
          fVar283 = auVar152._20_4_;
          fVar287 = auVar152._24_4_;
          auVar314._0_4_ = fVar216 * fVar216 + fVar290 * fVar290;
          auVar314._4_4_ = fVar257 * fVar257 + fVar293 * fVar293;
          auVar314._8_4_ = fVar267 * fVar267 + fVar320 * fVar320;
          auVar314._12_4_ = fVar271 * fVar271 + fVar307 * fVar307;
          auVar314._16_4_ = fVar273 * fVar273 + fVar289 * fVar289;
          auVar314._20_4_ = fVar283 * fVar283 + fVar308 * fVar308;
          auVar314._24_4_ = fVar287 * fVar287 + fVar324 * fVar324;
          auVar314._28_4_ = auVar19._28_4_ + auVar231._28_4_;
          auVar231 = vrsqrtps_avx(auVar314);
          fVar292 = auVar231._0_4_;
          fVar318 = auVar231._4_4_;
          auVar74._4_4_ = fVar318 * 1.5;
          auVar74._0_4_ = fVar292 * 1.5;
          fVar236 = auVar231._8_4_;
          auVar74._8_4_ = fVar236 * 1.5;
          fVar322 = auVar231._12_4_;
          auVar74._12_4_ = fVar322 * 1.5;
          fVar237 = auVar231._16_4_;
          auVar74._16_4_ = fVar237 * 1.5;
          fVar323 = auVar231._20_4_;
          auVar74._20_4_ = fVar323 * 1.5;
          fVar238 = auVar231._24_4_;
          auVar74._24_4_ = fVar238 * 1.5;
          auVar74._28_4_ = auVar355._28_4_;
          auVar75._4_4_ = fVar318 * fVar318 * fVar318 * auVar314._4_4_ * 0.5;
          auVar75._0_4_ = fVar292 * fVar292 * fVar292 * auVar314._0_4_ * 0.5;
          auVar75._8_4_ = fVar236 * fVar236 * fVar236 * auVar314._8_4_ * 0.5;
          auVar75._12_4_ = fVar322 * fVar322 * fVar322 * auVar314._12_4_ * 0.5;
          auVar75._16_4_ = fVar237 * fVar237 * fVar237 * auVar314._16_4_ * 0.5;
          auVar75._20_4_ = fVar323 * fVar323 * fVar323 * auVar314._20_4_ * 0.5;
          auVar75._24_4_ = fVar238 * fVar238 * fVar238 * auVar314._24_4_ * 0.5;
          auVar75._28_4_ = auVar314._28_4_;
          auVar152 = vsubps_avx(auVar74,auVar75);
          fVar292 = auVar152._0_4_;
          fVar318 = auVar152._4_4_;
          fVar236 = auVar152._8_4_;
          fVar322 = auVar152._12_4_;
          fVar237 = auVar152._16_4_;
          fVar323 = auVar152._20_4_;
          fVar238 = auVar152._24_4_;
          fVar195 = fVar133 * fVar193 * fVar195;
          fVar219 = fVar158 * fVar291 * fVar219;
          auVar76._4_4_ = fVar219;
          auVar76._0_4_ = fVar195;
          fVar265 = fVar162 * fVar294 * fVar265;
          auVar76._8_4_ = fVar265;
          fVar269 = fVar164 * fVar157 * fVar269;
          auVar76._12_4_ = fVar269;
          fVar272 = fVar166 * fVar334 * fVar272;
          auVar76._16_4_ = fVar272;
          fVar274 = fVar168 * fVar160 * fVar274;
          auVar76._20_4_ = fVar274;
          fVar285 = fVar170 * fVar161 * fVar285;
          auVar76._24_4_ = fVar285;
          auVar76._28_4_ = auVar231._28_4_;
          local_800._4_4_ = fVar219 + (float)local_8c0._4_4_;
          local_800._0_4_ = fVar195 + (float)local_8c0._0_4_;
          uStack_7f8._0_4_ = fVar265 + fStack_8b8;
          uStack_7f8._4_4_ = fVar269 + fStack_8b4;
          uStack_7f0._0_4_ = fVar272 + fStack_8b0;
          uStack_7f0._4_4_ = fVar274 + fStack_8ac;
          uStack_7e8._0_4_ = fVar285 + fStack_8a8;
          uStack_7e8._4_4_ = auVar231._28_4_ + fStack_8a4;
          fVar195 = fVar133 * fVar193 * -fVar256;
          fVar219 = fVar158 * fVar291 * -fVar295;
          auVar77._4_4_ = fVar219;
          auVar77._0_4_ = fVar195;
          fVar265 = fVar162 * fVar294 * -fVar194;
          auVar77._8_4_ = fVar265;
          fVar269 = fVar164 * fVar157 * -fVar233;
          auVar77._12_4_ = fVar269;
          fVar272 = fVar166 * fVar334 * -fVar234;
          auVar77._16_4_ = fVar272;
          fVar274 = fVar168 * fVar160 * -fVar235;
          auVar77._20_4_ = fVar274;
          fVar285 = fVar170 * fVar161 * -fVar132;
          auVar77._24_4_ = fVar285;
          auVar77._28_4_ = -fVar156;
          local_720._4_4_ = local_820._4_4_ + fVar219;
          local_720._0_4_ = local_820._0_4_ + fVar195;
          fStack_718 = local_820._8_4_ + fVar265;
          fStack_714 = local_820._12_4_ + fVar269;
          uStack_710._0_4_ = local_820._16_4_ + fVar272;
          uStack_710._4_4_ = local_820._20_4_ + fVar274;
          uStack_708._0_4_ = local_820._24_4_ + fVar285;
          uStack_708._4_4_ = local_820._28_4_ + -fVar156;
          fVar195 = fVar193 * 0.0 * fVar133;
          fVar219 = fVar291 * 0.0 * fVar158;
          auVar78._4_4_ = fVar219;
          auVar78._0_4_ = fVar195;
          fVar265 = fVar294 * 0.0 * fVar162;
          auVar78._8_4_ = fVar265;
          fVar269 = fVar157 * 0.0 * fVar164;
          auVar78._12_4_ = fVar269;
          fVar272 = fVar334 * 0.0 * fVar166;
          auVar78._16_4_ = fVar272;
          fVar274 = fVar160 * 0.0 * fVar168;
          auVar78._20_4_ = fVar274;
          fVar285 = fVar161 * 0.0 * fVar170;
          auVar78._24_4_ = fVar285;
          auVar78._28_4_ = fVar156;
          auVar231 = vsubps_avx(_local_8c0,auVar76);
          auVar378._0_4_ = fVar195 + auVar148._0_4_;
          auVar378._4_4_ = fVar219 + auVar148._4_4_;
          auVar378._8_4_ = fVar265 + auVar148._8_4_;
          auVar378._12_4_ = fVar269 + auVar148._12_4_;
          auVar378._16_4_ = fVar272 + auVar148._16_4_;
          auVar378._20_4_ = fVar274 + auVar148._20_4_;
          auVar378._24_4_ = fVar285 + auVar148._24_4_;
          auVar378._28_4_ = fVar156 + auVar148._28_4_;
          fVar195 = auVar362._0_4_ * fVar292 * fVar216;
          fVar216 = auVar362._4_4_ * fVar318 * fVar257;
          auVar79._4_4_ = fVar216;
          auVar79._0_4_ = fVar195;
          fVar219 = auVar362._8_4_ * fVar236 * fVar267;
          auVar79._8_4_ = fVar219;
          fVar257 = auVar362._12_4_ * fVar322 * fVar271;
          auVar79._12_4_ = fVar257;
          fVar265 = auVar362._16_4_ * fVar237 * fVar273;
          auVar79._16_4_ = fVar265;
          fVar267 = auVar362._20_4_ * fVar323 * fVar283;
          auVar79._20_4_ = fVar267;
          fVar269 = auVar362._24_4_ * fVar238 * fVar287;
          auVar79._24_4_ = fVar269;
          auVar79._28_4_ = fStack_8a4;
          auVar140 = vsubps_avx(local_820,auVar77);
          auVar364._0_4_ = auVar280._0_4_ + fVar195;
          auVar364._4_4_ = auVar280._4_4_ + fVar216;
          auVar364._8_4_ = auVar280._8_4_ + fVar219;
          auVar364._12_4_ = auVar280._12_4_ + fVar257;
          auVar364._16_4_ = auVar280._16_4_ + fVar265;
          auVar364._20_4_ = auVar280._20_4_ + fVar267;
          auVar364._24_4_ = auVar280._24_4_ + fVar269;
          auVar364._28_4_ = auVar280._28_4_ + fStack_8a4;
          fVar195 = fVar292 * -fVar290 * auVar362._0_4_;
          fVar216 = fVar318 * -fVar293 * auVar362._4_4_;
          auVar80._4_4_ = fVar216;
          auVar80._0_4_ = fVar195;
          fVar219 = fVar236 * -fVar320 * auVar362._8_4_;
          auVar80._8_4_ = fVar219;
          fVar257 = fVar322 * -fVar307 * auVar362._12_4_;
          auVar80._12_4_ = fVar257;
          fVar265 = fVar237 * -fVar289 * auVar362._16_4_;
          auVar80._16_4_ = fVar265;
          fVar267 = fVar323 * -fVar308 * auVar362._20_4_;
          auVar80._20_4_ = fVar267;
          fVar269 = fVar238 * -fVar324 * auVar362._24_4_;
          auVar80._24_4_ = fVar269;
          auVar80._28_4_ = fVar172;
          auVar178 = vsubps_avx(auVar148,auVar78);
          auVar249._0_4_ = local_700._0_4_ + fVar195;
          auVar249._4_4_ = local_700._4_4_ + fVar216;
          auVar249._8_4_ = local_700._8_4_ + fVar219;
          auVar249._12_4_ = local_700._12_4_ + fVar257;
          auVar249._16_4_ = auVar263._16_4_ + fVar265;
          auVar249._20_4_ = auVar263._20_4_ + fVar267;
          auVar249._24_4_ = auVar263._24_4_ + fVar269;
          auVar249._28_4_ = auVar263._28_4_ + fVar172;
          fVar195 = fVar292 * 0.0 * auVar362._0_4_;
          fVar216 = fVar318 * 0.0 * auVar362._4_4_;
          auVar81._4_4_ = fVar216;
          auVar81._0_4_ = fVar195;
          fVar219 = fVar236 * 0.0 * auVar362._8_4_;
          auVar81._8_4_ = fVar219;
          fVar257 = fVar322 * 0.0 * auVar362._12_4_;
          auVar81._12_4_ = fVar257;
          fVar265 = fVar237 * 0.0 * auVar362._16_4_;
          auVar81._16_4_ = fVar265;
          fVar267 = fVar323 * 0.0 * auVar362._20_4_;
          auVar81._20_4_ = fVar267;
          fVar269 = fVar238 * 0.0 * auVar362._24_4_;
          auVar81._24_4_ = fVar269;
          auVar81._28_4_ = auVar148._28_4_;
          auVar19 = vsubps_avx(auVar280,auVar79);
          auVar331._0_4_ = (float)local_6c0._0_4_ + fVar195;
          auVar331._4_4_ = (float)local_6c0._4_4_ + fVar216;
          auVar331._8_4_ = fStack_6b8 + fVar219;
          auVar331._12_4_ = fStack_6b4 + fVar257;
          auVar331._16_4_ = fStack_6b0 + fVar265;
          auVar331._20_4_ = fStack_6ac + fVar267;
          auVar331._24_4_ = fStack_6a8 + fVar269;
          auVar331._28_4_ = fStack_6a4 + auVar148._28_4_;
          auVar20 = vsubps_avx(auVar263,auVar80);
          auVar21 = vsubps_avx(_local_6c0,auVar81);
          auVar22 = vsubps_avx(auVar249,auVar140);
          auVar23 = vsubps_avx(auVar331,auVar178);
          auVar82._4_4_ = auVar178._4_4_ * auVar22._4_4_;
          auVar82._0_4_ = auVar178._0_4_ * auVar22._0_4_;
          auVar82._8_4_ = auVar178._8_4_ * auVar22._8_4_;
          auVar82._12_4_ = auVar178._12_4_ * auVar22._12_4_;
          auVar82._16_4_ = auVar178._16_4_ * auVar22._16_4_;
          auVar82._20_4_ = auVar178._20_4_ * auVar22._20_4_;
          auVar82._24_4_ = auVar178._24_4_ * auVar22._24_4_;
          auVar82._28_4_ = auVar355._28_4_;
          auVar83._4_4_ = auVar140._4_4_ * auVar23._4_4_;
          auVar83._0_4_ = auVar140._0_4_ * auVar23._0_4_;
          auVar83._8_4_ = auVar140._8_4_ * auVar23._8_4_;
          auVar83._12_4_ = auVar140._12_4_ * auVar23._12_4_;
          auVar83._16_4_ = auVar140._16_4_ * auVar23._16_4_;
          auVar83._20_4_ = auVar140._20_4_ * auVar23._20_4_;
          auVar83._24_4_ = auVar140._24_4_ * auVar23._24_4_;
          auVar83._28_4_ = fStack_6a4;
          auVar25 = vsubps_avx(auVar83,auVar82);
          auVar84._4_4_ = auVar231._4_4_ * auVar23._4_4_;
          auVar84._0_4_ = auVar231._0_4_ * auVar23._0_4_;
          auVar84._8_4_ = auVar231._8_4_ * auVar23._8_4_;
          auVar84._12_4_ = auVar231._12_4_ * auVar23._12_4_;
          auVar84._16_4_ = auVar231._16_4_ * auVar23._16_4_;
          auVar84._20_4_ = auVar231._20_4_ * auVar23._20_4_;
          auVar84._24_4_ = auVar231._24_4_ * auVar23._24_4_;
          auVar84._28_4_ = auVar23._28_4_;
          auVar23 = vsubps_avx(auVar364,auVar231);
          auVar85._4_4_ = auVar178._4_4_ * auVar23._4_4_;
          auVar85._0_4_ = auVar178._0_4_ * auVar23._0_4_;
          auVar85._8_4_ = auVar178._8_4_ * auVar23._8_4_;
          auVar85._12_4_ = auVar178._12_4_ * auVar23._12_4_;
          auVar85._16_4_ = auVar178._16_4_ * auVar23._16_4_;
          auVar85._20_4_ = auVar178._20_4_ * auVar23._20_4_;
          auVar85._24_4_ = auVar178._24_4_ * auVar23._24_4_;
          auVar85._28_4_ = auVar152._28_4_;
          auVar26 = vsubps_avx(auVar85,auVar84);
          auVar86._4_4_ = auVar140._4_4_ * auVar23._4_4_;
          auVar86._0_4_ = auVar140._0_4_ * auVar23._0_4_;
          auVar86._8_4_ = auVar140._8_4_ * auVar23._8_4_;
          auVar86._12_4_ = auVar140._12_4_ * auVar23._12_4_;
          auVar86._16_4_ = auVar140._16_4_ * auVar23._16_4_;
          auVar86._20_4_ = auVar140._20_4_ * auVar23._20_4_;
          auVar86._24_4_ = auVar140._24_4_ * auVar23._24_4_;
          auVar86._28_4_ = auVar152._28_4_;
          auVar87._4_4_ = auVar231._4_4_ * auVar22._4_4_;
          auVar87._0_4_ = auVar231._0_4_ * auVar22._0_4_;
          auVar87._8_4_ = auVar231._8_4_ * auVar22._8_4_;
          auVar87._12_4_ = auVar231._12_4_ * auVar22._12_4_;
          auVar87._16_4_ = auVar231._16_4_ * auVar22._16_4_;
          auVar87._20_4_ = auVar231._20_4_ * auVar22._20_4_;
          auVar87._24_4_ = auVar231._24_4_ * auVar22._24_4_;
          auVar87._28_4_ = auVar22._28_4_;
          auVar152 = vsubps_avx(auVar87,auVar86);
          auVar186._0_4_ = auVar25._0_4_ * 0.0 + auVar152._0_4_ + auVar26._0_4_ * 0.0;
          auVar186._4_4_ = auVar25._4_4_ * 0.0 + auVar152._4_4_ + auVar26._4_4_ * 0.0;
          auVar186._8_4_ = auVar25._8_4_ * 0.0 + auVar152._8_4_ + auVar26._8_4_ * 0.0;
          auVar186._12_4_ = auVar25._12_4_ * 0.0 + auVar152._12_4_ + auVar26._12_4_ * 0.0;
          auVar186._16_4_ = auVar25._16_4_ * 0.0 + auVar152._16_4_ + auVar26._16_4_ * 0.0;
          auVar186._20_4_ = auVar25._20_4_ * 0.0 + auVar152._20_4_ + auVar26._20_4_ * 0.0;
          auVar186._24_4_ = auVar25._24_4_ * 0.0 + auVar152._24_4_ + auVar26._24_4_ * 0.0;
          auVar186._28_4_ = auVar25._28_4_ + auVar152._28_4_ + auVar26._28_4_;
          auVar139 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,2);
          auVar152 = vblendvps_avx(auVar19,_local_800,auVar139);
          auVar19 = vblendvps_avx(auVar20,_local_720,auVar139);
          auVar20 = vblendvps_avx(auVar21,auVar378,auVar139);
          auVar21 = vblendvps_avx(auVar231,auVar364,auVar139);
          auVar22 = vblendvps_avx(auVar140,auVar249,auVar139);
          auVar23 = vblendvps_avx(auVar178,auVar331,auVar139);
          auVar25 = vblendvps_avx(auVar364,auVar231,auVar139);
          auVar26 = vblendvps_avx(auVar249,auVar140,auVar139);
          auVar138 = vblendvps_avx(auVar331,auVar178,auVar139);
          auVar231 = vandps_avx(auVar210,_local_6e0);
          auVar25 = vsubps_avx(auVar25,auVar152);
          auVar179 = vsubps_avx(auVar26,auVar19);
          auVar138 = vsubps_avx(auVar138,auVar20);
          auVar180 = vsubps_avx(auVar19,auVar22);
          fVar195 = auVar179._0_4_;
          fVar196 = auVar20._0_4_;
          fVar271 = auVar179._4_4_;
          fVar214 = auVar20._4_4_;
          auVar88._4_4_ = fVar214 * fVar271;
          auVar88._0_4_ = fVar196 * fVar195;
          fVar290 = auVar179._8_4_;
          fVar309 = auVar20._8_4_;
          auVar88._8_4_ = fVar309 * fVar290;
          fVar322 = auVar179._12_4_;
          fVar296 = auVar20._12_4_;
          auVar88._12_4_ = fVar296 * fVar322;
          fVar193 = auVar179._16_4_;
          fVar239 = auVar20._16_4_;
          auVar88._16_4_ = fVar239 * fVar193;
          fVar256 = auVar179._20_4_;
          fVar250 = auVar20._20_4_;
          auVar88._20_4_ = fVar250 * fVar256;
          fVar156 = auVar179._24_4_;
          fVar252 = auVar20._24_4_;
          auVar88._24_4_ = fVar252 * fVar156;
          auVar88._28_4_ = auVar26._28_4_;
          fVar216 = auVar19._0_4_;
          fVar254 = auVar138._0_4_;
          fVar272 = auVar19._4_4_;
          fVar258 = auVar138._4_4_;
          auVar89._4_4_ = fVar258 * fVar272;
          auVar89._0_4_ = fVar254 * fVar216;
          fVar292 = auVar19._8_4_;
          fVar266 = auVar138._8_4_;
          auVar89._8_4_ = fVar266 * fVar292;
          fVar289 = auVar19._12_4_;
          fVar268 = auVar138._12_4_;
          auVar89._12_4_ = fVar268 * fVar289;
          fVar291 = auVar19._16_4_;
          fVar270 = auVar138._16_4_;
          auVar89._16_4_ = fVar270 * fVar291;
          fVar295 = auVar19._20_4_;
          fVar275 = auVar138._20_4_;
          auVar89._20_4_ = fVar275 * fVar295;
          fVar159 = auVar19._24_4_;
          fVar284 = auVar138._24_4_;
          uVar6 = auVar140._28_4_;
          auVar89._24_4_ = fVar284 * fVar159;
          auVar89._28_4_ = uVar6;
          auVar26 = vsubps_avx(auVar89,auVar88);
          fVar219 = auVar152._0_4_;
          fVar273 = auVar152._4_4_;
          auVar90._4_4_ = fVar258 * fVar273;
          auVar90._0_4_ = fVar254 * fVar219;
          fVar293 = auVar152._8_4_;
          auVar90._8_4_ = fVar266 * fVar293;
          fVar237 = auVar152._12_4_;
          auVar90._12_4_ = fVar268 * fVar237;
          fVar294 = auVar152._16_4_;
          auVar90._16_4_ = fVar270 * fVar294;
          fVar194 = auVar152._20_4_;
          auVar90._20_4_ = fVar275 * fVar194;
          fVar163 = auVar152._24_4_;
          auVar90._24_4_ = fVar284 * fVar163;
          auVar90._28_4_ = uVar6;
          fVar257 = auVar25._0_4_;
          fVar274 = auVar25._4_4_;
          auVar91._4_4_ = fVar214 * fVar274;
          auVar91._0_4_ = fVar196 * fVar257;
          fVar318 = auVar25._8_4_;
          auVar91._8_4_ = fVar309 * fVar318;
          fVar308 = auVar25._12_4_;
          auVar91._12_4_ = fVar296 * fVar308;
          fVar157 = auVar25._16_4_;
          auVar91._16_4_ = fVar239 * fVar157;
          fVar233 = auVar25._20_4_;
          auVar91._20_4_ = fVar250 * fVar233;
          fVar165 = auVar25._24_4_;
          auVar91._24_4_ = fVar252 * fVar165;
          auVar91._28_4_ = auVar364._28_4_;
          auVar140 = vsubps_avx(auVar91,auVar90);
          auVar92._4_4_ = fVar272 * fVar274;
          auVar92._0_4_ = fVar216 * fVar257;
          auVar92._8_4_ = fVar292 * fVar318;
          auVar92._12_4_ = fVar289 * fVar308;
          auVar92._16_4_ = fVar291 * fVar157;
          auVar92._20_4_ = fVar295 * fVar233;
          auVar92._24_4_ = fVar159 * fVar165;
          auVar92._28_4_ = uVar6;
          auVar93._4_4_ = fVar273 * fVar271;
          auVar93._0_4_ = fVar219 * fVar195;
          auVar93._8_4_ = fVar293 * fVar290;
          auVar93._12_4_ = fVar237 * fVar322;
          auVar93._16_4_ = fVar294 * fVar193;
          auVar93._20_4_ = fVar194 * fVar256;
          auVar93._24_4_ = fVar163 * fVar156;
          auVar93._28_4_ = auVar178._28_4_;
          auVar178 = vsubps_avx(auVar93,auVar92);
          auVar20 = vsubps_avx(auVar20,auVar23);
          fVar267 = auVar178._28_4_ + auVar140._28_4_;
          auVar341._0_4_ = auVar178._0_4_ + auVar140._0_4_ * 0.0 + auVar26._0_4_ * 0.0;
          auVar341._4_4_ = auVar178._4_4_ + auVar140._4_4_ * 0.0 + auVar26._4_4_ * 0.0;
          auVar341._8_4_ = auVar178._8_4_ + auVar140._8_4_ * 0.0 + auVar26._8_4_ * 0.0;
          auVar341._12_4_ = auVar178._12_4_ + auVar140._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
          auVar341._16_4_ = auVar178._16_4_ + auVar140._16_4_ * 0.0 + auVar26._16_4_ * 0.0;
          auVar341._20_4_ = auVar178._20_4_ + auVar140._20_4_ * 0.0 + auVar26._20_4_ * 0.0;
          auVar341._24_4_ = auVar178._24_4_ + auVar140._24_4_ * 0.0 + auVar26._24_4_ * 0.0;
          auVar341._28_4_ = fVar267 + auVar26._28_4_;
          fVar265 = auVar180._0_4_;
          fVar283 = auVar180._4_4_;
          auVar94._4_4_ = auVar23._4_4_ * fVar283;
          auVar94._0_4_ = auVar23._0_4_ * fVar265;
          fVar320 = auVar180._8_4_;
          auVar94._8_4_ = auVar23._8_4_ * fVar320;
          fVar323 = auVar180._12_4_;
          auVar94._12_4_ = auVar23._12_4_ * fVar323;
          fVar334 = auVar180._16_4_;
          auVar94._16_4_ = auVar23._16_4_ * fVar334;
          fVar234 = auVar180._20_4_;
          auVar94._20_4_ = auVar23._20_4_ * fVar234;
          fVar167 = auVar180._24_4_;
          auVar94._24_4_ = auVar23._24_4_ * fVar167;
          auVar94._28_4_ = fVar267;
          fVar267 = auVar20._0_4_;
          fVar285 = auVar20._4_4_;
          auVar95._4_4_ = auVar22._4_4_ * fVar285;
          auVar95._0_4_ = auVar22._0_4_ * fVar267;
          fVar236 = auVar20._8_4_;
          auVar95._8_4_ = auVar22._8_4_ * fVar236;
          fVar324 = auVar20._12_4_;
          auVar95._12_4_ = auVar22._12_4_ * fVar324;
          fVar160 = auVar20._16_4_;
          auVar95._16_4_ = auVar22._16_4_ * fVar160;
          fVar235 = auVar20._20_4_;
          auVar95._20_4_ = auVar22._20_4_ * fVar235;
          fVar169 = auVar20._24_4_;
          auVar95._24_4_ = auVar22._24_4_ * fVar169;
          auVar95._28_4_ = auVar178._28_4_;
          auVar140 = vsubps_avx(auVar95,auVar94);
          auVar152 = vsubps_avx(auVar152,auVar21);
          fVar269 = auVar152._0_4_;
          fVar287 = auVar152._4_4_;
          auVar96._4_4_ = auVar23._4_4_ * fVar287;
          auVar96._0_4_ = auVar23._0_4_ * fVar269;
          fVar307 = auVar152._8_4_;
          auVar96._8_4_ = auVar23._8_4_ * fVar307;
          fVar238 = auVar152._12_4_;
          auVar96._12_4_ = auVar23._12_4_ * fVar238;
          fVar161 = auVar152._16_4_;
          auVar96._16_4_ = auVar23._16_4_ * fVar161;
          fVar132 = auVar152._20_4_;
          auVar96._20_4_ = auVar23._20_4_ * fVar132;
          fVar171 = auVar152._24_4_;
          auVar96._24_4_ = auVar23._24_4_ * fVar171;
          auVar96._28_4_ = auVar23._28_4_;
          auVar97._4_4_ = fVar285 * auVar21._4_4_;
          auVar97._0_4_ = fVar267 * auVar21._0_4_;
          auVar97._8_4_ = fVar236 * auVar21._8_4_;
          auVar97._12_4_ = fVar324 * auVar21._12_4_;
          auVar97._16_4_ = fVar160 * auVar21._16_4_;
          auVar97._20_4_ = fVar235 * auVar21._20_4_;
          auVar97._24_4_ = fVar169 * auVar21._24_4_;
          auVar97._28_4_ = auVar26._28_4_;
          auVar152 = vsubps_avx(auVar96,auVar97);
          auVar98._4_4_ = auVar22._4_4_ * fVar287;
          auVar98._0_4_ = auVar22._0_4_ * fVar269;
          auVar98._8_4_ = auVar22._8_4_ * fVar307;
          auVar98._12_4_ = auVar22._12_4_ * fVar238;
          auVar98._16_4_ = auVar22._16_4_ * fVar161;
          auVar98._20_4_ = auVar22._20_4_ * fVar132;
          auVar98._24_4_ = auVar22._24_4_ * fVar171;
          auVar98._28_4_ = auVar22._28_4_;
          auVar99._4_4_ = fVar283 * auVar21._4_4_;
          auVar99._0_4_ = fVar265 * auVar21._0_4_;
          auVar99._8_4_ = fVar320 * auVar21._8_4_;
          auVar99._12_4_ = fVar323 * auVar21._12_4_;
          auVar99._16_4_ = fVar334 * auVar21._16_4_;
          auVar99._20_4_ = fVar234 * auVar21._20_4_;
          auVar99._24_4_ = fVar167 * auVar21._24_4_;
          auVar99._28_4_ = auVar21._28_4_;
          auVar21 = vsubps_avx(auVar99,auVar98);
          auVar149._0_4_ = auVar140._0_4_ * 0.0 + auVar21._0_4_ + auVar152._0_4_ * 0.0;
          auVar149._4_4_ = auVar140._4_4_ * 0.0 + auVar21._4_4_ + auVar152._4_4_ * 0.0;
          auVar149._8_4_ = auVar140._8_4_ * 0.0 + auVar21._8_4_ + auVar152._8_4_ * 0.0;
          auVar149._12_4_ = auVar140._12_4_ * 0.0 + auVar21._12_4_ + auVar152._12_4_ * 0.0;
          auVar149._16_4_ = auVar140._16_4_ * 0.0 + auVar21._16_4_ + auVar152._16_4_ * 0.0;
          auVar149._20_4_ = auVar140._20_4_ * 0.0 + auVar21._20_4_ + auVar152._20_4_ * 0.0;
          auVar149._24_4_ = auVar140._24_4_ * 0.0 + auVar21._24_4_ + auVar152._24_4_ * 0.0;
          auVar149._28_4_ = auVar152._28_4_ + auVar21._28_4_ + auVar152._28_4_;
          auVar155 = ZEXT3264(auVar149);
          auVar152 = vmaxps_avx(auVar341,auVar149);
          auVar152 = vcmpps_avx(auVar152,ZEXT1232(ZEXT812(0)) << 0x20,2);
          auVar21 = auVar231 & auVar152;
          auVar107 = auVar19;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0x7f,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0xbf,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar21[0x1f]) {
LAB_00a49def:
            auVar282 = ZEXT3264(auVar107);
            auVar232 = ZEXT3264(CONCAT824(uStack_628,
                                          CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
            auVar365._4_4_ = fVar158;
            auVar365._0_4_ = fVar133;
            auVar365._8_4_ = fVar162;
            auVar365._12_4_ = fVar164;
            auVar365._16_4_ = fVar166;
            auVar365._20_4_ = fVar168;
            auVar365._24_4_ = fVar170;
            auVar365._28_4_ = fVar172;
          }
          else {
            auVar21 = vandps_avx(auVar152,auVar231);
            auVar100._4_4_ = fVar285 * fVar271;
            auVar100._0_4_ = fVar267 * fVar195;
            auVar100._8_4_ = fVar236 * fVar290;
            auVar100._12_4_ = fVar324 * fVar322;
            auVar100._16_4_ = fVar160 * fVar193;
            auVar100._20_4_ = fVar235 * fVar256;
            auVar100._24_4_ = fVar169 * fVar156;
            auVar100._28_4_ = auVar231._28_4_;
            auVar101._4_4_ = fVar283 * fVar258;
            auVar101._0_4_ = fVar265 * fVar254;
            auVar101._8_4_ = fVar320 * fVar266;
            auVar101._12_4_ = fVar323 * fVar268;
            auVar101._16_4_ = fVar334 * fVar270;
            auVar101._20_4_ = fVar234 * fVar275;
            auVar101._24_4_ = fVar167 * fVar284;
            auVar101._28_4_ = auVar152._28_4_;
            auVar152 = vsubps_avx(auVar101,auVar100);
            auVar102._4_4_ = fVar287 * fVar258;
            auVar102._0_4_ = fVar269 * fVar254;
            auVar102._8_4_ = fVar307 * fVar266;
            auVar102._12_4_ = fVar238 * fVar268;
            auVar102._16_4_ = fVar161 * fVar270;
            auVar102._20_4_ = fVar132 * fVar275;
            auVar102._24_4_ = fVar171 * fVar284;
            auVar102._28_4_ = auVar138._28_4_;
            auVar103._4_4_ = fVar285 * fVar274;
            auVar103._0_4_ = fVar267 * fVar257;
            auVar103._8_4_ = fVar236 * fVar318;
            auVar103._12_4_ = fVar324 * fVar308;
            auVar103._16_4_ = fVar160 * fVar157;
            auVar103._20_4_ = fVar235 * fVar233;
            auVar103._24_4_ = fVar169 * fVar165;
            auVar103._28_4_ = auVar20._28_4_;
            auVar22 = vsubps_avx(auVar103,auVar102);
            auVar104._4_4_ = fVar283 * fVar274;
            auVar104._0_4_ = fVar265 * fVar257;
            auVar104._8_4_ = fVar320 * fVar318;
            auVar104._12_4_ = fVar323 * fVar308;
            auVar104._16_4_ = fVar334 * fVar157;
            auVar104._20_4_ = fVar234 * fVar233;
            auVar104._24_4_ = fVar167 * fVar165;
            auVar104._28_4_ = auVar25._28_4_;
            auVar105._4_4_ = fVar287 * fVar271;
            auVar105._0_4_ = fVar269 * fVar195;
            auVar105._8_4_ = fVar307 * fVar290;
            auVar105._12_4_ = fVar238 * fVar322;
            auVar105._16_4_ = fVar161 * fVar193;
            auVar105._20_4_ = fVar132 * fVar256;
            auVar105._24_4_ = fVar171 * fVar156;
            auVar105._28_4_ = auVar179._28_4_;
            auVar23 = vsubps_avx(auVar105,auVar104);
            auVar315._0_4_ = auVar152._0_4_ * 0.0 + auVar23._0_4_ + auVar22._0_4_ * 0.0;
            auVar315._4_4_ = auVar152._4_4_ * 0.0 + auVar23._4_4_ + auVar22._4_4_ * 0.0;
            auVar315._8_4_ = auVar152._8_4_ * 0.0 + auVar23._8_4_ + auVar22._8_4_ * 0.0;
            auVar315._12_4_ = auVar152._12_4_ * 0.0 + auVar23._12_4_ + auVar22._12_4_ * 0.0;
            auVar315._16_4_ = auVar152._16_4_ * 0.0 + auVar23._16_4_ + auVar22._16_4_ * 0.0;
            auVar315._20_4_ = auVar152._20_4_ * 0.0 + auVar23._20_4_ + auVar22._20_4_ * 0.0;
            auVar315._24_4_ = auVar152._24_4_ * 0.0 + auVar23._24_4_ + auVar22._24_4_ * 0.0;
            auVar315._28_4_ = auVar180._28_4_ + auVar23._28_4_ + auVar25._28_4_;
            auVar231 = vrcpps_avx(auVar315);
            fVar195 = auVar231._0_4_;
            fVar257 = auVar231._4_4_;
            auVar106._4_4_ = auVar315._4_4_ * fVar257;
            auVar106._0_4_ = auVar315._0_4_ * fVar195;
            fVar265 = auVar231._8_4_;
            auVar106._8_4_ = auVar315._8_4_ * fVar265;
            fVar267 = auVar231._12_4_;
            auVar106._12_4_ = auVar315._12_4_ * fVar267;
            fVar269 = auVar231._16_4_;
            auVar106._16_4_ = auVar315._16_4_ * fVar269;
            fVar271 = auVar231._20_4_;
            auVar106._20_4_ = auVar315._20_4_ * fVar271;
            fVar274 = auVar231._24_4_;
            auVar106._24_4_ = auVar315._24_4_ * fVar274;
            auVar106._28_4_ = auVar20._28_4_;
            auVar356._8_4_ = 0x3f800000;
            auVar356._0_8_ = 0x3f8000003f800000;
            auVar356._12_4_ = 0x3f800000;
            auVar356._16_4_ = 0x3f800000;
            auVar356._20_4_ = 0x3f800000;
            auVar356._24_4_ = 0x3f800000;
            auVar356._28_4_ = 0x3f800000;
            auVar231 = vsubps_avx(auVar356,auVar106);
            fVar195 = auVar231._0_4_ * fVar195 + fVar195;
            fVar257 = auVar231._4_4_ * fVar257 + fVar257;
            fVar265 = auVar231._8_4_ * fVar265 + fVar265;
            fVar267 = auVar231._12_4_ * fVar267 + fVar267;
            fVar269 = auVar231._16_4_ * fVar269 + fVar269;
            fVar271 = auVar231._20_4_ * fVar271 + fVar271;
            fVar274 = auVar231._24_4_ * fVar274 + fVar274;
            fVar216 = auVar22._0_4_ * fVar216;
            fVar272 = auVar22._4_4_ * fVar272;
            auVar107._4_4_ = fVar272;
            auVar107._0_4_ = fVar216;
            fVar292 = auVar22._8_4_ * fVar292;
            auVar107._8_4_ = fVar292;
            fVar289 = auVar22._12_4_ * fVar289;
            auVar107._12_4_ = fVar289;
            fVar291 = auVar22._16_4_ * fVar291;
            auVar107._16_4_ = fVar291;
            fVar295 = auVar22._20_4_ * fVar295;
            auVar107._20_4_ = fVar295;
            fVar159 = auVar22._24_4_ * fVar159;
            auVar107._24_4_ = fVar159;
            auVar107._28_4_ = auVar19._28_4_;
            auVar108._4_4_ =
                 (fVar273 * auVar152._4_4_ + fVar272 + fVar214 * auVar23._4_4_) * fVar257;
            auVar108._0_4_ =
                 (fVar219 * auVar152._0_4_ + fVar216 + fVar196 * auVar23._0_4_) * fVar195;
            auVar108._8_4_ =
                 (fVar293 * auVar152._8_4_ + fVar292 + fVar309 * auVar23._8_4_) * fVar265;
            auVar108._12_4_ =
                 (fVar237 * auVar152._12_4_ + fVar289 + fVar296 * auVar23._12_4_) * fVar267;
            auVar108._16_4_ =
                 (fVar294 * auVar152._16_4_ + fVar291 + fVar239 * auVar23._16_4_) * fVar269;
            auVar108._20_4_ =
                 (fVar194 * auVar152._20_4_ + fVar295 + fVar250 * auVar23._20_4_) * fVar271;
            auVar108._24_4_ =
                 (fVar163 * auVar152._24_4_ + fVar159 + fVar252 * auVar23._24_4_) * fVar274;
            auVar108._28_4_ = auVar19._28_4_ + auVar23._28_4_;
            uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar230._4_4_ = uVar6;
            auVar230._0_4_ = uVar6;
            auVar230._8_4_ = uVar6;
            auVar230._12_4_ = uVar6;
            auVar230._16_4_ = uVar6;
            auVar230._20_4_ = uVar6;
            auVar230._24_4_ = uVar6;
            auVar230._28_4_ = uVar6;
            auVar152 = vcmpps_avx(_local_460,auVar108,2);
            auVar231 = vcmpps_avx(auVar108,auVar230,2);
            auVar231 = vandps_avx(auVar152,auVar231);
            auVar19 = auVar21 & auVar231;
            if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar19 >> 0x7f,0) == '\0') &&
                  (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar19 >> 0xbf,0) == '\0') &&
                (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar19[0x1f]) goto LAB_00a49def;
            auVar231 = vandps_avx(auVar21,auVar231);
            auVar282 = ZEXT3264(auVar231);
            auVar19 = vcmpps_avx(auVar315,ZEXT1232(ZEXT812(0)) << 0x20,4);
            auVar20 = auVar231 & auVar19;
            auVar232 = ZEXT3264(CONCAT824(uStack_628,
                                          CONCAT816(uStack_630,CONCAT88(uStack_638,local_640))));
            auVar365._4_4_ = fVar158;
            auVar365._0_4_ = fVar133;
            auVar365._8_4_ = fVar162;
            auVar365._12_4_ = fVar164;
            auVar365._16_4_ = fVar166;
            auVar365._20_4_ = fVar168;
            auVar365._24_4_ = fVar170;
            auVar365._28_4_ = fVar172;
            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0x7f,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0xbf,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar20[0x1f] < '\0') {
              auVar231 = vandps_avx(auVar19,auVar231);
              auVar232 = ZEXT3264(auVar231);
              auVar109._4_4_ = auVar341._4_4_ * fVar257;
              auVar109._0_4_ = auVar341._0_4_ * fVar195;
              auVar109._8_4_ = auVar341._8_4_ * fVar265;
              auVar109._12_4_ = auVar341._12_4_ * fVar267;
              auVar109._16_4_ = auVar341._16_4_ * fVar269;
              auVar109._20_4_ = auVar341._20_4_ * fVar271;
              auVar109._24_4_ = auVar341._24_4_ * fVar274;
              auVar109._28_4_ = auVar152._28_4_;
              auVar110._4_4_ = auVar149._4_4_ * fVar257;
              auVar110._0_4_ = auVar149._0_4_ * fVar195;
              auVar110._8_4_ = auVar149._8_4_ * fVar265;
              auVar110._12_4_ = auVar149._12_4_ * fVar267;
              auVar110._16_4_ = auVar149._16_4_ * fVar269;
              auVar110._20_4_ = auVar149._20_4_ * fVar271;
              auVar110._24_4_ = auVar149._24_4_ * fVar274;
              auVar110._28_4_ = auVar149._28_4_;
              auVar281._8_4_ = 0x3f800000;
              auVar281._0_8_ = 0x3f8000003f800000;
              auVar281._12_4_ = 0x3f800000;
              auVar281._16_4_ = 0x3f800000;
              auVar281._20_4_ = 0x3f800000;
              auVar281._24_4_ = 0x3f800000;
              auVar281._28_4_ = 0x3f800000;
              auVar282 = ZEXT3264(auVar281);
              auVar231 = vsubps_avx(auVar281,auVar109);
              local_620 = vblendvps_avx(auVar231,auVar109,auVar139);
              auVar231 = vsubps_avx(auVar281,auVar110);
              _local_4c0 = vblendvps_avx(auVar231,auVar110,auVar139);
              auVar155 = ZEXT3264(_local_4c0);
              local_5e0 = auVar108;
            }
          }
          auVar231 = auVar232._0_32_;
          auVar357 = ZEXT3264(_local_780);
          local_540 = auVar313;
          if ((((((((auVar231 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar231 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar231 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar231 >> 0x7f,0) == '\0') &&
                (auVar232 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar231 >> 0xbf,0) == '\0') &&
              (auVar232 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar232[0x1f]) {
            auVar192 = ZEXT3264(local_620);
            auVar306 = ZEXT3264(_local_6a0);
          }
          else {
            auVar152 = vsubps_avx(auVar362,auVar365);
            fVar216 = auVar365._0_4_ + auVar152._0_4_ * local_620._0_4_;
            fVar219 = auVar365._4_4_ + auVar152._4_4_ * local_620._4_4_;
            fVar257 = auVar365._8_4_ + auVar152._8_4_ * local_620._8_4_;
            fVar265 = auVar365._12_4_ + auVar152._12_4_ * local_620._12_4_;
            fVar267 = auVar365._16_4_ + auVar152._16_4_ * local_620._16_4_;
            fVar269 = auVar365._20_4_ + auVar152._20_4_ * local_620._20_4_;
            fVar271 = auVar365._24_4_ + auVar152._24_4_ * local_620._24_4_;
            fVar272 = auVar365._28_4_ + auVar152._28_4_;
            fVar195 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar111._4_4_ = (fVar219 + fVar219) * fVar195;
            auVar111._0_4_ = (fVar216 + fVar216) * fVar195;
            auVar111._8_4_ = (fVar257 + fVar257) * fVar195;
            auVar111._12_4_ = (fVar265 + fVar265) * fVar195;
            auVar111._16_4_ = (fVar267 + fVar267) * fVar195;
            auVar111._20_4_ = (fVar269 + fVar269) * fVar195;
            auVar111._24_4_ = (fVar271 + fVar271) * fVar195;
            auVar111._28_4_ = fVar272 + fVar272;
            auVar152 = vcmpps_avx(local_5e0,auVar111,6);
            auVar155 = ZEXT3264(auVar152);
            auVar313 = auVar231 & auVar152;
            auVar306 = ZEXT3264(_local_6a0);
            if ((((((((auVar313 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar313 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar313 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar313 >> 0x7f,0) == '\0') &&
                  (auVar313 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar313 >> 0xbf,0) == '\0') &&
                (auVar313 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar313[0x1f]) {
              auVar192 = ZEXT3264(local_620);
            }
            else {
              local_3a0 = (float)local_4c0._0_4_ + (float)local_4c0._0_4_ + -1.0;
              fStack_39c = (float)local_4c0._4_4_ + (float)local_4c0._4_4_ + -1.0;
              fStack_398 = (float)uStack_4b8 + (float)uStack_4b8 + -1.0;
              fStack_394 = uStack_4b8._4_4_ + uStack_4b8._4_4_ + -1.0;
              fStack_390 = (float)uStack_4b0 + (float)uStack_4b0 + -1.0;
              fStack_38c = uStack_4b0._4_4_ + uStack_4b0._4_4_ + -1.0;
              fStack_388 = (float)uStack_4a8 + (float)uStack_4a8 + -1.0;
              fStack_384 = uStack_4a8._4_4_ + uStack_4a8._4_4_ + -1.0;
              local_3c0 = local_620;
              local_4c0._4_4_ = fStack_39c;
              local_4c0._0_4_ = local_3a0;
              uStack_4b8._0_4_ = fStack_398;
              uStack_4b8._4_4_ = fStack_394;
              uStack_4b0._0_4_ = fStack_390;
              uStack_4b0._4_4_ = fStack_38c;
              auVar123 = _local_4c0;
              uStack_4a8._0_4_ = fStack_388;
              uStack_4a8._4_4_ = fStack_384;
              auVar313 = _local_4c0;
              local_380 = local_5e0;
              local_350 = local_970;
              fStack_34c = fStack_96c;
              fStack_348 = fStack_968;
              fStack_344 = fStack_964;
              local_330 = local_960;
              fStack_32c = fStack_95c;
              fStack_328 = fStack_958;
              fStack_324 = fStack_954;
              local_320 = local_900;
              fStack_31c = fStack_8fc;
              fStack_318 = fStack_8f8;
              fStack_314 = fStack_8f4;
              pGVar17 = (context->scene->geometries).items[uVar124].ptr;
              auVar192 = ZEXT3264(local_620);
              if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                local_680 = vandps_avx(auVar152,auVar231);
                auVar243 = vshufps_avx(ZEXT416((uint)(float)(int)local_360),
                                       ZEXT416((uint)(float)(int)local_360),0);
                local_2e0[0] = (auVar243._0_4_ + local_620._0_4_ + 0.0) * (float)local_140._0_4_;
                local_2e0[1] = (auVar243._4_4_ + local_620._4_4_ + 1.0) * (float)local_140._4_4_;
                local_2e0[2] = (auVar243._8_4_ + local_620._8_4_ + 2.0) * fStack_138;
                local_2e0[3] = (auVar243._12_4_ + local_620._12_4_ + 3.0) * fStack_134;
                fStack_2d0 = (auVar243._0_4_ + local_620._16_4_ + 4.0) * fStack_130;
                fStack_2cc = (auVar243._4_4_ + local_620._20_4_ + 5.0) * fStack_12c;
                fStack_2c8 = (auVar243._8_4_ + local_620._24_4_ + 6.0) * fStack_128;
                fStack_2c4 = auVar243._12_4_ + local_620._28_4_ + 7.0;
                uStack_4b0 = auVar123._16_8_;
                uStack_4a8 = auVar313._24_8_;
                local_2c0 = local_4c0;
                uStack_2b8 = uStack_4b8;
                uStack_2b0 = uStack_4b0;
                uStack_2a8 = uStack_4a8;
                local_2a0 = local_5e0;
                auVar187._8_4_ = 0x7f800000;
                auVar187._0_8_ = 0x7f8000007f800000;
                auVar187._12_4_ = 0x7f800000;
                auVar187._16_4_ = 0x7f800000;
                auVar187._20_4_ = 0x7f800000;
                auVar187._24_4_ = 0x7f800000;
                auVar187._28_4_ = 0x7f800000;
                auVar231 = vblendvps_avx(auVar187,local_5e0,local_680);
                auVar152 = vshufps_avx(auVar231,auVar231,0xb1);
                auVar152 = vminps_avx(auVar231,auVar152);
                auVar19 = vshufpd_avx(auVar152,auVar152,5);
                auVar152 = vminps_avx(auVar152,auVar19);
                auVar19 = vperm2f128_avx(auVar152,auVar152,1);
                auVar152 = vminps_avx(auVar152,auVar19);
                auVar152 = vcmpps_avx(auVar231,auVar152,0);
                auVar19 = local_680 & auVar152;
                auVar231 = local_680;
                if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar19 >> 0x7f,0) != '\0') ||
                      (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0xbf,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar19[0x1f] < '\0') {
                  auVar231 = vandps_avx(auVar152,local_680);
                }
                uVar126 = vmovmskps_avx(auVar231);
                uVar7 = 0;
                if (uVar126 != 0) {
                  for (; (uVar126 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                uVar129 = (ulong)uVar7;
                _local_4c0 = auVar313;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar17->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar195 = local_2e0[uVar129];
                  auVar155 = ZEXT464((uint)fVar195);
                  uVar6 = *(undefined4 *)((long)&local_2c0 + uVar129 * 4);
                  fVar219 = 1.0 - fVar195;
                  fVar216 = fVar195 * fVar219 + fVar195 * fVar219;
                  auVar282 = ZEXT464(0x40400000);
                  auVar243 = ZEXT416((uint)(fVar195 * fVar195 * 3.0));
                  auVar243 = vshufps_avx(auVar243,auVar243,0);
                  auVar200 = ZEXT416((uint)((fVar216 - fVar195 * fVar195) * 3.0));
                  auVar200 = vshufps_avx(auVar200,auVar200,0);
                  auVar222 = ZEXT416((uint)((fVar219 * fVar219 - fVar216) * 3.0));
                  auVar222 = vshufps_avx(auVar222,auVar222,0);
                  auVar204 = ZEXT416((uint)(fVar219 * fVar219 * -3.0));
                  auVar204 = vshufps_avx(auVar204,auVar204,0);
                  auVar201._0_4_ =
                       local_970 * auVar204._0_4_ +
                       fVar213 * auVar222._0_4_ +
                       local_900 * auVar243._0_4_ + local_960 * auVar200._0_4_;
                  auVar201._4_4_ =
                       fStack_96c * auVar204._4_4_ +
                       fVar215 * auVar222._4_4_ +
                       fStack_8fc * auVar243._4_4_ + fStack_95c * auVar200._4_4_;
                  auVar201._8_4_ =
                       fStack_968 * auVar204._8_4_ +
                       fVar217 * auVar222._8_4_ +
                       fStack_8f8 * auVar243._8_4_ + fStack_958 * auVar200._8_4_;
                  auVar201._12_4_ =
                       fStack_964 * auVar204._12_4_ +
                       fVar218 * auVar222._12_4_ +
                       fStack_8f4 * auVar243._12_4_ + fStack_954 * auVar200._12_4_;
                  auVar232 = ZEXT464(*(uint *)(local_2a0 + uVar129 * 4));
                  *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_2a0 + uVar129 * 4);
                  *(float *)(ray + k * 4 + 0x180) = auVar201._0_4_;
                  uVar16 = vextractps_avx(auVar201,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar16;
                  uVar16 = vextractps_avx(auVar201,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar16;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar195;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar6;
                  *(uint *)(ray + k * 4 + 0x220) = uVar128;
                  *(uint *)(ray + k * 4 + 0x240) = uVar124;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  _auStack_838 = auVar362._8_24_;
                  auVar243 = *local_7a0;
                  local_700._16_8_ = *(undefined8 *)(local_7a8 + 0x10);
                  local_700._24_8_ = *(undefined8 *)(local_7a8 + 0x18);
                  uStack_7f0 = *(undefined8 *)(local_7a8 + 0x10);
                  _local_800 = *local_7a0;
                  uStack_7e8 = *(undefined8 *)(local_7a8 + 0x18);
                  auVar192 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                  auVar231 = vcmpps_avx(_local_6a0,_local_6a0,0xf);
                  auVar316 = ZEXT3264(auVar231);
                  local_7b0 = ray;
                  _local_760 = auVar210;
                  local_35c = uVar15;
                  local_340 = auVar24;
                  while( true ) {
                    local_200 = local_2e0[uVar129];
                    local_1e0 = *(undefined4 *)((long)&local_2c0 + uVar129 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar129 * 4);
                    fVar216 = 1.0 - local_200;
                    fVar195 = local_200 * fVar216 + local_200 * fVar216;
                    auVar282 = ZEXT464(0x40400000);
                    auVar200 = ZEXT416((uint)(local_200 * local_200 * 3.0));
                    auVar200 = vshufps_avx(auVar200,auVar200,0);
                    auVar222 = ZEXT416((uint)((fVar195 - local_200 * local_200) * 3.0));
                    auVar222 = vshufps_avx(auVar222,auVar222,0);
                    auVar204 = ZEXT416((uint)((fVar216 * fVar216 - fVar195) * 3.0));
                    auVar204 = vshufps_avx(auVar204,auVar204,0);
                    local_870.context = context->user;
                    auVar202 = ZEXT416((uint)(fVar216 * fVar216 * -3.0));
                    auVar202 = vshufps_avx(auVar202,auVar202,0);
                    auVar203._0_4_ =
                         local_970 * auVar202._0_4_ +
                         fVar213 * auVar204._0_4_ +
                         local_900 * auVar200._0_4_ + local_960 * auVar222._0_4_;
                    auVar203._4_4_ =
                         fStack_96c * auVar202._4_4_ +
                         fVar215 * auVar204._4_4_ +
                         fStack_8fc * auVar200._4_4_ + fStack_95c * auVar222._4_4_;
                    auVar203._8_4_ =
                         fStack_968 * auVar202._8_4_ +
                         fVar217 * auVar204._8_4_ +
                         fStack_8f8 * auVar200._8_4_ + fStack_958 * auVar222._8_4_;
                    auVar203._12_4_ =
                         fStack_964 * auVar202._12_4_ +
                         fVar218 * auVar204._12_4_ +
                         fStack_8f4 * auVar200._12_4_ + fStack_954 * auVar222._12_4_;
                    auStack_250 = vshufps_avx(auVar203,auVar203,0);
                    local_260[0] = (RTCHitN)auStack_250[0];
                    local_260[1] = (RTCHitN)auStack_250[1];
                    local_260[2] = (RTCHitN)auStack_250[2];
                    local_260[3] = (RTCHitN)auStack_250[3];
                    local_260[4] = (RTCHitN)auStack_250[4];
                    local_260[5] = (RTCHitN)auStack_250[5];
                    local_260[6] = (RTCHitN)auStack_250[6];
                    local_260[7] = (RTCHitN)auStack_250[7];
                    local_260[8] = (RTCHitN)auStack_250[8];
                    local_260[9] = (RTCHitN)auStack_250[9];
                    local_260[10] = (RTCHitN)auStack_250[10];
                    local_260[0xb] = (RTCHitN)auStack_250[0xb];
                    local_260[0xc] = (RTCHitN)auStack_250[0xc];
                    local_260[0xd] = (RTCHitN)auStack_250[0xd];
                    local_260[0xe] = (RTCHitN)auStack_250[0xe];
                    local_260[0xf] = (RTCHitN)auStack_250[0xf];
                    auStack_230 = vshufps_avx(auVar203,auVar203,0x55);
                    local_240 = auStack_230;
                    auStack_210 = vshufps_avx(auVar203,auVar203,0xaa);
                    local_220 = auStack_210;
                    fStack_1fc = local_200;
                    fStack_1f8 = local_200;
                    fStack_1f4 = local_200;
                    fStack_1f0 = local_200;
                    fStack_1ec = local_200;
                    fStack_1e8 = local_200;
                    fStack_1e4 = local_200;
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = local_560._0_8_;
                    uStack_1b8 = local_560._8_8_;
                    uStack_1b0 = local_560._16_8_;
                    uStack_1a8 = local_560._24_8_;
                    local_1a0 = local_580._0_8_;
                    uStack_198 = local_580._8_8_;
                    uStack_190 = local_580._16_8_;
                    uStack_188 = local_580._24_8_;
                    local_788[1] = auVar316._0_32_;
                    *local_788 = auVar316._0_32_;
                    local_180 = (local_870.context)->instID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_160 = (local_870.context)->instPrimID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_7e0 = local_800;
                    uStack_7d8 = uStack_7f8;
                    uStack_7d0 = uStack_7f0;
                    uStack_7c8 = uStack_7e8;
                    local_870.valid = (int *)&local_7e0;
                    local_870.geometryUserPtr = pGVar17->userPtr;
                    local_870.hit = local_260;
                    local_870.N = 8;
                    auVar136 = local_700._0_16_;
                    auVar176 = auVar243;
                    local_870.ray = (RTCRayN *)ray;
                    if (pGVar17->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_820._0_16_ = auVar192._0_16_;
                      auVar282 = ZEXT1664(auVar282._0_16_);
                      auVar231 = ZEXT1632(auVar316._0_16_);
                      (*pGVar17->intersectionFilterN)(&local_870);
                      auVar192 = ZEXT1664(local_820._0_16_);
                      auVar231 = vcmpps_avx(auVar231,auVar231,0xf);
                      auVar316 = ZEXT3264(auVar231);
                      auVar176._8_8_ = uStack_7d8;
                      auVar176._0_8_ = local_7e0;
                      auVar136._8_8_ = uStack_7c8;
                      auVar136._0_8_ = uStack_7d0;
                      ray = local_7b0;
                    }
                    auVar200 = vpcmpeqd_avx(auVar176,ZEXT816(0) << 0x40);
                    auVar222 = vpcmpeqd_avx(auVar136,ZEXT816(0) << 0x40);
                    auVar211._16_16_ = auVar222;
                    auVar211._0_16_ = auVar200;
                    auVar231 = auVar316._0_32_ & ~auVar211;
                    if ((((((((auVar231 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar231 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar231 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar231 >> 0x7f,0) == '\0') &&
                          (auVar231 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar231 >> 0xbf,0) == '\0') &&
                        (auVar231 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar231[0x1f]) {
                      auVar150._0_4_ = auVar200._0_4_ ^ auVar316._0_4_;
                      auVar150._4_4_ = auVar200._4_4_ ^ auVar316._4_4_;
                      auVar150._8_4_ = auVar200._8_4_ ^ auVar316._8_4_;
                      auVar150._12_4_ = auVar200._12_4_ ^ auVar316._12_4_;
                      auVar150._16_4_ = auVar222._0_4_ ^ auVar316._16_4_;
                      auVar150._20_4_ = auVar222._4_4_ ^ auVar316._20_4_;
                      auVar150._24_4_ = auVar222._8_4_ ^ auVar316._24_4_;
                      auVar150._28_4_ = auVar222._12_4_ ^ auVar316._28_4_;
                      auVar232 = ZEXT3264(local_5e0);
                    }
                    else {
                      p_Var18 = context->args->filter;
                      auVar232 = ZEXT3264(local_5e0);
                      if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                        local_820._0_16_ = auVar192._0_16_;
                        auVar282 = ZEXT1664(auVar282._0_16_);
                        auVar231 = ZEXT1632(auVar316._0_16_);
                        (*p_Var18)(&local_870);
                        auVar192 = ZEXT1664(local_820._0_16_);
                        auVar232 = ZEXT3264(local_5e0);
                        auVar231 = vcmpps_avx(auVar231,auVar231,0xf);
                        auVar316 = ZEXT3264(auVar231);
                        auVar176._8_8_ = uStack_7d8;
                        auVar176._0_8_ = local_7e0;
                        auVar136._8_8_ = uStack_7c8;
                        auVar136._0_8_ = uStack_7d0;
                        ray = local_7b0;
                      }
                      auVar200 = vpcmpeqd_avx(auVar176,ZEXT816(0) << 0x40);
                      auVar222 = vpcmpeqd_avx(auVar136,ZEXT816(0) << 0x40);
                      auVar188._16_16_ = auVar222;
                      auVar188._0_16_ = auVar200;
                      auVar150._0_4_ = auVar200._0_4_ ^ auVar316._0_4_;
                      auVar150._4_4_ = auVar200._4_4_ ^ auVar316._4_4_;
                      auVar150._8_4_ = auVar200._8_4_ ^ auVar316._8_4_;
                      auVar150._12_4_ = auVar200._12_4_ ^ auVar316._12_4_;
                      auVar150._16_4_ = auVar222._0_4_ ^ auVar316._16_4_;
                      auVar150._20_4_ = auVar222._4_4_ ^ auVar316._20_4_;
                      auVar150._24_4_ = auVar222._8_4_ ^ auVar316._24_4_;
                      auVar150._28_4_ = auVar222._12_4_ ^ auVar316._28_4_;
                      auVar231 = auVar316._0_32_ & ~auVar188;
                      if ((((((((auVar231 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar231 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar231 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar231 >> 0x7f,0) != '\0') ||
                            (auVar231 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar231 >> 0xbf,0) != '\0') ||
                          (auVar231 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar231[0x1f] < '\0') {
                        auVar231 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])local_870.hit);
                        *(undefined1 (*) [32])(local_870.ray + 0x180) = auVar231;
                        auVar231 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])
                                                            (local_870.hit + 0x20));
                        *(undefined1 (*) [32])(local_870.ray + 0x1a0) = auVar231;
                        auVar231 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])
                                                            (local_870.hit + 0x40));
                        *(undefined1 (*) [32])(local_870.ray + 0x1c0) = auVar231;
                        auVar231 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])
                                                            (local_870.hit + 0x60));
                        *(undefined1 (*) [32])(local_870.ray + 0x1e0) = auVar231;
                        auVar231 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])
                                                            (local_870.hit + 0x80));
                        *(undefined1 (*) [32])(local_870.ray + 0x200) = auVar231;
                        auVar231 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])
                                                            (local_870.hit + 0xa0));
                        *(undefined1 (*) [32])(local_870.ray + 0x220) = auVar231;
                        auVar231 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])
                                                            (local_870.hit + 0xc0));
                        *(undefined1 (*) [32])(local_870.ray + 0x240) = auVar231;
                        auVar231 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])
                                                            (local_870.hit + 0xe0));
                        *(undefined1 (*) [32])(local_870.ray + 0x260) = auVar231;
                        auVar231 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])
                                                            (local_870.hit + 0x100));
                        *(undefined1 (*) [32])(local_870.ray + 0x280) = auVar231;
                      }
                    }
                    if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar150 >> 0x7f,0) == '\0') &&
                          (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar150 >> 0xbf,0) == '\0') &&
                        (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar150[0x1f]) {
                      *(int *)(ray + k * 4 + 0x100) = auVar192._0_4_;
                    }
                    else {
                      auVar192 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    }
                    *(undefined4 *)(local_680 + uVar129 * 4) = 0;
                    auVar200 = vshufps_avx(auVar192._0_16_,auVar192._0_16_,0);
                    auVar151._16_16_ = auVar200;
                    auVar151._0_16_ = auVar200;
                    auVar152 = vcmpps_avx(auVar232._0_32_,auVar151,2);
                    auVar231 = vandps_avx(auVar152,local_680);
                    auVar155 = ZEXT3264(auVar231);
                    local_680 = local_680 & auVar152;
                    if ((((((((local_680 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_680 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_680 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_680 >> 0x7f,0) == '\0') &&
                          (local_680 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_680 >> 0xbf,0) == '\0') &&
                        (local_680 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_680[0x1f]) break;
                    auVar189._8_4_ = 0x7f800000;
                    auVar189._0_8_ = 0x7f8000007f800000;
                    auVar189._12_4_ = 0x7f800000;
                    auVar189._16_4_ = 0x7f800000;
                    auVar189._20_4_ = 0x7f800000;
                    auVar189._24_4_ = 0x7f800000;
                    auVar189._28_4_ = 0x7f800000;
                    auVar152 = vblendvps_avx(auVar189,auVar232._0_32_,auVar231);
                    auVar313 = vshufps_avx(auVar152,auVar152,0xb1);
                    auVar313 = vminps_avx(auVar152,auVar313);
                    auVar19 = vshufpd_avx(auVar313,auVar313,5);
                    auVar313 = vminps_avx(auVar313,auVar19);
                    auVar19 = vperm2f128_avx(auVar313,auVar313,1);
                    auVar313 = vminps_avx(auVar313,auVar19);
                    auVar313 = vcmpps_avx(auVar152,auVar313,0);
                    auVar19 = auVar231 & auVar313;
                    auVar152 = auVar231;
                    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar19 >> 0x7f,0) != '\0') ||
                          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar19 >> 0xbf,0) != '\0') ||
                        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar19[0x1f] < '\0') {
                      auVar152 = vandps_avx(auVar313,auVar231);
                    }
                    uVar126 = vmovmskps_avx(auVar152);
                    uVar7 = 0;
                    if (uVar126 != 0) {
                      for (; (uVar126 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                      }
                    }
                    uVar129 = (ulong)uVar7;
                    local_680 = auVar231;
                  }
                  auVar306 = ZEXT3264(_local_6a0);
                  auVar357 = ZEXT3264(_local_780);
                }
                auVar192 = ZEXT3264(local_620);
              }
            }
          }
        }
        auVar316 = ZEXT3264(auVar145);
        prim = (Primitive *)local_840;
      }
    }
    uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar146._4_4_ = uVar6;
    auVar146._0_4_ = uVar6;
    auVar146._8_4_ = uVar6;
    auVar146._12_4_ = uVar6;
    auVar146._16_4_ = uVar6;
    auVar146._20_4_ = uVar6;
    auVar146._24_4_ = uVar6;
    auVar146._28_4_ = uVar6;
    auVar145 = vcmpps_avx(local_80,auVar146,2);
    uVar124 = vmovmskps_avx(auVar145);
    uVar124 = (uint)uVar131 & uVar124;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }